

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_impl.h
# Opt level: O3

void run_extrakeys_tests(void)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  int iVar154;
  uint32_t uVar155;
  uint32_t uVar156;
  code *pcVar157;
  long lVar158;
  secp256k1_context *extraout_RAX;
  secp256k1_context *extraout_RAX_00;
  secp256k1_context *extraout_RAX_01;
  secp256k1_context *extraout_RAX_02;
  secp256k1_context *extraout_RAX_03;
  secp256k1_context *extraout_RAX_04;
  secp256k1_context *extraout_RAX_05;
  secp256k1_context *extraout_RAX_06;
  secp256k1_context *extraout_RAX_07;
  secp256k1_context *psVar159;
  secp256k1_context *extraout_RAX_08;
  secp256k1_context *extraout_RAX_09;
  secp256k1_context *extraout_RAX_10;
  secp256k1_context *extraout_RAX_11;
  secp256k1_context *extraout_RAX_12;
  secp256k1_context *extraout_RAX_13;
  secp256k1_context *psVar160;
  secp256k1_context *extraout_RAX_14;
  secp256k1_context *extraout_RAX_15;
  secp256k1_context *extraout_RAX_16;
  secp256k1_context *extraout_RAX_17;
  secp256k1_context *extraout_RAX_18;
  secp256k1_context *extraout_RAX_19;
  secp256k1_context *extraout_RAX_20;
  secp256k1_context *extraout_RAX_21;
  secp256k1_context *extraout_RAX_22;
  secp256k1_context *extraout_RAX_23;
  secp256k1_context *extraout_RAX_24;
  secp256k1_context *extraout_RAX_25;
  secp256k1_context *extraout_RAX_26;
  secp256k1_context *extraout_RAX_27;
  secp256k1_context *extraout_RAX_28;
  secp256k1_context *extraout_RAX_29;
  secp256k1_context *extraout_RAX_30;
  secp256k1_context *extraout_RAX_31;
  secp256k1_context *extraout_RAX_32;
  secp256k1_context *extraout_RAX_33;
  secp256k1_context *extraout_RAX_34;
  ulong uVar161;
  ulong uVar162;
  ulong uVar163;
  code *in_RCX;
  secp256k1_context *psVar164;
  ulong uVar165;
  uint uVar166;
  secp256k1_schnorrsig_extraparams *psVar167;
  secp256k1_schnorrsig_extraparams *psVar168;
  code *unaff_RBP;
  undefined1 *puVar169;
  int *piVar170;
  ulong uVar171;
  ulong uVar172;
  ulong uVar173;
  char *pcVar174;
  ulong uVar175;
  secp256k1_context *in_R8;
  ulong uVar176;
  ulong uVar177;
  secp256k1_context *unaff_R12;
  secp256k1_schnorrsig_extraparams *pubkey;
  ulong uVar178;
  secp256k1_context *unaff_R13;
  secp256k1_schnorrsig_extraparams *psVar179;
  ulong uVar180;
  secp256k1_schnorrsig_extraparams *keypair;
  ulong uVar181;
  ulong uVar182;
  secp256k1_context *unaff_R14;
  byte bVar183;
  secp256k1_context *unaff_R15;
  secp256k1_context *psVar184;
  ulong uVar185;
  bool bVar186;
  char cVar187;
  undefined4 uVar188;
  undefined1 auVar189 [16];
  int pk_parity;
  int32_t _calls_to_callback_5;
  secp256k1_xonly_pubkey xonly_pk;
  uchar sk [32];
  int32_t _calls_to_callback_3;
  uchar buf32 [32];
  secp256k1_xonly_pubkey xonly_pk_tmp;
  secp256k1_pubkey pk;
  uchar xy_sk [32];
  uchar ones32 [32];
  uchar zeros64 [64];
  secp256k1_ge pk2;
  secp256k1_ge pk1;
  secp256k1_fe sStackY_1268;
  secp256k1_schnorrsig_extraparams *psStackY_1240;
  secp256k1_schnorrsig_extraparams *psStackY_1238;
  secp256k1_schnorrsig_extraparams *psStackY_1230;
  secp256k1_schnorrsig_extraparams *psStackY_1228;
  secp256k1_schnorrsig_extraparams *psStackY_1220;
  secp256k1_context *psStackY_1218;
  int iStack_11f4;
  _func_void_char_ptr_void_ptr *p_Stack_11f0;
  void *pvStack_11e8;
  undefined1 auStack_11e0 [16];
  undefined1 auStack_11d0 [16];
  undefined1 auStack_11c0 [32];
  undefined1 auStack_11a0 [56];
  undefined8 uStack_1168;
  undefined1 auStack_1160 [16];
  undefined1 auStack_1150 [16];
  secp256k1_schnorrsig_extraparams sStack_1140;
  uint64_t uStack_1128;
  uint64_t uStack_1120;
  _func_void_char_ptr_void_ptr *p_Stack_1118;
  void *pvStack_1110;
  _func_void_char_ptr_void_ptr *p_Stack_1108;
  void *pvStack_1100;
  secp256k1_nonce_function_hardened p_Stack_10f8;
  void *pvStack_10f0;
  _func_void_char_ptr_void_ptr *p_Stack_10e8;
  secp256k1_schnorrsig_extraparams sStack_10e0;
  secp256k1_schnorrsig_extraparams sStack_10c0;
  ulong uStack_1098;
  undefined1 auStack_1090 [16];
  undefined1 auStack_1080 [16];
  undefined1 auStack_1070 [16];
  undefined1 auStack_1060 [16];
  undefined1 auStack_1030 [16];
  void *pvStack_1020;
  uchar auStack_1018 [8];
  secp256k1_schnorrsig_extraparams sStack_1010;
  uint64_t uStack_ff8;
  undefined1 auStack_ff0 [64];
  secp256k1_xonly_pubkey sStack_fb0;
  undefined1 auStack_f70 [16];
  void *pvStack_f60;
  uchar auStack_f58 [72];
  secp256k1_schnorrsig_extraparams asStack_f10 [4];
  secp256k1_schnorrsig_extraparams asStack_eb0 [4];
  undefined1 auStack_e50 [16];
  void *pvStack_e40;
  secp256k1_context *psStack_e38;
  secp256k1_context *psStack_e30;
  secp256k1_context *psStack_e28;
  secp256k1_context *psStack_e20;
  secp256k1_context *psStack_e18;
  secp256k1_context *psStack_e10;
  undefined1 local_e00 [8];
  undefined1 local_df8 [64];
  undefined1 local_db8 [4];
  undefined1 auStack_db4 [8];
  undefined4 uStack_dac;
  undefined1 local_da8 [16];
  undefined1 local_d98 [8];
  void *pvStack_d90;
  undefined1 local_d68 [32];
  undefined1 auStack_d48 [8];
  undefined8 uStack_d40;
  undefined1 local_d38 [12];
  undefined4 uStack_d2c;
  undefined1 local_d28 [16];
  undefined1 local_d18 [16];
  secp256k1_callback local_d08;
  undefined1 local_cf8 [16];
  undefined1 local_ce8 [16];
  undefined1 local_cd8 [16];
  undefined1 local_ca8 [64];
  undefined1 local_c68 [8];
  undefined8 uStack_c60;
  undefined1 local_c58 [16];
  undefined1 local_c48 [16];
  undefined1 local_c38 [16];
  secp256k1_context *local_c20;
  undefined1 local_c18 [8];
  undefined8 uStack_c10;
  undefined1 local_c08 [12];
  undefined4 uStack_bfc;
  secp256k1_callback local_bf8;
  undefined1 auStack_be8 [16];
  undefined1 auStack_bd8 [16];
  undefined1 local_bc8 [880];
  undefined1 local_858 [32];
  secp256k1_callback local_838;
  undefined1 local_828 [16];
  secp256k1_callback local_818;
  undefined1 auStack_808 [16];
  undefined1 auStack_7f8 [16];
  undefined1 local_7e8 [16];
  secp256k1_schnorrsig_extraparams *pubkey_00;
  
  local_c38 = (undefined1  [16])0x0;
  local_c48 = (undefined1  [16])0x0;
  local_c58 = (undefined1  [16])0x0;
  local_c68 = (undefined1  [8])0x0;
  uStack_c60 = (_func_void_char_ptr_void_ptr *)0x0;
  psVar159 = (secp256k1_context *)local_db8;
  psStack_e10 = (secp256k1_context *)0x1418a5;
  testrand256((uchar *)psVar159);
  local_ca8._48_8_ = 0xffffffffffffffff;
  local_ca8._56_8_ = 0xffffffffffffffff;
  local_ca8._32_8_ = (_func_void_char_ptr_void_ptr *)0xffffffffffffffff;
  local_ca8._40_8_ = (void *)0xffffffffffffffff;
  psStack_e10 = (secp256k1_context *)0x1418c8;
  testrand256(local_ca8);
  psStack_e10 = (secp256k1_context *)0x1418df;
  iVar154 = secp256k1_ec_pubkey_create(CTX,(secp256k1_pubkey *)&local_d08,(uchar *)psVar159);
  if (iVar154 == 0) goto LAB_00144473;
  in_RCX = (code *)&local_d08;
  psStack_e10 = (secp256k1_context *)0x141905;
  iVar154 = secp256k1_xonly_pubkey_from_pubkey
                      (CTX,(secp256k1_xonly_pubkey *)local_df8,(int *)local_e00,
                       (secp256k1_pubkey *)in_RCX);
  if (iVar154 == 0) goto LAB_00144478;
  in_RCX = (code *)&local_d08;
  psStack_e10 = (secp256k1_context *)0x14192b;
  iVar154 = secp256k1_xonly_pubkey_from_pubkey
                      (CTX,(secp256k1_xonly_pubkey *)local_df8,(int *)local_e00,
                       (secp256k1_pubkey *)in_RCX);
  psVar164 = CTX;
  if (iVar154 == 0) goto LAB_0014447d;
  auVar189._12_4_ = 0;
  auVar189._0_12_ = stack0xfffffffffffff3ec;
  _local_c18 = (secp256k1_callback)(auVar189 << 0x20);
  local_838 = CTX->illegal_callback;
  in_RCX = (code *)CTX;
  if (secp256k1_context_static == CTX) goto LAB_00144482;
  pcVar157 = counting_callback_fn;
  (CTX->illegal_callback).fn = counting_callback_fn;
  puVar169 = local_c18;
  (psVar164->illegal_callback).data = puVar169;
LAB_0014197e:
  psStack_e10 = (secp256k1_context *)0x141987;
  (*pcVar157)("xonly_pubkey != NULL",puVar169);
  psVar160 = CTX;
  (CTX->illegal_callback).fn = local_838.fn;
  (psVar160->illegal_callback).data = local_838.data;
  if (local_c18._0_4_ == 1) {
    psVar164 = (secp256k1_context *)&local_d08;
    psStack_e10 = (secp256k1_context *)0x1419bf;
    iVar154 = secp256k1_xonly_pubkey_from_pubkey
                        (psVar160,(secp256k1_xonly_pubkey *)local_df8,(int *)0x0,
                         (secp256k1_pubkey *)psVar164);
    psVar160 = CTX;
    if (iVar154 == 0) goto LAB_001444b5;
    auVar130._12_4_ = 0;
    auVar130._0_12_ = stack0xfffffffffffff3ec;
    _local_c18 = (secp256k1_callback)(auVar130 << 0x20);
    local_838 = CTX->illegal_callback;
    psVar164 = CTX;
    if (secp256k1_context_static == CTX) goto LAB_001444ba;
    pcVar157 = counting_callback_fn;
    (CTX->illegal_callback).fn = counting_callback_fn;
    puVar169 = local_c18;
    (psVar160->illegal_callback).data = puVar169;
  }
  else {
    psStack_e10 = (secp256k1_context *)0x1444b5;
    run_extrakeys_tests_cold_1();
LAB_001444b5:
    psStack_e10 = (secp256k1_context *)0x1444ba;
    run_extrakeys_tests_cold_178();
LAB_001444ba:
    psStack_e10 = (secp256k1_context *)0x1444ce;
    (*(psVar164->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar164->illegal_callback).data);
    pcVar157 = (CTX->illegal_callback).fn;
    puVar169 = (undefined1 *)(CTX->illegal_callback).data;
  }
  psStack_e10 = (secp256k1_context *)0x141a1b;
  (*pcVar157)("pubkey != NULL",puVar169);
  psVar164 = CTX;
  (CTX->illegal_callback).fn = local_838.fn;
  (psVar164->illegal_callback).data = local_838.data;
  if (local_c18._0_4_ == 1) {
    local_d08 = (secp256k1_callback)ZEXT816(0);
    local_cf8 = ZEXT816(0);
    local_ce8 = ZEXT816(0);
    local_cd8 = ZEXT816(0);
    auVar131._12_4_ = 0;
    auVar131._0_12_ = stack0xfffffffffffff3ec;
    _local_c18 = (secp256k1_callback)(auVar131 << 0x20);
    local_838 = psVar164->illegal_callback;
    if (secp256k1_context_static == psVar164) goto LAB_001444ed;
    (psVar164->illegal_callback).fn = counting_callback_fn;
    (psVar164->illegal_callback).data = local_c18;
  }
  else {
    psStack_e10 = (secp256k1_context *)0x1444ed;
    run_extrakeys_tests_cold_2();
    psVar164 = extraout_RAX;
LAB_001444ed:
    psStack_e10 = (secp256k1_context *)0x144501;
    (*(psVar164->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar164->illegal_callback).data);
    psVar164 = CTX;
  }
  in_RCX = (code *)&local_d08;
  psStack_e10 = (secp256k1_context *)0x141ac3;
  iVar154 = secp256k1_xonly_pubkey_from_pubkey
                      (psVar164,(secp256k1_xonly_pubkey *)local_df8,(int *)local_e00,
                       (secp256k1_pubkey *)in_RCX);
  psVar164 = CTX;
  if (iVar154 == 0) {
    (CTX->illegal_callback).fn = local_838.fn;
    (psVar164->illegal_callback).data = local_838.data;
    if (local_c18._0_4_ != 1) goto LAB_00144512;
    local_da8 = (undefined1  [16])0x0;
    stack0xfffffffffffff249 = SUB1615((undefined1  [16])0x0,1);
    local_db8[0] = 1;
    psStack_e10 = (secp256k1_context *)0x141b13;
    iVar154 = secp256k1_ec_pubkey_create(psVar164,(secp256k1_pubkey *)&local_d08,local_db8);
    if (iVar154 == 0) goto LAB_00144517;
    in_RCX = (code *)&local_d08;
    psStack_e10 = (secp256k1_context *)0x141b39;
    iVar154 = secp256k1_xonly_pubkey_from_pubkey
                        (CTX,(secp256k1_xonly_pubkey *)local_df8,(int *)local_e00,
                         (secp256k1_pubkey *)in_RCX);
    if (iVar154 == 0) goto LAB_0014451c;
    lVar158 = 0;
    do {
      in_RCX = (code *)CONCAT71((int7)((ulong)in_RCX >> 8),*(char *)((long)&local_d08 + lVar158));
      if (*(char *)((long)&local_d08 + lVar158) != local_df8[lVar158]) goto LAB_00144c9b;
      lVar158 = lVar158 + 1;
    } while (lVar158 != 0x40);
    if (local_e00._0_4_ != 0) goto LAB_00144521;
    local_db8[0] = 2;
    psStack_e10 = (secp256k1_context *)0x141b84;
    iVar154 = secp256k1_ec_pubkey_create(CTX,(secp256k1_pubkey *)&local_d08,local_db8);
    if (iVar154 == 0) goto LAB_00144526;
    in_RCX = (code *)&local_d08;
    psStack_e10 = (secp256k1_context *)0x141baa;
    iVar154 = secp256k1_xonly_pubkey_from_pubkey
                        (CTX,(secp256k1_xonly_pubkey *)local_df8,(int *)local_e00,
                         (secp256k1_pubkey *)in_RCX);
    if (iVar154 == 0) goto LAB_0014452b;
    lVar158 = 0;
    do {
      in_RCX = (code *)CONCAT71((int7)((ulong)in_RCX >> 8),local_df8[lVar158]);
      if (local_df8[lVar158] != *(char *)((long)&local_d08 + lVar158)) goto LAB_00141bcf;
      lVar158 = lVar158 + 1;
    } while (lVar158 != 0x40);
    psStack_e10 = (secp256k1_context *)0x141bcf;
    run_extrakeys_tests_cold_173();
LAB_00141bcf:
    if (local_e00._0_4_ != 1) goto LAB_00144530;
    unaff_R14 = (secp256k1_context *)&local_838;
    psStack_e10 = (secp256k1_context *)0x141bf9;
    secp256k1_pubkey_load(CTX,(secp256k1_ge *)unaff_R14,(secp256k1_pubkey *)&local_d08);
    unaff_R15 = (secp256k1_context *)local_c18;
    psStack_e10 = (secp256k1_context *)0x141c15;
    secp256k1_pubkey_load(CTX,(secp256k1_ge *)unaff_R15,(secp256k1_pubkey *)local_df8);
    uStack_d40 = (_func_void_char_ptr_void_ptr *)
                 ((long)uStack_c10 + (0x3ffffffffffffc - (long)local_838.data));
    auStack_d48 = (undefined1  [8])((long)local_c18 + (0x3ffffbfffff0bc - (long)local_838.fn));
    stack0xfffffffffffff2d0 = stack0xfffffffffffff400 + (0x3ffffffffffffc - local_828._8_8_);
    local_d38._0_8_ = (local_c08._0_8_ - local_828._0_8_) + 0x3ffffffffffffc;
    in_RCX = local_bf8.fn + (0x3fffffffffffc - (long)local_818.fn);
    local_d28._0_8_ = in_RCX;
    psStack_e10 = (secp256k1_context *)0x141c6a;
    iVar154 = secp256k1_fe_impl_normalizes_to_zero((secp256k1_fe *)auStack_d48);
    if (iVar154 == 0) goto LAB_00144535;
    uStack_d40 = (_func_void_char_ptr_void_ptr *)
                 (0x7ffffffffffff8 - (auStack_808._0_8_ + auStack_be8._0_8_));
    auStack_d48 = (undefined1  [8])
                  (0x7ffff7ffffe178 - (long)((long)local_818.data + (long)local_bf8.data));
    stack0xfffffffffffff2d0 = 0x7ffffffffffff8 - (auStack_7f8._0_8_ + auStack_bd8._0_8_);
    local_d38._0_8_ = 0x7ffffffffffff8 - (auStack_808._8_8_ + auStack_be8._8_8_);
    in_RCX = (code *)(0x7fffffffffff8 - (auStack_bd8._8_8_ + auStack_7f8._8_8_));
    local_d28._0_8_ = in_RCX;
    psStack_e10 = (secp256k1_context *)0x141ced;
    iVar154 = secp256k1_fe_impl_normalizes_to_zero((secp256k1_fe *)auStack_d48);
    psVar164 = CTX;
    if (iVar154 == 0) goto LAB_0014453a;
    local_d98 = (undefined1  [8])((ulong)local_d98 & 0xffffffff00000000);
    _auStack_d48 = CTX->illegal_callback;
    in_RCX = (code *)CTX;
    if (secp256k1_context_static == CTX) goto LAB_0014453f;
    pcVar157 = counting_callback_fn;
    (CTX->illegal_callback).fn = counting_callback_fn;
    puVar169 = local_d98;
    (psVar164->illegal_callback).data = puVar169;
  }
  else {
    psStack_e10 = (secp256k1_context *)0x144512;
    run_extrakeys_tests_cold_3();
LAB_00144512:
    psStack_e10 = (secp256k1_context *)0x144517;
    run_extrakeys_tests_cold_4();
LAB_00144517:
    psStack_e10 = (secp256k1_context *)0x14451c;
    run_extrakeys_tests_cold_177();
LAB_0014451c:
    psStack_e10 = (secp256k1_context *)0x144521;
    run_extrakeys_tests_cold_176();
LAB_00144521:
    psStack_e10 = (secp256k1_context *)0x144526;
    run_extrakeys_tests_cold_6();
LAB_00144526:
    psStack_e10 = (secp256k1_context *)0x14452b;
    run_extrakeys_tests_cold_175();
LAB_0014452b:
    psStack_e10 = (secp256k1_context *)0x144530;
    run_extrakeys_tests_cold_174();
LAB_00144530:
    psStack_e10 = (secp256k1_context *)0x144535;
    run_extrakeys_tests_cold_7();
LAB_00144535:
    psStack_e10 = (secp256k1_context *)0x14453a;
    run_extrakeys_tests_cold_172();
LAB_0014453a:
    psStack_e10 = (secp256k1_context *)0x14453f;
    run_extrakeys_tests_cold_171();
LAB_0014453f:
    psStack_e10 = (secp256k1_context *)0x144553;
    (*(((secp256k1_context *)in_RCX)->illegal_callback).fn)
              ("ctx != secp256k1_context_static",
               (((secp256k1_context *)in_RCX)->illegal_callback).data);
    pcVar157 = (CTX->illegal_callback).fn;
    puVar169 = (undefined1 *)(CTX->illegal_callback).data;
  }
  psStack_e10 = (secp256k1_context *)0x141d43;
  (*pcVar157)("output32 != NULL",puVar169);
  psVar164 = CTX;
  (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)auStack_d48;
  (psVar164->illegal_callback).data = uStack_d40;
  if (local_d98._0_4_ == 1) {
    local_d98 = (undefined1  [8])((ulong)local_d98 & 0xffffffff00000000);
    _auStack_d48 = psVar164->illegal_callback;
    if (secp256k1_context_static == psVar164) goto LAB_00144572;
    in_RCX = counting_callback_fn;
    (psVar164->illegal_callback).fn = counting_callback_fn;
    (psVar164->illegal_callback).data = local_d98;
  }
  else {
    psStack_e10 = (secp256k1_context *)0x144572;
    run_extrakeys_tests_cold_8();
    psVar164 = extraout_RAX_00;
LAB_00144572:
    psStack_e10 = (secp256k1_context *)0x144586;
    (*(psVar164->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar164->illegal_callback).data);
    in_RCX = (CTX->illegal_callback).fn;
    psVar164 = CTX;
  }
  local_d68._16_8_ = (_func_void_char_ptr_void_ptr *)0x0;
  local_d68._24_8_ = (_func_void_char_ptr_void_ptr *)0x0;
  local_d68._0_8_ = (_func_void_char_ptr_void_ptr *)0x0;
  local_d68._8_8_ = (void *)0x0;
  psStack_e10 = (secp256k1_context *)0x141dc8;
  (*in_RCX)("pubkey != NULL",(psVar164->illegal_callback).data);
  psVar164 = CTX;
  (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)auStack_d48;
  (psVar164->illegal_callback).data = uStack_d40;
  if (local_d98._0_4_ == 1) {
    in_RCX = (code *)&psVar164->illegal_callback;
    lVar158 = 0;
    do {
      if (local_d68[lVar158] != local_c68[lVar158]) goto LAB_00144ca0;
      lVar158 = lVar158 + 1;
    } while (lVar158 != 0x20);
    local_d18 = (undefined1  [16])0x0;
    local_d28 = (undefined1  [16])0x0;
    _local_d38 = (undefined1  [16])0x0;
    auStack_d48 = (undefined1  [8])0x0;
    uStack_d40 = (_func_void_char_ptr_void_ptr *)0x0;
    local_e00._4_4_ = 0;
    local_d98 = (undefined1  [8])((secp256k1_callback *)in_RCX)->fn;
    pvStack_d90 = (psVar164->illegal_callback).data;
    if (secp256k1_context_static == psVar164) goto LAB_0014459e;
    (psVar164->illegal_callback).fn = counting_callback_fn;
    in_RCX = (code *)(local_e00 + 4);
    (psVar164->illegal_callback).data = in_RCX;
  }
  else {
    psStack_e10 = (secp256k1_context *)0x14459e;
    run_extrakeys_tests_cold_9();
    psVar164 = extraout_RAX_01;
LAB_0014459e:
    psStack_e10 = (secp256k1_context *)0x1445b2;
    (*(psVar164->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar164->illegal_callback).data);
    psVar164 = CTX;
  }
  psStack_e10 = (secp256k1_context *)0x141e8a;
  iVar154 = secp256k1_xonly_pubkey_serialize
                      (psVar164,local_d68,(secp256k1_xonly_pubkey *)auStack_d48);
  psVar164 = CTX;
  if (iVar154 == 0) {
    (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_d98;
    (psVar164->illegal_callback).data = pvStack_d90;
    if (local_e00._4_4_ != 1) goto LAB_001445c3;
    psStack_e10 = (secp256k1_context *)0x141ec2;
    iVar154 = secp256k1_xonly_pubkey_serialize
                        (psVar164,local_d68,(secp256k1_xonly_pubkey *)local_df8);
    psVar164 = CTX;
    if (iVar154 == 0) goto LAB_001445c8;
    local_d98 = (undefined1  [8])((ulong)local_d98 & 0xffffffff00000000);
    _auStack_d48 = CTX->illegal_callback;
    in_RCX = (code *)CTX;
    if (secp256k1_context_static == CTX) goto LAB_001445cd;
    pcVar157 = counting_callback_fn;
    (CTX->illegal_callback).fn = counting_callback_fn;
    puVar169 = local_d98;
    (psVar164->illegal_callback).data = puVar169;
  }
  else {
    psStack_e10 = (secp256k1_context *)0x1445c3;
    run_extrakeys_tests_cold_11();
LAB_001445c3:
    psStack_e10 = (secp256k1_context *)0x1445c8;
    run_extrakeys_tests_cold_12();
LAB_001445c8:
    psStack_e10 = (secp256k1_context *)0x1445cd;
    run_extrakeys_tests_cold_170();
LAB_001445cd:
    psStack_e10 = (secp256k1_context *)0x1445e1;
    (*(((secp256k1_context *)in_RCX)->illegal_callback).fn)
              ("ctx != secp256k1_context_static",
               (((secp256k1_context *)in_RCX)->illegal_callback).data);
    pcVar157 = (CTX->illegal_callback).fn;
    puVar169 = (undefined1 *)(CTX->illegal_callback).data;
  }
  psStack_e10 = (secp256k1_context *)0x141f18;
  (*pcVar157)("pubkey != NULL",puVar169);
  psVar164 = CTX;
  (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)auStack_d48;
  (psVar164->illegal_callback).data = uStack_d40;
  if (local_d98._0_4_ == 1) {
    local_d98 = (undefined1  [8])((ulong)local_d98 & 0xffffffff00000000);
    _auStack_d48 = psVar164->illegal_callback;
    if (secp256k1_context_static == psVar164) goto LAB_00144600;
    in_RCX = counting_callback_fn;
    (psVar164->illegal_callback).fn = counting_callback_fn;
    (psVar164->illegal_callback).data = local_d98;
  }
  else {
    psStack_e10 = (secp256k1_context *)0x144600;
    run_extrakeys_tests_cold_13();
    psVar164 = extraout_RAX_02;
LAB_00144600:
    psStack_e10 = (secp256k1_context *)0x144614;
    (*(psVar164->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar164->illegal_callback).data);
    in_RCX = (CTX->illegal_callback).fn;
    psVar164 = CTX;
  }
  local_df8._48_8_ = 0;
  local_df8._56_8_ = (_func_void_char_ptr_void_ptr *)0x0;
  local_df8._32_8_ = 0;
  local_df8._40_8_ = 0;
  local_df8._16_8_ = (void *)0x0;
  local_df8._24_8_ = 0;
  local_df8._0_8_ = (_func_void_char_ptr_void_ptr *)0x0;
  local_df8._8_8_ = (_func_void_char_ptr_void_ptr *)0x0;
  psStack_e10 = (secp256k1_context *)0x141fa1;
  (*in_RCX)("input32 != NULL",(psVar164->illegal_callback).data);
  psVar164 = CTX;
  (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)auStack_d48;
  (psVar164->illegal_callback).data = uStack_d40;
  if (local_d98._0_4_ == 1) {
    in_RCX = (code *)&local_d08;
    psStack_e10 = (secp256k1_context *)0x141fd8;
    iVar154 = secp256k1_xonly_pubkey_from_pubkey
                        (psVar164,(secp256k1_xonly_pubkey *)local_df8,(int *)0x0,
                         (secp256k1_pubkey *)in_RCX);
    if (iVar154 == 0) goto LAB_0014462c;
    psStack_e10 = (secp256k1_context *)0x141ff9;
    iVar154 = secp256k1_xonly_pubkey_serialize(CTX,local_d68,(secp256k1_xonly_pubkey *)local_df8);
    if (iVar154 == 0) goto LAB_00144631;
    unaff_R14 = (secp256k1_context *)local_d68;
    psStack_e10 = (secp256k1_context *)0x142020;
    iVar154 = secp256k1_xonly_pubkey_parse
                        (CTX,(secp256k1_xonly_pubkey *)auStack_d48,(uchar *)unaff_R14);
    if (iVar154 == 0) goto LAB_00144636;
    lVar158 = 0;
    do {
      in_RCX = (code *)CONCAT71((int7)((ulong)in_RCX >> 8),local_df8[lVar158]);
      if (local_df8[lVar158] != auStack_d48[lVar158]) goto LAB_00144ca5;
      lVar158 = lVar158 + 1;
    } while (lVar158 != 0x40);
    local_df8._48_8_ = 0x101010101010101;
    local_df8._56_8_ = (_func_void_char_ptr_void_ptr *)0x101010101010101;
    local_df8._32_8_ = 0x101010101010101;
    local_df8._40_8_ = 0x101010101010101;
    local_df8._16_8_ = (void *)0x101010101010101;
    local_df8._24_8_ = 0x101010101010101;
    local_df8._0_8_ = (_func_void_char_ptr_void_ptr *)0x101010101010101;
    local_df8._8_8_ = (_func_void_char_ptr_void_ptr *)0x101010101010101;
    psStack_e10 = (secp256k1_context *)0x142078;
    iVar154 = secp256k1_xonly_pubkey_parse(CTX,(secp256k1_xonly_pubkey *)local_df8,local_ca8 + 0x20)
    ;
    if (iVar154 != 0) goto LAB_0014463b;
    lVar158 = 0;
    do {
      in_RCX = (code *)CONCAT71((int7)((ulong)in_RCX >> 8),local_df8[lVar158]);
      if (local_df8[lVar158] != local_c68[lVar158]) goto LAB_00144caa;
      lVar158 = lVar158 + 1;
    } while (lVar158 != 0x40);
    local_df8._48_8_ = 0x101010101010101;
    local_df8._56_8_ = (_func_void_char_ptr_void_ptr *)0x101010101010101;
    local_df8._32_8_ = 0x101010101010101;
    local_df8._40_8_ = 0x101010101010101;
    local_df8._16_8_ = (void *)0x101010101010101;
    local_df8._24_8_ = 0x101010101010101;
    local_df8._0_8_ = (_func_void_char_ptr_void_ptr *)0x101010101010101;
    local_df8._8_8_ = (_func_void_char_ptr_void_ptr *)0x101010101010101;
    psStack_e10 = (secp256k1_context *)0x1420d0;
    iVar154 = secp256k1_xonly_pubkey_parse(CTX,(secp256k1_xonly_pubkey *)local_df8,local_c68);
    if (iVar154 != 0) goto LAB_00144640;
    lVar158 = 0;
    do {
      cVar187 = local_df8[lVar158];
      in_RCX = (code *)CONCAT71((int7)((ulong)in_RCX >> 8),cVar187);
      pcVar174 = local_c68 + lVar158;
      if (cVar187 != *pcVar174) break;
      bVar186 = lVar158 != 0x3f;
      lVar158 = lVar158 + 1;
    } while (bVar186);
    if (cVar187 != *pcVar174) goto LAB_00144645;
    if (0 < COUNT) {
      psVar159 = (secp256k1_context *)0x0;
      unaff_R15 = (secp256k1_context *)(local_d98 + 1);
      unaff_R12 = (secp256k1_context *)&local_d08;
      unaff_R13 = (secp256k1_context *)local_d98;
      unaff_RBP = (code *)local_df8;
      do {
        psStack_e10 = (secp256k1_context *)0x14212c;
        testrand256((uchar *)unaff_R15);
        local_d98[0] = 2;
        in_RCX = (code *)0x21;
        psStack_e10 = (secp256k1_context *)0x142148;
        iVar154 = secp256k1_ec_pubkey_parse
                            (CTX,(secp256k1_pubkey *)unaff_R12,(uchar *)unaff_R13,0x21);
        if (iVar154 == 0) {
          local_df8._48_8_ = 0x101010101010101;
          local_df8._56_8_ = (_func_void_char_ptr_void_ptr *)0x101010101010101;
          local_df8._32_8_ = 0x101010101010101;
          local_df8._40_8_ = 0x101010101010101;
          local_df8._16_8_ = (void *)0x101010101010101;
          local_df8._24_8_ = 0x101010101010101;
          local_df8._0_8_ = (_func_void_char_ptr_void_ptr *)0x101010101010101;
          local_df8._8_8_ = (_func_void_char_ptr_void_ptr *)0x101010101010101;
          psStack_e10 = (secp256k1_context *)0x142199;
          iVar154 = secp256k1_xonly_pubkey_parse
                              (CTX,(secp256k1_xonly_pubkey *)unaff_RBP,(uchar *)unaff_R15);
          if (iVar154 != 0) goto LAB_00144469;
          lVar158 = 0;
          do {
            in_RCX = (code *)CONCAT71((int7)((ulong)in_RCX >> 8),local_df8[lVar158]);
            if (local_df8[lVar158] != local_c68[lVar158]) goto LAB_00144c96;
            lVar158 = lVar158 + 1;
          } while (lVar158 != 0x40);
        }
        else {
          psStack_e10 = (secp256k1_context *)0x14215e;
          iVar154 = secp256k1_xonly_pubkey_parse
                              (CTX,(secp256k1_xonly_pubkey *)unaff_RBP,(uchar *)unaff_R15);
          if (iVar154 == 0) goto LAB_0014445a;
        }
        uVar166 = (int)psVar159 + 1;
        psVar159 = (secp256k1_context *)(ulong)uVar166;
      } while ((int)uVar166 < COUNT);
    }
    auStack_808 = (undefined1  [16])0x0;
    local_818.fn = (_func_void_char_ptr_void_ptr *)0x0;
    local_818.data = (void *)0x0;
    local_828 = (undefined1  [16])0x0;
    local_838.fn = (_func_void_char_ptr_void_ptr *)0x0;
    local_838.data = (void *)0x0;
    uStack_d40._0_4_ = 0xffffffff;
    auStack_d48 = (undefined1  [8])0xffffffffffffffff;
    uStack_d40._4_4_ = 0xffffffff;
    local_d38._8_4_ = 0xffffffff;
    local_d38._0_8_ = 0xffffffffffffffff;
    uStack_d2c = 0xffffffff;
    psStack_e10 = (secp256k1_context *)0x142213;
    testrand256(local_d98);
    unaff_R15 = (secp256k1_context *)local_c68;
    psStack_e10 = (secp256k1_context *)0x142223;
    testrand256((uchar *)unaff_R15);
    psStack_e10 = (secp256k1_context *)0x14223a;
    iVar154 = secp256k1_ec_pubkey_create(CTX,(secp256k1_pubkey *)local_c18,(uchar *)unaff_R15);
    if (iVar154 == 0) goto LAB_0014464a;
    in_RCX = (code *)local_c18;
    psStack_e10 = (secp256k1_context *)0x142266;
    iVar154 = secp256k1_xonly_pubkey_from_pubkey
                        (CTX,(secp256k1_xonly_pubkey *)&local_d08,(int *)local_ca8,
                         (secp256k1_pubkey *)in_RCX);
    if (iVar154 == 0) goto LAB_0014464f;
    in_RCX = (code *)local_d98;
    psStack_e10 = (secp256k1_context *)0x14228c;
    iVar154 = secp256k1_xonly_pubkey_tweak_add
                        (CTX,(secp256k1_pubkey *)local_df8,(secp256k1_xonly_pubkey *)&local_d08,
                         (uchar *)in_RCX);
    if (iVar154 == 0) goto LAB_00144654;
    in_RCX = (code *)local_d98;
    psStack_e10 = (secp256k1_context *)0x1422b2;
    iVar154 = secp256k1_xonly_pubkey_tweak_add
                        (CTX,(secp256k1_pubkey *)local_df8,(secp256k1_xonly_pubkey *)&local_d08,
                         (uchar *)in_RCX);
    if (iVar154 == 0) goto LAB_00144659;
    in_RCX = (code *)local_d98;
    psStack_e10 = (secp256k1_context *)0x1422d8;
    iVar154 = secp256k1_xonly_pubkey_tweak_add
                        (CTX,(secp256k1_pubkey *)local_df8,(secp256k1_xonly_pubkey *)&local_d08,
                         (uchar *)in_RCX);
    psVar164 = CTX;
    if (iVar154 == 0) goto LAB_0014465e;
    local_d68._0_8_ = local_d68._0_8_ & 0xffffffff00000000;
    _local_db8 = CTX->illegal_callback;
    in_RCX = (code *)CTX;
    if (secp256k1_context_static == CTX) goto LAB_00144663;
    pcVar157 = counting_callback_fn;
    (CTX->illegal_callback).fn = counting_callback_fn;
    (psVar164->illegal_callback).data = unaff_R14;
  }
  else {
    psStack_e10 = (secp256k1_context *)0x14462c;
    run_extrakeys_tests_cold_14();
LAB_0014462c:
    psStack_e10 = (secp256k1_context *)0x144631;
    run_extrakeys_tests_cold_169();
LAB_00144631:
    psStack_e10 = (secp256k1_context *)0x144636;
    run_extrakeys_tests_cold_168();
LAB_00144636:
    psStack_e10 = (secp256k1_context *)0x14463b;
    run_extrakeys_tests_cold_167();
LAB_0014463b:
    psStack_e10 = (secp256k1_context *)0x144640;
    run_extrakeys_tests_cold_16();
LAB_00144640:
    psStack_e10 = (secp256k1_context *)0x144645;
    run_extrakeys_tests_cold_18();
LAB_00144645:
    psStack_e10 = (secp256k1_context *)0x14464a;
    run_extrakeys_tests_cold_19();
LAB_0014464a:
    psStack_e10 = (secp256k1_context *)0x14464f;
    run_extrakeys_tests_cold_166();
LAB_0014464f:
    psStack_e10 = (secp256k1_context *)0x144654;
    run_extrakeys_tests_cold_165();
LAB_00144654:
    psStack_e10 = (secp256k1_context *)0x144659;
    run_extrakeys_tests_cold_164();
LAB_00144659:
    psStack_e10 = (secp256k1_context *)0x14465e;
    run_extrakeys_tests_cold_163();
LAB_0014465e:
    psStack_e10 = (secp256k1_context *)0x144663;
    run_extrakeys_tests_cold_162();
LAB_00144663:
    psStack_e10 = (secp256k1_context *)0x144677;
    (*(((secp256k1_context *)in_RCX)->illegal_callback).fn)
              ("ctx != secp256k1_context_static",
               (((secp256k1_context *)in_RCX)->illegal_callback).data);
    pcVar157 = (CTX->illegal_callback).fn;
    unaff_R14 = (secp256k1_context *)(CTX->illegal_callback).data;
  }
  psStack_e10 = (secp256k1_context *)0x14232c;
  (*pcVar157)("output_pubkey != NULL",unaff_R14);
  psVar164 = CTX;
  (CTX->illegal_callback).fn = _local_db8;
  (psVar164->illegal_callback).data = stack0xfffffffffffff250;
  if (local_d68._0_4_ == 1) {
    local_d68._0_8_ = local_d68._0_8_ & 0xffffffff00000000;
    _local_db8 = psVar164->illegal_callback;
    if (secp256k1_context_static == psVar164) goto LAB_00144696;
    pcVar157 = counting_callback_fn;
    (psVar164->illegal_callback).fn = counting_callback_fn;
    (psVar164->illegal_callback).data = local_d68;
  }
  else {
    psStack_e10 = (secp256k1_context *)0x144696;
    run_extrakeys_tests_cold_23();
    psVar164 = extraout_RAX_03;
LAB_00144696:
    psStack_e10 = (secp256k1_context *)0x1446aa;
    (*(psVar164->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar164->illegal_callback).data);
    pcVar157 = (CTX->illegal_callback).fn;
    psVar164 = CTX;
  }
  local_df8._48_8_ = 0;
  local_df8._56_8_ = (_func_void_char_ptr_void_ptr *)0x0;
  local_df8._32_8_ = 0;
  local_df8._40_8_ = 0;
  local_df8._16_8_ = (void *)0x0;
  local_df8._24_8_ = 0;
  local_df8._0_8_ = (_func_void_char_ptr_void_ptr *)0x0;
  local_df8._8_8_ = (_func_void_char_ptr_void_ptr *)0x0;
  psStack_e10 = (secp256k1_context *)0x1423b8;
  (*pcVar157)("internal_pubkey != NULL",(psVar164->illegal_callback).data);
  psVar164 = CTX;
  (CTX->illegal_callback).fn = _local_db8;
  (psVar164->illegal_callback).data = stack0xfffffffffffff250;
  if (local_d68._0_4_ == 1) {
    in_RCX = (code *)&psVar164->illegal_callback;
    lVar158 = 0;
    do {
      if (local_df8[lVar158] != *(char *)((long)&local_838 + lVar158)) goto LAB_00144caf;
      lVar158 = lVar158 + 1;
    } while (lVar158 != 0x40);
    local_d68._0_8_ = local_d68._0_8_ & 0xffffffff00000000;
    _local_db8 = *(secp256k1_callback *)&((secp256k1_callback *)in_RCX)->fn;
    if (secp256k1_context_static == psVar164) goto LAB_001446c2;
    in_RCX = counting_callback_fn;
    (psVar164->illegal_callback).fn = counting_callback_fn;
    (psVar164->illegal_callback).data = local_d68;
  }
  else {
    psStack_e10 = (secp256k1_context *)0x1446c2;
    run_extrakeys_tests_cold_24();
    psVar164 = extraout_RAX_04;
LAB_001446c2:
    psStack_e10 = (secp256k1_context *)0x1446d6;
    (*(psVar164->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar164->illegal_callback).data);
    in_RCX = (CTX->illegal_callback).fn;
    psVar164 = CTX;
  }
  local_df8._48_8_ = 0;
  local_df8._56_8_ = (_func_void_char_ptr_void_ptr *)0x0;
  local_df8._32_8_ = 0;
  local_df8._40_8_ = 0;
  local_df8._16_8_ = (void *)0x0;
  local_df8._24_8_ = 0;
  local_df8._0_8_ = (_func_void_char_ptr_void_ptr *)0x0;
  local_df8._8_8_ = (_func_void_char_ptr_void_ptr *)0x0;
  psStack_e10 = (secp256k1_context *)0x142464;
  (*in_RCX)("tweak32 != NULL",(psVar164->illegal_callback).data);
  psVar164 = CTX;
  (CTX->illegal_callback).fn = _local_db8;
  (psVar164->illegal_callback).data = stack0xfffffffffffff250;
  if (local_d68._0_4_ == 1) {
    lVar158 = 0;
    do {
      in_RCX = (code *)CONCAT71((int7)((ulong)in_RCX >> 8),local_df8[lVar158]);
      if (local_df8[lVar158] != *(char *)((long)&local_838 + lVar158)) goto LAB_00144cb4;
      lVar158 = lVar158 + 1;
    } while (lVar158 != 0x40);
    in_RCX = (code *)auStack_d48;
    psStack_e10 = (secp256k1_context *)0x1424bd;
    iVar154 = secp256k1_xonly_pubkey_tweak_add
                        (psVar164,(secp256k1_pubkey *)local_df8,(secp256k1_xonly_pubkey *)&local_d08
                         ,(uchar *)in_RCX);
    if (iVar154 != 0) goto LAB_001446ee;
    lVar158 = 0;
    do {
      in_RCX = (code *)CONCAT71((int7)((ulong)in_RCX >> 8),local_df8[lVar158]);
      psVar164 = unaff_R14;
      if (local_df8[lVar158] != *(char *)((long)&local_838 + lVar158)) goto LAB_00144cb9;
      lVar158 = lVar158 + 1;
    } while (lVar158 != 0x40);
    psStack_e10 = (secp256k1_context *)0x142502;
    iVar154 = secp256k1_xonly_pubkey_tweak_add
                        (CTX,(secp256k1_pubkey *)local_df8,(secp256k1_xonly_pubkey *)&local_d08,
                         (uchar *)&local_838);
    if (iVar154 == 0) goto LAB_001446f3;
    if (0 < COUNT) {
      psVar159 = (secp256k1_context *)0x0;
      unaff_R14 = (secp256k1_context *)local_db8;
      unaff_R15 = (secp256k1_context *)local_c68;
      unaff_R12 = (secp256k1_context *)local_d98;
      unaff_R13 = (secp256k1_context *)local_df8;
      unaff_RBP = (code *)&local_d08;
      do {
        psStack_e10 = (secp256k1_context *)0x142545;
        secp256k1_scalar_set_b32((secp256k1_scalar *)unaff_R14,(uchar *)unaff_R15,(int *)0x0);
        psStack_e10 = (secp256k1_context *)0x142550;
        secp256k1_scalar_negate((secp256k1_scalar *)unaff_R14,(secp256k1_scalar *)unaff_R14);
        psStack_e10 = (secp256k1_context *)0x14255b;
        secp256k1_scalar_get_b32((uchar *)unaff_R12,(secp256k1_scalar *)unaff_R14);
        psStack_e10 = (secp256k1_context *)0x142570;
        in_RCX = (code *)unaff_R15;
        iVar154 = secp256k1_xonly_pubkey_tweak_add
                            (CTX,(secp256k1_pubkey *)unaff_R13,(secp256k1_xonly_pubkey *)unaff_RBP,
                             (uchar *)unaff_R15);
        if (iVar154 != 0) {
          psStack_e10 = (secp256k1_context *)0x142589;
          in_RCX = (code *)unaff_R12;
          iVar154 = secp256k1_xonly_pubkey_tweak_add
                              (CTX,(secp256k1_pubkey *)unaff_R13,(secp256k1_xonly_pubkey *)unaff_RBP
                               ,(uchar *)unaff_R12);
          if (iVar154 != 0) goto LAB_0014445f;
        }
        lVar158 = 0;
        do {
          in_RCX = (code *)CONCAT71((int7)((ulong)in_RCX >> 8),local_df8[lVar158]);
          if (local_df8[lVar158] != *(char *)((long)&local_838 + lVar158)) goto LAB_0014446e;
          lVar158 = lVar158 + 1;
        } while (lVar158 != 0x40);
        uVar166 = (int)psVar159 + 1;
        psVar159 = (secp256k1_context *)(ulong)uVar166;
      } while ((int)uVar166 < COUNT);
    }
    local_cd8 = (undefined1  [16])0x0;
    local_ce8 = (undefined1  [16])0x0;
    local_cf8 = (undefined1  [16])0x0;
    local_d08.fn = (_func_void_char_ptr_void_ptr *)0x0;
    local_d08.data = (void *)0x0;
    psStack_e10 = (secp256k1_context *)0x1425e9;
    testrand256(local_d98);
    psVar159 = CTX;
    local_d68._0_8_ = local_d68._0_8_ & 0xffffffff00000000;
    _local_db8 = CTX->illegal_callback;
    if (secp256k1_context_static == CTX) goto LAB_001446f8;
    (CTX->illegal_callback).fn = counting_callback_fn;
    (psVar159->illegal_callback).data = local_d68;
    psVar160 = unaff_R14;
  }
  else {
    psStack_e10 = (secp256k1_context *)0x1446ee;
    run_extrakeys_tests_cold_26();
LAB_001446ee:
    psStack_e10 = (secp256k1_context *)0x1446f3;
    run_extrakeys_tests_cold_28();
LAB_001446f3:
    psStack_e10 = (secp256k1_context *)0x1446f8;
    run_extrakeys_tests_cold_161();
    psVar159 = extraout_RAX_05;
LAB_001446f8:
    psStack_e10 = (secp256k1_context *)0x14470c;
    (*(psVar159->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar159->illegal_callback).data);
    psVar159 = CTX;
    psVar160 = unaff_R14;
  }
  unaff_R14 = (secp256k1_context *)local_e00;
  in_RCX = (code *)local_d98;
  psStack_e10 = (secp256k1_context *)0x142650;
  iVar154 = secp256k1_xonly_pubkey_tweak_add
                      (psVar159,(secp256k1_pubkey *)local_df8,(secp256k1_xonly_pubkey *)&local_d08,
                       (uchar *)in_RCX);
  psVar164 = CTX;
  if (iVar154 == 0) {
    (CTX->illegal_callback).fn = _local_db8;
    (psVar164->illegal_callback).data = stack0xfffffffffffff250;
    psVar160 = psVar164;
    if (local_d68._0_4_ != 1) goto LAB_0014471d;
    lVar158 = 0;
    do {
      in_RCX = (code *)CONCAT71((int7)((ulong)in_RCX >> 8),local_df8[lVar158]);
      psVar159 = unaff_R14;
      if (local_df8[lVar158] != *(char *)((long)&local_838 + lVar158)) goto LAB_00144cbe;
      lVar158 = lVar158 + 1;
    } while (lVar158 != 0x40);
    auStack_808 = (undefined1  [16])0x0;
    local_818.fn = (_func_void_char_ptr_void_ptr *)0x0;
    local_818.data = (void *)0x0;
    local_828 = (undefined1  [16])0x0;
    local_838.fn = (_func_void_char_ptr_void_ptr *)0x0;
    local_838.data = (void *)0x0;
    uStack_c60._0_4_ = 0xffffffff;
    local_c68 = (undefined1  [8])0xffffffffffffffff;
    uStack_c60._4_4_ = 0xffffffff;
    local_c58._8_4_ = 0xffffffff;
    local_c58._0_8_ = 0xffffffffffffffff;
    local_c58._12_4_ = 0xffffffff;
    psStack_e10 = (secp256k1_context *)0x1426e3;
    testrand256(local_d68);
    unaff_R15 = (secp256k1_context *)local_d98;
    psStack_e10 = (secp256k1_context *)0x1426f0;
    testrand256((uchar *)unaff_R15);
    psStack_e10 = (secp256k1_context *)0x142703;
    iVar154 = secp256k1_ec_pubkey_create(psVar164,(secp256k1_pubkey *)local_c18,(uchar *)unaff_R15);
    if (iVar154 == 0) goto LAB_00144722;
    in_RCX = (code *)local_c18;
    psStack_e10 = (secp256k1_context *)0x14272f;
    iVar154 = secp256k1_xonly_pubkey_from_pubkey
                        (CTX,(secp256k1_xonly_pubkey *)&local_d08,(int *)(local_ca8 + 0x20),
                         (secp256k1_pubkey *)in_RCX);
    if (iVar154 == 0) goto LAB_00144727;
    in_RCX = (code *)local_d68;
    psStack_e10 = (secp256k1_context *)0x142758;
    iVar154 = secp256k1_xonly_pubkey_tweak_add
                        (CTX,(secp256k1_pubkey *)local_df8,(secp256k1_xonly_pubkey *)&local_d08,
                         (uchar *)in_RCX);
    if (iVar154 == 0) goto LAB_0014472c;
    in_RCX = (code *)local_df8;
    psStack_e10 = (secp256k1_context *)0x142781;
    iVar154 = secp256k1_xonly_pubkey_from_pubkey
                        (CTX,(secp256k1_xonly_pubkey *)auStack_d48,(int *)(local_ca8 + 0x20),
                         (secp256k1_pubkey *)in_RCX);
    if (iVar154 == 0) goto LAB_00144731;
    psStack_e10 = (secp256k1_context *)0x1427a5;
    iVar154 = secp256k1_xonly_pubkey_serialize(CTX,local_ca8,(secp256k1_xonly_pubkey *)auStack_d48);
    if (iVar154 == 0) goto LAB_00144736;
    in_RCX = (code *)&local_d08;
    in_R8 = (secp256k1_context *)local_d68;
    psStack_e10 = (secp256k1_context *)0x1427d8;
    iVar154 = secp256k1_xonly_pubkey_tweak_add_check
                        (CTX,local_ca8,local_ca8._32_4_,(secp256k1_xonly_pubkey *)in_RCX,
                         (uchar *)in_R8);
    if (iVar154 == 0) goto LAB_0014473b;
    in_RCX = (code *)&local_d08;
    in_R8 = (secp256k1_context *)local_d68;
    psStack_e10 = (secp256k1_context *)0x14280b;
    iVar154 = secp256k1_xonly_pubkey_tweak_add_check
                        (CTX,local_ca8,local_ca8._32_4_,(secp256k1_xonly_pubkey *)in_RCX,
                         (uchar *)in_R8);
    if (iVar154 == 0) goto LAB_00144740;
    in_RCX = (code *)&local_d08;
    in_R8 = (secp256k1_context *)local_d68;
    psStack_e10 = (secp256k1_context *)0x14283e;
    iVar154 = secp256k1_xonly_pubkey_tweak_add_check
                        (CTX,local_ca8,local_ca8._32_4_,(secp256k1_xonly_pubkey *)in_RCX,
                         (uchar *)in_R8);
    psVar159 = CTX;
    if (iVar154 == 0) goto LAB_00144745;
    local_e00._0_4_ = 0;
    _local_db8 = CTX->illegal_callback;
    in_RCX = (code *)CTX;
    if (secp256k1_context_static == CTX) goto LAB_0014474a;
    pcVar157 = counting_callback_fn;
    (CTX->illegal_callback).fn = counting_callback_fn;
    (psVar159->illegal_callback).data = unaff_R14;
  }
  else {
    psStack_e10 = (secp256k1_context *)0x14471d;
    run_extrakeys_tests_cold_32();
LAB_0014471d:
    psStack_e10 = (secp256k1_context *)0x144722;
    run_extrakeys_tests_cold_33();
LAB_00144722:
    psStack_e10 = (secp256k1_context *)0x144727;
    run_extrakeys_tests_cold_160();
LAB_00144727:
    psStack_e10 = (secp256k1_context *)0x14472c;
    run_extrakeys_tests_cold_159();
LAB_0014472c:
    psStack_e10 = (secp256k1_context *)0x144731;
    run_extrakeys_tests_cold_158();
LAB_00144731:
    psStack_e10 = (secp256k1_context *)0x144736;
    run_extrakeys_tests_cold_157();
LAB_00144736:
    psStack_e10 = (secp256k1_context *)0x14473b;
    run_extrakeys_tests_cold_156();
LAB_0014473b:
    psStack_e10 = (secp256k1_context *)0x144740;
    run_extrakeys_tests_cold_155();
LAB_00144740:
    psStack_e10 = (secp256k1_context *)0x144745;
    run_extrakeys_tests_cold_154();
LAB_00144745:
    psStack_e10 = (secp256k1_context *)0x14474a;
    run_extrakeys_tests_cold_153();
LAB_0014474a:
    psStack_e10 = (secp256k1_context *)0x14475e;
    (*(((secp256k1_context *)in_RCX)->illegal_callback).fn)
              ("ctx != secp256k1_context_static",
               (((secp256k1_context *)in_RCX)->illegal_callback).data);
    pcVar157 = (CTX->illegal_callback).fn;
    unaff_R14 = (secp256k1_context *)(CTX->illegal_callback).data;
    psVar159 = CTX;
    psVar164 = psVar160;
  }
  psStack_e10 = (secp256k1_context *)0x14288f;
  (*pcVar157)("tweaked_pubkey32 != NULL",unaff_R14);
  psVar160 = CTX;
  (CTX->illegal_callback).fn = _local_db8;
  (psVar160->illegal_callback).data = stack0xfffffffffffff250;
  if (local_e00._0_4_ == 1) {
    psVar159 = (secp256k1_context *)&local_d08;
    in_R8 = (secp256k1_context *)local_d68;
    psStack_e10 = (secp256k1_context *)0x1428cf;
    iVar154 = secp256k1_xonly_pubkey_tweak_add_check
                        (psVar160,local_ca8,2,(secp256k1_xonly_pubkey *)psVar159,(uchar *)in_R8);
    psVar160 = CTX;
    if (iVar154 != 0) goto LAB_0014477d;
    local_e00._0_4_ = 0;
    _local_db8 = CTX->illegal_callback;
    psVar159 = CTX;
    if (secp256k1_context_static == CTX) goto LAB_00144782;
    pcVar157 = counting_callback_fn;
    (CTX->illegal_callback).fn = counting_callback_fn;
    puVar169 = local_e00;
    (psVar160->illegal_callback).data = puVar169;
  }
  else {
    psStack_e10 = (secp256k1_context *)0x14477d;
    run_extrakeys_tests_cold_35();
LAB_0014477d:
    psStack_e10 = (secp256k1_context *)0x144782;
    run_extrakeys_tests_cold_36();
LAB_00144782:
    psStack_e10 = (secp256k1_context *)0x144796;
    (*(psVar159->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar159->illegal_callback).data);
    pcVar157 = (CTX->illegal_callback).fn;
    puVar169 = (undefined1 *)(CTX->illegal_callback).data;
  }
  psStack_e10 = (secp256k1_context *)0x142922;
  (*pcVar157)("internal_pubkey != NULL",puVar169);
  psVar159 = CTX;
  (CTX->illegal_callback).fn = _local_db8;
  (psVar159->illegal_callback).data = stack0xfffffffffffff250;
  if (local_e00._0_4_ == 1) {
    local_e00._0_4_ = 0;
    _local_db8 = psVar159->illegal_callback;
    if (secp256k1_context_static == psVar159) goto LAB_001447b5;
    pcVar157 = counting_callback_fn;
    (psVar159->illegal_callback).fn = counting_callback_fn;
    puVar169 = local_e00;
    (psVar159->illegal_callback).data = puVar169;
  }
  else {
    psStack_e10 = (secp256k1_context *)0x1447b5;
    run_extrakeys_tests_cold_37();
    psVar159 = extraout_RAX_06;
LAB_001447b5:
    psStack_e10 = (secp256k1_context *)0x1447c9;
    (*(psVar159->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar159->illegal_callback).data);
    pcVar157 = (CTX->illegal_callback).fn;
    puVar169 = (undefined1 *)(CTX->illegal_callback).data;
  }
  psStack_e10 = (secp256k1_context *)0x142987;
  (*pcVar157)("tweak32 != NULL",puVar169);
  psVar159 = CTX;
  (CTX->illegal_callback).fn = _local_db8;
  (psVar159->illegal_callback).data = stack0xfffffffffffff250;
  if (local_e00._0_4_ == 1) {
    local_d68._0_8_ = (_func_void_char_ptr_void_ptr *)0x101010101010101;
    local_d68._8_8_ = (void *)0x101010101010101;
    local_d68._16_8_ = (_func_void_char_ptr_void_ptr *)0x101010101010101;
    local_d68._24_8_ = (_func_void_char_ptr_void_ptr *)0x101010101010101;
    psVar164 = (secp256k1_context *)local_c18;
    psStack_e10 = (secp256k1_context *)0x1429d9;
    iVar154 = secp256k1_xonly_pubkey_from_pubkey
                        (psVar159,(secp256k1_xonly_pubkey *)&local_d08,(int *)0x0,
                         (secp256k1_pubkey *)psVar164);
    if (iVar154 == 0) goto LAB_001447e8;
    psStack_e10 = (secp256k1_context *)0x142a02;
    iVar154 = secp256k1_xonly_pubkey_tweak_add
                        (CTX,(secp256k1_pubkey *)local_df8,(secp256k1_xonly_pubkey *)&local_d08,
                         local_d68);
    if (iVar154 == 0) goto LAB_001447ed;
    psStack_e10 = (secp256k1_context *)0x142a2b;
    iVar154 = secp256k1_xonly_pubkey_from_pubkey
                        (CTX,(secp256k1_xonly_pubkey *)auStack_d48,(int *)(local_ca8 + 0x20),
                         (secp256k1_pubkey *)local_df8);
    if (iVar154 == 0) goto LAB_001447f2;
    psStack_e10 = (secp256k1_context *)0x142a4c;
    iVar154 = secp256k1_xonly_pubkey_serialize(CTX,local_db8,(secp256k1_xonly_pubkey *)auStack_d48);
    if (iVar154 == 0) goto LAB_001447f7;
    in_R8 = (secp256k1_context *)local_d68;
    psStack_e10 = (secp256k1_context *)0x142a7c;
    iVar154 = secp256k1_xonly_pubkey_tweak_add_check
                        (CTX,local_db8,local_ca8._32_4_,(secp256k1_xonly_pubkey *)&local_d08,
                         (uchar *)in_R8);
    if (iVar154 == 0) goto LAB_001447fc;
    in_R8 = (secp256k1_context *)local_d68;
    psStack_e10 = (secp256k1_context *)0x142ab2;
    iVar154 = secp256k1_xonly_pubkey_tweak_add_check
                        (CTX,local_db8,(uint)(local_ca8._32_4_ == 0),
                         (secp256k1_xonly_pubkey *)&local_d08,(uchar *)in_R8);
    if (iVar154 != 0) goto LAB_00144801;
    psStack_e10 = (secp256k1_context *)0x142ad6;
    iVar154 = secp256k1_xonly_pubkey_serialize(CTX,local_ca8,(secp256k1_xonly_pubkey *)&local_d08);
    if (iVar154 == 0) goto LAB_00144806;
    in_R8 = (secp256k1_context *)local_d68;
    psStack_e10 = (secp256k1_context *)0x142b09;
    iVar154 = secp256k1_xonly_pubkey_tweak_add_check
                        (CTX,local_ca8,local_ca8._32_4_,(secp256k1_xonly_pubkey *)&local_d08,
                         (uchar *)in_R8);
    if (iVar154 != 0) goto LAB_0014480b;
    in_R8 = (secp256k1_context *)local_c68;
    psStack_e10 = (secp256k1_context *)0x142b39;
    iVar154 = secp256k1_xonly_pubkey_tweak_add_check
                        (CTX,local_db8,local_ca8._32_4_,(secp256k1_xonly_pubkey *)&local_d08,
                         (uchar *)in_R8);
    if (iVar154 != 0) goto LAB_00144810;
    in_RCX = (code *)local_c68;
    psStack_e10 = (secp256k1_context *)0x142b62;
    iVar154 = secp256k1_xonly_pubkey_tweak_add
                        (CTX,(secp256k1_pubkey *)local_df8,(secp256k1_xonly_pubkey *)&local_d08,
                         (uchar *)in_RCX);
    if (iVar154 != 0) goto LAB_00144815;
    lVar158 = 0;
    do {
      in_RCX = (code *)CONCAT71((int7)((ulong)in_RCX >> 8),local_df8[lVar158]);
      psVar159 = unaff_R14;
      if (local_df8[lVar158] != *(char *)((long)&local_838 + lVar158)) goto LAB_00144cc3;
      lVar158 = lVar158 + 1;
    } while (lVar158 != 0x40);
    unaff_R12 = (secp256k1_context *)local_df8;
    psStack_e10 = (secp256k1_context *)0x142b93;
    testrand256((uchar *)unaff_R12);
    unaff_R15 = (secp256k1_context *)&local_838;
    psStack_e10 = (secp256k1_context *)0x142bad;
    iVar154 = secp256k1_ec_pubkey_create(CTX,(secp256k1_pubkey *)unaff_R15,(uchar *)unaff_R12);
    if (iVar154 == 0) goto LAB_0014481a;
    unaff_R14 = (secp256k1_context *)0xffffffffffffffe1;
    unaff_R12 = (secp256k1_context *)&local_d08;
    do {
      cVar187 = (char)unaff_R14 + ' ';
      auVar189 = ZEXT216(CONCAT11(cVar187,cVar187));
      auVar189 = pshuflw(auVar189,auVar189,0);
      uVar188 = auVar189._0_4_;
      *(undefined4 *)((psVar164->ecmult_gen_ctx).scalar_offset.d + 1) = uVar188;
      *(undefined4 *)((long)(psVar164->ecmult_gen_ctx).scalar_offset.d + 0xc) = uVar188;
      *(undefined4 *)((psVar164->ecmult_gen_ctx).scalar_offset.d + 2) = uVar188;
      *(undefined4 *)((long)(psVar164->ecmult_gen_ctx).scalar_offset.d + 0x14) = uVar188;
      (psVar164->ecmult_gen_ctx).built = uVar188;
      *(undefined4 *)&(psVar164->ecmult_gen_ctx).field_0x4 = uVar188;
      *(undefined4 *)(psVar164->ecmult_gen_ctx).scalar_offset.d = uVar188;
      *(undefined4 *)((long)(psVar164->ecmult_gen_ctx).scalar_offset.d + 4) = uVar188;
      psStack_e10 = (secp256k1_context *)0x142bfb;
      in_RCX = (code *)unaff_R15;
      iVar154 = secp256k1_xonly_pubkey_from_pubkey
                          (CTX,(secp256k1_xonly_pubkey *)unaff_R12,(int *)0x0,
                           (secp256k1_pubkey *)unaff_R15);
      if (iVar154 == 0) {
        psStack_e10 = (secp256k1_context *)0x144419;
        run_extrakeys_tests_cold_145();
LAB_00144419:
        psStack_e10 = (secp256k1_context *)0x14441e;
        run_extrakeys_tests_cold_144();
        goto LAB_0014441e;
      }
      unaff_R15 = (secp256k1_context *)((unaff_R15->ecmult_gen_ctx).ge_offset.x.n + 3);
      psStack_e10 = (secp256k1_context *)0x142c1c;
      in_RCX = (code *)psVar164;
      iVar154 = secp256k1_xonly_pubkey_tweak_add
                          (CTX,(secp256k1_pubkey *)unaff_R15,(secp256k1_xonly_pubkey *)unaff_R12,
                           (uchar *)psVar164);
      if (iVar154 == 0) goto LAB_00144419;
      psVar164 = (secp256k1_context *)((psVar164->ecmult_gen_ctx).scalar_offset.d + 3);
      unaff_R14 = (secp256k1_context *)((long)&(unaff_R14->ecmult_gen_ctx).built + 1);
    } while (unaff_R14 != (secp256k1_context *)0x0);
    unaff_R15 = (secp256k1_context *)local_858;
    unaff_R14 = (secp256k1_context *)0x20;
    unaff_R13 = (secp256k1_context *)&stack0xffffffffffffff48;
    unaff_RBP = (code *)&local_d08;
    unaff_R12 = (secp256k1_context *)local_c68;
    psVar164 = (secp256k1_context *)auStack_d48;
    while( true ) {
      in_RCX = (code *)((unaff_R13->ecmult_gen_ctx).ge_offset.x.n + 3);
      psStack_e10 = (secp256k1_context *)0x142c70;
      iVar154 = secp256k1_xonly_pubkey_from_pubkey
                          (CTX,(secp256k1_xonly_pubkey *)unaff_RBP,(int *)unaff_R12,
                           (secp256k1_pubkey *)in_RCX);
      if (iVar154 == 0) break;
      psStack_e10 = (secp256k1_context *)0x142c8a;
      iVar154 = secp256k1_xonly_pubkey_serialize
                          (CTX,(uchar *)psVar164,(secp256k1_xonly_pubkey *)unaff_RBP);
      if (iVar154 == 0) goto LAB_00144423;
      psStack_e10 = (secp256k1_context *)0x142ca6;
      in_RCX = (code *)unaff_R13;
      iVar154 = secp256k1_xonly_pubkey_from_pubkey
                          (CTX,(secp256k1_xonly_pubkey *)unaff_RBP,(int *)0x0,
                           (secp256k1_pubkey *)unaff_R13);
      if (iVar154 == 0) goto LAB_00144428;
      psStack_e10 = (secp256k1_context *)0x142cca;
      in_RCX = unaff_RBP;
      in_R8 = unaff_R15;
      iVar154 = secp256k1_xonly_pubkey_tweak_add_check
                          (CTX,(uchar *)psVar164,local_c68._0_4_,(secp256k1_xonly_pubkey *)unaff_RBP
                           ,(uchar *)unaff_R15);
      psVar159 = unaff_R14;
      if (iVar154 == 0) goto LAB_0014442d;
      unaff_R14 = (secp256k1_context *)&unaff_R14[-1].field_0xcf;
      unaff_R15 = (secp256k1_context *)&unaff_R15[-1].illegal_callback.data;
      unaff_R13 = (secp256k1_context *)(unaff_R13[-1].ecmult_gen_ctx.proj_blind.n + 2);
      if (unaff_R14 < (undefined1 *)0x2) {
        local_cf8._8_8_ = 0x23d94b67ef112680;
        local_cf8._0_8_ = 0x935e0b801ba19ad0;
        local_d08.data = (void *)0x1135526226a63892;
        local_d08.fn = (_func_void_char_ptr_void_ptr *)0x8837974ba2b38458;
        local_df8._16_8_ = (void *)0x4ff1f9a703d5c2b2;
        local_df8._24_8_ = 0x1c7669e9a895faa8;
        local_df8._0_8_ = (_func_void_char_ptr_void_ptr *)0x13c8f59870e36de;
        local_df8._8_8_ = (_func_void_char_ptr_void_ptr *)0x4d5ef4c6b82a2a36;
        psStack_e10 = (secp256k1_context *)0x142d30;
        iVar154 = secp256k1_xonly_pubkey_parse
                            (CTX,(secp256k1_xonly_pubkey *)&local_838,(uchar *)&local_d08);
        if (iVar154 == 0) goto LAB_00144829;
        unaff_R15 = (secp256k1_context *)local_df8;
        psStack_e10 = (secp256k1_context *)0x142d54;
        iVar154 = secp256k1_xonly_pubkey_parse
                            (CTX,(secp256k1_xonly_pubkey *)local_c18,(uchar *)unaff_R15);
        psVar159 = CTX;
        if (iVar154 == 0) goto LAB_0014482e;
        auVar133._12_4_ = 0;
        auVar133._0_12_ = stack0xfffffffffffff39c;
        _local_c68 = (secp256k1_callback)(auVar133 << 0x20);
        _auStack_d48 = CTX->illegal_callback;
        if (secp256k1_context_static == CTX) goto LAB_00144833;
        (CTX->illegal_callback).fn = counting_callback_fn;
        (psVar159->illegal_callback).data = unaff_R12;
        goto LAB_00142d9f;
      }
    }
LAB_0014441e:
    psStack_e10 = (secp256k1_context *)0x144423;
    run_extrakeys_tests_cold_143();
LAB_00144423:
    psStack_e10 = (secp256k1_context *)0x144428;
    run_extrakeys_tests_cold_142();
LAB_00144428:
    psStack_e10 = (secp256k1_context *)0x14442d;
    run_extrakeys_tests_cold_141();
    psVar159 = unaff_R14;
LAB_0014442d:
    unaff_R14 = psVar164;
    psStack_e10 = (secp256k1_context *)0x144432;
    run_extrakeys_tests_cold_140();
LAB_00144432:
    psStack_e10 = (secp256k1_context *)0x144437;
    run_extrakeys_tests_cold_109();
LAB_00144437:
    psStack_e10 = (secp256k1_context *)0x14443c;
    run_extrakeys_tests_cold_105();
    psVar164 = unaff_R13;
LAB_0014443c:
    unaff_R13 = unaff_R15;
    unaff_R15 = unaff_R12;
    psStack_e10 = (secp256k1_context *)0x144441;
    run_extrakeys_tests_cold_97();
LAB_00144441:
    psStack_e10 = (secp256k1_context *)0x144446;
    run_extrakeys_tests_cold_104();
    psVar160 = unaff_R14;
    psVar184 = unaff_R13;
LAB_00144446:
    unaff_R13 = psVar164;
    unaff_R14 = psVar159;
    psStack_e10 = (secp256k1_context *)0x14444b;
    run_extrakeys_tests_cold_103();
LAB_0014444b:
    psStack_e10 = (secp256k1_context *)0x144450;
    run_extrakeys_tests_cold_102();
    psVar159 = unaff_R15;
LAB_00144450:
    unaff_R15 = psVar184;
    unaff_R12 = psVar159;
    psStack_e10 = (secp256k1_context *)0x144455;
    run_extrakeys_tests_cold_101();
LAB_00144455:
    psStack_e10 = (secp256k1_context *)0x14445a;
    run_extrakeys_tests_cold_100();
    psVar159 = unaff_R14;
    unaff_R14 = psVar160;
LAB_0014445a:
    psStack_e10 = (secp256k1_context *)0x14445f;
    run_extrakeys_tests_cold_20();
LAB_0014445f:
    psStack_e10 = (secp256k1_context *)0x144464;
    run_extrakeys_tests_cold_30();
LAB_00144464:
    psStack_e10 = (secp256k1_context *)0x144469;
    run_extrakeys_tests_cold_88();
LAB_00144469:
    psStack_e10 = (secp256k1_context *)0x14446e;
    run_extrakeys_tests_cold_21();
LAB_0014446e:
    psStack_e10 = (secp256k1_context *)0x144473;
    run_extrakeys_tests_cold_31();
LAB_00144473:
    psStack_e10 = (secp256k1_context *)0x144478;
    run_extrakeys_tests_cold_181();
LAB_00144478:
    psStack_e10 = (secp256k1_context *)0x14447d;
    run_extrakeys_tests_cold_180();
LAB_0014447d:
    psStack_e10 = (secp256k1_context *)0x144482;
    run_extrakeys_tests_cold_179();
LAB_00144482:
    psStack_e10 = (secp256k1_context *)0x144496;
    (*(((secp256k1_context *)in_RCX)->illegal_callback).fn)
              ("ctx != secp256k1_context_static",
               (((secp256k1_context *)in_RCX)->illegal_callback).data);
    pcVar157 = (CTX->illegal_callback).fn;
    puVar169 = (undefined1 *)(CTX->illegal_callback).data;
    psVar164 = CTX;
    goto LAB_0014197e;
  }
  psStack_e10 = (secp256k1_context *)0x1447e8;
  run_extrakeys_tests_cold_38();
LAB_001447e8:
  psStack_e10 = (secp256k1_context *)0x1447ed;
  run_extrakeys_tests_cold_152();
LAB_001447ed:
  psStack_e10 = (secp256k1_context *)0x1447f2;
  run_extrakeys_tests_cold_151();
LAB_001447f2:
  psStack_e10 = (secp256k1_context *)0x1447f7;
  run_extrakeys_tests_cold_150();
LAB_001447f7:
  psStack_e10 = (secp256k1_context *)0x1447fc;
  run_extrakeys_tests_cold_149();
LAB_001447fc:
  psStack_e10 = (secp256k1_context *)0x144801;
  run_extrakeys_tests_cold_148();
LAB_00144801:
  psStack_e10 = (secp256k1_context *)0x144806;
  run_extrakeys_tests_cold_39();
LAB_00144806:
  psStack_e10 = (secp256k1_context *)0x14480b;
  run_extrakeys_tests_cold_147();
LAB_0014480b:
  psStack_e10 = (secp256k1_context *)0x144810;
  run_extrakeys_tests_cold_40();
LAB_00144810:
  psStack_e10 = (secp256k1_context *)0x144815;
  run_extrakeys_tests_cold_41();
LAB_00144815:
  psStack_e10 = (secp256k1_context *)0x14481a;
  run_extrakeys_tests_cold_42();
LAB_0014481a:
  psStack_e10 = (secp256k1_context *)0x14481f;
  run_extrakeys_tests_cold_146();
LAB_0014481f:
  psStack_e10 = (secp256k1_context *)0x144824;
  run_extrakeys_tests_cold_98();
LAB_00144824:
  psStack_e10 = (secp256k1_context *)0x144829;
  run_extrakeys_tests_cold_99();
LAB_00144829:
  psStack_e10 = (secp256k1_context *)0x14482e;
  run_extrakeys_tests_cold_139();
LAB_0014482e:
  psStack_e10 = (secp256k1_context *)0x144833;
  run_extrakeys_tests_cold_138();
  psVar159 = extraout_RAX_07;
LAB_00144833:
  psStack_e10 = (secp256k1_context *)0x144847;
  (*(psVar159->illegal_callback).fn)
            ("ctx != secp256k1_context_static",(psVar159->illegal_callback).data);
  psVar159 = CTX;
LAB_00142d9f:
  psStack_e10 = (secp256k1_context *)0x142db1;
  iVar154 = secp256k1_xonly_pubkey_cmp
                      (psVar159,(secp256k1_xonly_pubkey *)0x0,(secp256k1_xonly_pubkey *)local_c18);
  psVar159 = CTX;
  if (iVar154 < 0) {
    (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)auStack_d48;
    (psVar159->illegal_callback).data = uStack_d40;
    if (local_c68._0_4_ != 1) goto LAB_00144858;
    auVar139._12_4_ = 0;
    auVar139._0_12_ = stack0xfffffffffffff39c;
    _local_c68 = (secp256k1_callback)(auVar139 << 0x20);
    _auStack_d48 = psVar159->illegal_callback;
    if (secp256k1_context_static == psVar159) goto LAB_0014485d;
    (psVar159->illegal_callback).fn = counting_callback_fn;
    (psVar159->illegal_callback).data = unaff_R12;
  }
  else {
    psStack_e10 = (secp256k1_context *)0x144858;
    run_extrakeys_tests_cold_137();
LAB_00144858:
    psStack_e10 = (secp256k1_context *)0x14485d;
    run_extrakeys_tests_cold_44();
    psVar159 = extraout_RAX_08;
LAB_0014485d:
    psStack_e10 = (secp256k1_context *)0x144871;
    (*(psVar159->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar159->illegal_callback).data);
    psVar159 = CTX;
  }
  psStack_e10 = (secp256k1_context *)0x142e2e;
  iVar154 = secp256k1_xonly_pubkey_cmp
                      (psVar159,(secp256k1_xonly_pubkey *)&local_838,(secp256k1_xonly_pubkey *)0x0);
  psVar159 = CTX;
  if (iVar154 < 1) {
    psStack_e10 = (secp256k1_context *)0x144882;
    run_extrakeys_tests_cold_136();
LAB_00144882:
    psStack_e10 = (secp256k1_context *)0x144887;
    run_extrakeys_tests_cold_45();
LAB_00144887:
    psStack_e10 = (secp256k1_context *)0x14488c;
    run_extrakeys_tests_cold_135();
LAB_0014488c:
    psStack_e10 = (secp256k1_context *)0x144891;
    run_extrakeys_tests_cold_134();
LAB_00144891:
    psStack_e10 = (secp256k1_context *)0x144896;
    run_extrakeys_tests_cold_46();
LAB_00144896:
    psStack_e10 = (secp256k1_context *)0x14489b;
    run_extrakeys_tests_cold_47();
    psVar159 = extraout_RAX_09;
LAB_0014489b:
    psStack_e10 = (secp256k1_context *)0x1448af;
    (*(psVar159->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar159->illegal_callback).data);
    psVar159 = CTX;
  }
  else {
    (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)auStack_d48;
    (psVar159->illegal_callback).data = uStack_d40;
    if (local_c68._0_4_ != 1) goto LAB_00144882;
    psStack_e10 = (secp256k1_context *)0x142e6f;
    iVar154 = secp256k1_xonly_pubkey_cmp
                        (psVar159,(secp256k1_xonly_pubkey *)&local_838,
                         (secp256k1_xonly_pubkey *)local_c18);
    if (-1 < iVar154) goto LAB_00144887;
    psStack_e10 = (secp256k1_context *)0x142e93;
    iVar154 = secp256k1_xonly_pubkey_cmp
                        (CTX,(secp256k1_xonly_pubkey *)local_c18,
                         (secp256k1_xonly_pubkey *)&local_838);
    if (iVar154 < 1) goto LAB_0014488c;
    psStack_e10 = (secp256k1_context *)0x142eb2;
    iVar154 = secp256k1_xonly_pubkey_cmp
                        (CTX,(secp256k1_xonly_pubkey *)&local_838,
                         (secp256k1_xonly_pubkey *)&local_838);
    if (iVar154 != 0) goto LAB_00144891;
    psStack_e10 = (secp256k1_context *)0x142ed1;
    iVar154 = secp256k1_xonly_pubkey_cmp
                        (CTX,(secp256k1_xonly_pubkey *)local_c18,(secp256k1_xonly_pubkey *)local_c18
                        );
    psVar159 = CTX;
    if (iVar154 != 0) goto LAB_00144896;
    auStack_808 = ZEXT816(0);
    local_818 = (secp256k1_callback)ZEXT816(0);
    local_828 = ZEXT816(0);
    local_838 = (secp256k1_callback)ZEXT816(0);
    auVar144._12_4_ = 0;
    auVar144._0_12_ = stack0xfffffffffffff39c;
    _local_c68 = (secp256k1_callback)(auVar144 << 0x20);
    _auStack_d48 = CTX->illegal_callback;
    if (secp256k1_context_static == CTX) goto LAB_0014489b;
    (CTX->illegal_callback).fn = counting_callback_fn;
    (psVar159->illegal_callback).data = unaff_R12;
  }
  psStack_e10 = (secp256k1_context *)0x142f57;
  iVar154 = secp256k1_xonly_pubkey_cmp
                      (psVar159,(secp256k1_xonly_pubkey *)&local_838,
                       (secp256k1_xonly_pubkey *)local_c18);
  psVar159 = CTX;
  if (iVar154 < 0) {
    (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)auStack_d48;
    (psVar159->illegal_callback).data = uStack_d40;
    if (local_c68._0_4_ != 1) goto LAB_001448c0;
    auVar145._12_4_ = 0;
    auVar145._0_12_ = stack0xfffffffffffff2bc;
    _auStack_d48 = (secp256k1_callback)(auVar145 << 0x20);
    if (secp256k1_context_static == psVar159) goto LAB_001448c5;
    (psVar159->illegal_callback).fn = counting_callback_fn;
    (psVar159->illegal_callback).data = psVar164;
  }
  else {
    psStack_e10 = (secp256k1_context *)0x1448c0;
    run_extrakeys_tests_cold_133();
LAB_001448c0:
    psStack_e10 = (secp256k1_context *)0x1448c5;
    run_extrakeys_tests_cold_48();
    psVar159 = extraout_RAX_10;
LAB_001448c5:
    psStack_e10 = (secp256k1_context *)0x1448d9;
    (*(psVar159->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar159->illegal_callback).data);
    psVar159 = CTX;
  }
  psStack_e10 = (secp256k1_context *)0x142fc3;
  iVar154 = secp256k1_xonly_pubkey_cmp
                      (psVar159,(secp256k1_xonly_pubkey *)&local_838,
                       (secp256k1_xonly_pubkey *)&local_838);
  psVar159 = CTX;
  pcVar157 = (code *)secp256k1_context_static;
  if (iVar154 == 0) {
    if (auStack_d48._0_4_ != 2) goto LAB_001448ea;
    if (secp256k1_context_static == CTX) goto LAB_001448ef;
    (CTX->illegal_callback).fn = secp256k1_default_illegal_callback_fn;
    (psVar159->illegal_callback).data = (void *)0x0;
  }
  else {
    psStack_e10 = (secp256k1_context *)0x1448ea;
    run_extrakeys_tests_cold_49();
LAB_001448ea:
    psStack_e10 = (secp256k1_context *)0x1448ef;
    run_extrakeys_tests_cold_50();
    psVar159 = extraout_RAX_11;
LAB_001448ef:
    psStack_e10 = (secp256k1_context *)0x144903;
    (*(psVar159->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar159->illegal_callback).data);
    psVar159 = CTX;
    pcVar157 = (code *)secp256k1_context_static;
  }
  auVar146._12_4_ = 0;
  auVar146._0_12_ = stack0xfffffffffffff39c;
  _local_c68 = (secp256k1_callback)(auVar146 << 0x20);
  _auStack_d48 = psVar159->illegal_callback;
  if ((secp256k1_context *)pcVar157 == psVar159) {
    psStack_e10 = (secp256k1_context *)0x14492a;
    (*(psVar159->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar159->illegal_callback).data);
    psVar159 = CTX;
  }
  else {
    pcVar157 = counting_callback_fn;
    (psVar159->illegal_callback).fn = counting_callback_fn;
    (psVar159->illegal_callback).data = unaff_R12;
  }
  psStack_e10 = (secp256k1_context *)0x143059;
  iVar154 = secp256k1_xonly_pubkey_cmp
                      (psVar159,(secp256k1_xonly_pubkey *)local_c18,
                       (secp256k1_xonly_pubkey *)&local_838);
  psVar159 = CTX;
  if (iVar154 < 1) {
    psStack_e10 = (secp256k1_context *)0x14493b;
    run_extrakeys_tests_cold_132();
LAB_0014493b:
    psStack_e10 = (secp256k1_context *)0x144940;
    run_extrakeys_tests_cold_51();
LAB_00144940:
    psStack_e10 = (secp256k1_context *)0x144945;
    run_extrakeys_tests_cold_131();
LAB_00144945:
    psStack_e10 = (secp256k1_context *)0x14494a;
    run_extrakeys_tests_cold_129();
LAB_0014494a:
    psStack_e10 = (secp256k1_context *)0x14495e;
    (*(((secp256k1_context *)pcVar157)->illegal_callback).fn)
              ("ctx != secp256k1_context_static",
               (((secp256k1_context *)pcVar157)->illegal_callback).data);
    pcVar157 = (CTX->illegal_callback).fn;
    unaff_R15 = (secp256k1_context *)(CTX->illegal_callback).data;
    psVar159 = unaff_R14;
  }
  else {
    (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)auStack_d48;
    (psVar159->illegal_callback).data = uStack_d40;
    unaff_R12 = psVar159;
    if (local_c68._0_4_ != 1) goto LAB_0014493b;
    local_7e8 = (undefined1  [16])0x0;
    auStack_7f8 = (undefined1  [16])0x0;
    auStack_808 = (undefined1  [16])0x0;
    local_818.fn = (_func_void_char_ptr_void_ptr *)0x0;
    local_818.data = (void *)0x0;
    local_828 = (undefined1  [16])0x0;
    local_838.fn = (_func_void_char_ptr_void_ptr *)0x0;
    local_838.data = (void *)0x0;
    local_ca8._0_4_ = -1;
    local_ca8._4_4_ = 0xffffffff;
    local_ca8._8_4_ = -1;
    local_ca8._12_4_ = 0xffffffff;
    local_ca8._16_4_ = 0xffffffff;
    local_ca8._20_4_ = 0xffffffff;
    local_ca8._24_4_ = -1;
    local_ca8._28_4_ = 0xffffffff;
    unaff_R13 = (secp256k1_context *)local_d98;
    psStack_e10 = (secp256k1_context *)0x1430e6;
    testrand256((uchar *)unaff_R13);
    psStack_e10 = (secp256k1_context *)0x1430f9;
    iVar154 = secp256k1_keypair_create(psVar159,(secp256k1_keypair *)local_c18,(uchar *)unaff_R13);
    if (iVar154 == 0) goto LAB_00144940;
    lVar158 = 0;
    unaff_R14 = (secp256k1_context *)local_db8;
    do {
      pcVar157 = (code *)CONCAT71((int7)((ulong)pcVar157 >> 8),*(char *)((long)&local_838 + lVar158)
                                 );
      if (*(char *)((long)&local_838 + lVar158) != local_c18[lVar158]) goto LAB_00143126;
      lVar158 = lVar158 + 1;
    } while (lVar158 != 0x60);
    psStack_e10 = (secp256k1_context *)0x143126;
    run_extrakeys_tests_cold_130();
LAB_00143126:
    psStack_e10 = (secp256k1_context *)0x14313f;
    iVar154 = secp256k1_keypair_create(CTX,(secp256k1_keypair *)local_c18,local_d98);
    if (iVar154 == 0) goto LAB_00144945;
    lVar158 = 0;
    do {
      if (*(char *)((long)&local_838 + lVar158) != local_c18[lVar158]) goto LAB_00143167;
      lVar158 = lVar158 + 1;
    } while (lVar158 != 0x60);
    psStack_e10 = (secp256k1_context *)0x143167;
    run_extrakeys_tests_cold_128();
LAB_00143167:
    psVar159 = CTX;
    local_df8._0_8_ = local_df8._0_8_ & 0xffffffff00000000;
    local_d08 = CTX->illegal_callback;
    pcVar157 = (code *)CTX;
    if (secp256k1_context_static == CTX) goto LAB_0014494a;
    pcVar157 = counting_callback_fn;
    (CTX->illegal_callback).fn = counting_callback_fn;
    (psVar159->illegal_callback).data = unaff_R15;
    psVar159 = unaff_R14;
  }
  psStack_e10 = (secp256k1_context *)0x1431b3;
  (*pcVar157)("keypair != NULL",unaff_R15);
  psVar160 = CTX;
  (CTX->illegal_callback).fn = local_d08.fn;
  (psVar160->illegal_callback).data = local_d08.data;
  if (local_df8._0_4_ == 1) {
    local_df8._0_8_ = local_df8._0_8_ & 0xffffffff00000000;
    local_d08 = psVar160->illegal_callback;
    if (secp256k1_context_static == psVar160) goto LAB_0014497d;
    in_RCX = counting_callback_fn;
    (psVar160->illegal_callback).fn = counting_callback_fn;
    (psVar160->illegal_callback).data = local_df8;
  }
  else {
    psStack_e10 = (secp256k1_context *)0x14497d;
    run_extrakeys_tests_cold_52();
    psVar160 = extraout_RAX_12;
LAB_0014497d:
    psStack_e10 = (secp256k1_context *)0x144991;
    (*(psVar160->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar160->illegal_callback).data);
    in_RCX = (CTX->illegal_callback).fn;
    psVar160 = CTX;
  }
  local_bc8._0_16_ = ZEXT816(0);
  auStack_bd8 = ZEXT816(0);
  auStack_be8 = ZEXT816(0);
  local_bf8 = (secp256k1_callback)ZEXT816(0);
  _local_c08 = ZEXT816(0);
  _local_c18 = (secp256k1_callback)ZEXT816(0);
  pcVar174 = "seckey32 != NULL";
  if ((psVar160->ecmult_gen_ctx).built == 0) {
    pcVar174 = "secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx)";
  }
  psStack_e10 = (secp256k1_context *)0x143266;
  (*in_RCX)(pcVar174,(psVar160->illegal_callback).data);
  psVar160 = CTX;
  (CTX->illegal_callback).fn = local_d08.fn;
  (psVar160->illegal_callback).data = local_d08.data;
  if (local_df8._0_4_ == 1) {
    lVar158 = 0;
    do {
      in_RCX = (code *)CONCAT71((int7)((ulong)in_RCX >> 8),*(char *)((long)&local_838 + lVar158));
      if (*(char *)((long)&local_838 + lVar158) != local_c18[lVar158]) goto LAB_00144cc8;
      lVar158 = lVar158 + 1;
    } while (lVar158 != 0x60);
    psStack_e10 = (secp256k1_context *)0x1432ba;
    iVar154 = secp256k1_keypair_create(psVar160,(secp256k1_keypair *)local_c18,local_d98);
    psVar160 = STATIC_CTX;
    if (iVar154 == 0) goto LAB_001449a9;
    local_df8._0_8_ = local_df8._0_8_ & 0xffffffff00000000;
    local_d08 = STATIC_CTX->illegal_callback;
    if (secp256k1_context_static == STATIC_CTX) goto LAB_001449ae;
    (STATIC_CTX->illegal_callback).fn = counting_callback_fn;
    in_RCX = (code *)local_df8;
    (psVar160->illegal_callback).data = in_RCX;
  }
  else {
    psStack_e10 = (secp256k1_context *)0x1449a9;
    run_extrakeys_tests_cold_53();
LAB_001449a9:
    psStack_e10 = (secp256k1_context *)0x1449ae;
    run_extrakeys_tests_cold_127();
    psVar160 = extraout_RAX_13;
LAB_001449ae:
    psStack_e10 = (secp256k1_context *)0x1449c2;
    (*(psVar160->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar160->illegal_callback).data);
    psVar160 = STATIC_CTX;
  }
  psStack_e10 = (secp256k1_context *)0x14331c;
  iVar154 = secp256k1_keypair_create(psVar160,(secp256k1_keypair *)local_c18,local_d98);
  psVar160 = STATIC_CTX;
  if (iVar154 == 0) {
    (STATIC_CTX->illegal_callback).fn = local_d08.fn;
    (psVar160->illegal_callback).data = local_d08.data;
    if (local_df8._0_4_ != 1) goto LAB_001449d3;
    lVar158 = 0;
    do {
      in_RCX = (code *)CONCAT71((int7)((ulong)in_RCX >> 8),*(char *)((long)&local_838 + lVar158));
      if (*(char *)((long)&local_838 + lVar158) != local_c18[lVar158]) goto LAB_00144ccd;
      lVar158 = lVar158 + 1;
    } while (lVar158 != 0x60);
    psStack_e10 = (secp256k1_context *)0x143382;
    iVar154 = secp256k1_keypair_create(CTX,(secp256k1_keypair *)local_c18,(uchar *)&local_838);
    if (iVar154 != 0) goto LAB_001449d8;
    lVar158 = 0;
    do {
      in_RCX = (code *)CONCAT71((int7)((ulong)in_RCX >> 8),*(char *)((long)&local_838 + lVar158));
      if (*(char *)((long)&local_838 + lVar158) != local_c18[lVar158]) goto LAB_00144cd2;
      lVar158 = lVar158 + 1;
    } while (lVar158 != 0x60);
    psStack_e10 = (secp256k1_context *)0x1433c5;
    iVar154 = secp256k1_keypair_create(CTX,(secp256k1_keypair *)local_c18,local_ca8);
    if (iVar154 != 0) goto LAB_001449dd;
    lVar158 = 0;
    do {
      in_RCX = (code *)CONCAT71((int7)((ulong)in_RCX >> 8),*(char *)((long)&local_838 + lVar158));
      unaff_R14 = psVar164;
      if (*(char *)((long)&local_838 + lVar158) != local_c18[lVar158]) goto LAB_00144cd7;
      lVar158 = lVar158 + 1;
    } while (lVar158 != 0x60);
    unaff_R15 = (secp256k1_context *)local_d98;
    psStack_e10 = (secp256k1_context *)0x1433f9;
    testrand256((uchar *)unaff_R15);
    psStack_e10 = (secp256k1_context *)0x143410;
    iVar154 = secp256k1_keypair_create(CTX,(secp256k1_keypair *)local_c18,(uchar *)unaff_R15);
    psVar160 = CTX;
    if (iVar154 == 0) goto LAB_001449e2;
    local_cd8 = local_bc8._0_16_;
    local_ce8 = auStack_bd8;
    local_cf8 = auStack_be8;
    local_d08 = local_bf8;
    auVar147._12_4_ = 0;
    auVar147._0_12_ = stack0xfffffffffffff2bc;
    _auStack_d48 = (secp256k1_callback)(auVar147 << 0x20);
    local_df8._0_8_ = (CTX->illegal_callback).fn;
    local_df8._8_8_ = (CTX->illegal_callback).data;
    in_RCX = (code *)CTX;
    if (secp256k1_context_static == CTX) goto LAB_001449e7;
    pcVar157 = counting_callback_fn;
    (CTX->illegal_callback).fn = counting_callback_fn;
    (psVar160->illegal_callback).data = psVar164;
  }
  else {
    psStack_e10 = (secp256k1_context *)0x1449d3;
    run_extrakeys_tests_cold_55();
LAB_001449d3:
    psStack_e10 = (secp256k1_context *)0x1449d8;
    run_extrakeys_tests_cold_56();
LAB_001449d8:
    psStack_e10 = (secp256k1_context *)0x1449dd;
    run_extrakeys_tests_cold_58();
LAB_001449dd:
    psStack_e10 = (secp256k1_context *)0x1449e2;
    run_extrakeys_tests_cold_60();
LAB_001449e2:
    psStack_e10 = (secp256k1_context *)0x1449e7;
    run_extrakeys_tests_cold_126();
LAB_001449e7:
    psStack_e10 = (secp256k1_context *)0x1449fb;
    (*(((secp256k1_context *)in_RCX)->illegal_callback).fn)
              ("ctx != secp256k1_context_static",
               (((secp256k1_context *)in_RCX)->illegal_callback).data);
    pcVar157 = (CTX->illegal_callback).fn;
    unaff_R14 = (secp256k1_context *)(CTX->illegal_callback).data;
  }
  psStack_e10 = (secp256k1_context *)0x1434a8;
  (*pcVar157)("pubkey != NULL",unaff_R14);
  psVar164 = CTX;
  (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_df8._0_8_;
  (psVar164->illegal_callback).data = (void *)local_df8._8_8_;
  if (auStack_d48._0_4_ == 1) {
    auVar148._12_4_ = 0;
    auVar148._0_12_ = stack0xfffffffffffff2bc;
    _auStack_d48 = (secp256k1_callback)(auVar148 << 0x20);
    local_df8._0_8_ = (psVar164->illegal_callback).fn;
    local_df8._8_8_ = (psVar164->illegal_callback).data;
    if (secp256k1_context_static == psVar164) goto LAB_00144a1a;
    in_RCX = counting_callback_fn;
    (psVar164->illegal_callback).fn = counting_callback_fn;
    (psVar164->illegal_callback).data = auStack_d48;
  }
  else {
    psStack_e10 = (secp256k1_context *)0x144a1a;
    run_extrakeys_tests_cold_62();
    psVar164 = extraout_RAX_14;
LAB_00144a1a:
    psStack_e10 = (secp256k1_context *)0x144a2e;
    (*(psVar164->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar164->illegal_callback).data);
    in_RCX = (CTX->illegal_callback).fn;
    psVar164 = CTX;
  }
  local_cd8 = ZEXT816(0);
  local_ce8 = ZEXT816(0);
  local_cf8 = ZEXT816(0);
  local_d08 = (secp256k1_callback)ZEXT816(0);
  psStack_e10 = (secp256k1_context *)0x143540;
  (*in_RCX)("keypair != NULL",(psVar164->illegal_callback).data);
  psVar164 = CTX;
  (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_df8._0_8_;
  (psVar164->illegal_callback).data = (void *)local_df8._8_8_;
  if (auStack_d48._0_4_ == 1) {
    unaff_R14 = (secp256k1_context *)&local_bf8;
    lVar158 = 0;
    do {
      in_RCX = (code *)CONCAT71((int7)((ulong)in_RCX >> 8),*(char *)((long)&local_838 + lVar158));
      if (*(char *)((long)&local_838 + lVar158) != *(char *)((long)&local_d08 + lVar158))
      goto LAB_00144cdc;
      lVar158 = lVar158 + 1;
    } while (lVar158 != 0x40);
    local_bc8._0_16_ = (undefined1  [16])0x0;
    auStack_bd8 = (undefined1  [16])0x0;
    auStack_be8 = (undefined1  [16])0x0;
    local_bf8.fn = (_func_void_char_ptr_void_ptr *)0x0;
    local_bf8.data = (void *)0x0;
    _local_c08 = (undefined1  [16])0x0;
    local_c18 = (undefined1  [8])0x0;
    uStack_c10 = (void *)0x0;
    local_d08 = (secp256k1_callback)ZEXT816(0);
    local_cf8 = ZEXT816(0);
    local_ce8 = ZEXT816(0);
    local_cd8 = ZEXT816(0);
    lVar158 = 0;
    do {
      in_RCX = (code *)CONCAT71((int7)((ulong)in_RCX >> 8),*(char *)((long)&local_838 + lVar158));
      if (*(char *)((long)&local_838 + lVar158) != *(char *)((long)&local_d08 + lVar158))
      goto LAB_00144ce1;
      lVar158 = lVar158 + 1;
    } while (lVar158 != 0x40);
    psStack_e10 = (secp256k1_context *)0x14362e;
    iVar154 = secp256k1_ec_pubkey_create(psVar164,(secp256k1_pubkey *)&local_d08,local_d98);
    if (iVar154 == 0) goto LAB_00144a46;
    psStack_e10 = (secp256k1_context *)0x14364f;
    iVar154 = secp256k1_keypair_create(CTX,(secp256k1_keypair *)local_c18,local_d98);
    if (iVar154 == 0) goto LAB_00144a4b;
    local_df8._48_8_ = local_bc8._0_8_;
    local_df8._56_8_ = local_bc8._8_8_;
    local_df8._32_8_ = auStack_bd8._0_8_;
    local_df8._40_8_ = auStack_bd8._8_8_;
    local_df8._16_8_ = auStack_be8._0_8_;
    local_df8._24_8_ = auStack_be8._8_8_;
    local_df8._0_8_ = local_bf8.fn;
    local_df8._8_8_ = local_bf8.data;
    lVar158 = 0;
    do {
      in_RCX = (code *)CONCAT71((int7)((ulong)in_RCX >> 8),*(char *)((long)&local_d08 + lVar158));
      if (*(char *)((long)&local_d08 + lVar158) != local_df8[lVar158]) goto LAB_00144ce6;
      lVar158 = lVar158 + 1;
    } while (lVar158 != 0x40);
    unaff_R14 = (secp256k1_context *)local_d98;
    psStack_e10 = (secp256k1_context *)0x1436ad;
    testrand256((uchar *)unaff_R14);
    psStack_e10 = (secp256k1_context *)0x1436c4;
    iVar154 = secp256k1_keypair_create(CTX,(secp256k1_keypair *)local_c18,(uchar *)unaff_R14);
    if (iVar154 == 0) goto LAB_00144a50;
    in_RCX = (code *)local_c18;
    psStack_e10 = (secp256k1_context *)0x1436f0;
    iVar154 = secp256k1_keypair_xonly_pub
                        (CTX,(secp256k1_xonly_pubkey *)auStack_d48,(int *)(local_ca8 + 0x20),
                         (secp256k1_keypair *)in_RCX);
    psVar164 = CTX;
    if (iVar154 == 0) goto LAB_00144a55;
    auVar149._12_4_ = 0;
    auVar149._0_12_ = _auStack_db4;
    _local_db8 = (secp256k1_callback)(auVar149 << 0x20);
    _local_c68 = CTX->illegal_callback;
    in_RCX = (code *)CTX;
    if (secp256k1_context_static == CTX) goto LAB_00144a5a;
    pcVar157 = counting_callback_fn;
    (CTX->illegal_callback).fn = counting_callback_fn;
    (psVar164->illegal_callback).data = psVar159;
  }
  else {
    psStack_e10 = (secp256k1_context *)0x144a46;
    run_extrakeys_tests_cold_63();
LAB_00144a46:
    psStack_e10 = (secp256k1_context *)0x144a4b;
    run_extrakeys_tests_cold_125();
LAB_00144a4b:
    psStack_e10 = (secp256k1_context *)0x144a50;
    run_extrakeys_tests_cold_124();
LAB_00144a50:
    psStack_e10 = (secp256k1_context *)0x144a55;
    run_extrakeys_tests_cold_123();
LAB_00144a55:
    psStack_e10 = (secp256k1_context *)0x144a5a;
    run_extrakeys_tests_cold_122();
LAB_00144a5a:
    psStack_e10 = (secp256k1_context *)0x144a6e;
    (*(((secp256k1_context *)in_RCX)->illegal_callback).fn)
              ("ctx != secp256k1_context_static",
               (((secp256k1_context *)in_RCX)->illegal_callback).data);
    pcVar157 = (CTX->illegal_callback).fn;
    psVar159 = (secp256k1_context *)(CTX->illegal_callback).data;
  }
  psStack_e10 = (secp256k1_context *)0x143744;
  (*pcVar157)("pubkey != NULL",psVar159);
  psVar164 = CTX;
  (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_c68;
  (psVar164->illegal_callback).data = uStack_c60;
  if (local_db8 == (undefined1  [4])0x1) {
    psStack_e10 = (secp256k1_context *)0x14377c;
    iVar154 = secp256k1_keypair_xonly_pub
                        (psVar164,(secp256k1_xonly_pubkey *)auStack_d48,(int *)0x0,
                         (secp256k1_keypair *)local_c18);
    psVar164 = CTX;
    if (iVar154 == 0) goto LAB_00144a8d;
    auVar150._12_4_ = 0;
    auVar150._0_12_ = _auStack_db4;
    _local_db8 = (secp256k1_callback)(auVar150 << 0x20);
    _local_c68 = CTX->illegal_callback;
    if (secp256k1_context_static == CTX) goto LAB_00144a92;
    in_RCX = counting_callback_fn;
    (CTX->illegal_callback).fn = counting_callback_fn;
    (psVar164->illegal_callback).data = local_db8;
  }
  else {
    psStack_e10 = (secp256k1_context *)0x144a8d;
    run_extrakeys_tests_cold_67();
LAB_00144a8d:
    psStack_e10 = (secp256k1_context *)0x144a92;
    run_extrakeys_tests_cold_121();
    psVar164 = extraout_RAX_15;
LAB_00144a92:
    psStack_e10 = (secp256k1_context *)0x144aa6;
    (*(psVar164->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar164->illegal_callback).data);
    in_RCX = (CTX->illegal_callback).fn;
    psVar164 = CTX;
  }
  local_d18 = ZEXT816(0);
  local_d28 = ZEXT816(0);
  _local_d38 = ZEXT816(0);
  _auStack_d48 = (secp256k1_callback)ZEXT816(0);
  psStack_e10 = (secp256k1_context *)0x1437fc;
  (*in_RCX)("keypair != NULL",(psVar164->illegal_callback).data);
  psVar164 = CTX;
  (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_c68;
  (psVar164->illegal_callback).data = uStack_c60;
  if (local_db8 == (undefined1  [4])0x1) {
    lVar158 = 0;
    do {
      in_RCX = (code *)CONCAT71((int7)((ulong)in_RCX >> 8),*(char *)((long)&local_838 + lVar158));
      if (*(char *)((long)&local_838 + lVar158) != auStack_d48[lVar158]) goto LAB_00144ceb;
      lVar158 = lVar158 + 1;
    } while (lVar158 != 0x40);
    psStack_e10 = (secp256k1_context *)0x14385b;
    iVar154 = secp256k1_keypair_xonly_pub
                        (psVar164,(secp256k1_xonly_pubkey *)auStack_d48,(int *)(local_ca8 + 0x20),
                         (secp256k1_keypair *)local_c18);
    psVar164 = CTX;
    if (iVar154 == 0) goto LAB_00144abe;
    local_bc8._0_16_ = (undefined1  [16])0x0;
    auStack_bd8 = (undefined1  [16])0x0;
    auStack_be8 = (undefined1  [16])0x0;
    local_bf8.fn = (_func_void_char_ptr_void_ptr *)0x0;
    local_bf8.data = (void *)0x0;
    _local_c08 = (undefined1  [16])0x0;
    local_c18 = (undefined1  [8])0x0;
    uStack_c10 = (void *)0x0;
    auVar151._12_4_ = 0;
    auVar151._0_12_ = _auStack_db4;
    _local_db8 = (secp256k1_callback)(auVar151 << 0x20);
    _local_c68 = CTX->illegal_callback;
    if (secp256k1_context_static == CTX) goto LAB_00144ac3;
    (CTX->illegal_callback).fn = counting_callback_fn;
    (psVar164->illegal_callback).data = local_db8;
  }
  else {
    psStack_e10 = (secp256k1_context *)0x144abe;
    run_extrakeys_tests_cold_68();
LAB_00144abe:
    psStack_e10 = (secp256k1_context *)0x144ac3;
    run_extrakeys_tests_cold_120();
    psVar164 = extraout_RAX_16;
LAB_00144ac3:
    psStack_e10 = (secp256k1_context *)0x144ad7;
    (*(psVar164->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar164->illegal_callback).data);
    psVar164 = CTX;
  }
  in_RCX = (code *)local_c18;
  psStack_e10 = (secp256k1_context *)0x143902;
  iVar154 = secp256k1_keypair_xonly_pub
                      (psVar164,(secp256k1_xonly_pubkey *)auStack_d48,(int *)(local_ca8 + 0x20),
                       (secp256k1_keypair *)in_RCX);
  psVar164 = CTX;
  if (iVar154 == 0) {
    (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_c68;
    (psVar164->illegal_callback).data = uStack_c60;
    if (local_db8 != (undefined1  [4])0x1) goto LAB_00144ae8;
    lVar158 = 0;
    do {
      in_RCX = (code *)CONCAT71((int7)((ulong)in_RCX >> 8),*(char *)((long)&local_838 + lVar158));
      if (*(char *)((long)&local_838 + lVar158) != auStack_d48[lVar158]) goto LAB_00144cf0;
      lVar158 = lVar158 + 1;
    } while (lVar158 != 0x40);
    psStack_e10 = (secp256k1_context *)0x14395e;
    iVar154 = secp256k1_ec_pubkey_create(psVar164,(secp256k1_pubkey *)&local_d08,local_d98);
    if (iVar154 == 0) goto LAB_00144aed;
    in_RCX = (code *)&local_d08;
    psStack_e10 = (secp256k1_context *)0x14398a;
    iVar154 = secp256k1_xonly_pubkey_from_pubkey
                        (CTX,(secp256k1_xonly_pubkey *)auStack_d48,(int *)(local_ca8 + 0x20),
                         (secp256k1_pubkey *)in_RCX);
    if (iVar154 == 0) goto LAB_00144af2;
    psStack_e10 = (secp256k1_context *)0x1439ab;
    iVar154 = secp256k1_keypair_create(CTX,(secp256k1_keypair *)local_c18,local_d98);
    if (iVar154 == 0) goto LAB_00144af7;
    in_RCX = (code *)local_c18;
    psStack_e10 = (secp256k1_context *)0x1439d4;
    iVar154 = secp256k1_keypair_xonly_pub
                        (CTX,(secp256k1_xonly_pubkey *)local_c68,(int *)local_e00,
                         (secp256k1_keypair *)in_RCX);
    if (iVar154 == 0) goto LAB_00144afc;
    lVar158 = 0;
    do {
      in_RCX = (code *)CONCAT71((int7)((ulong)in_RCX >> 8),auStack_d48[lVar158]);
      if (auStack_d48[lVar158] != local_c68[lVar158]) goto LAB_00144cf5;
      lVar158 = lVar158 + 1;
    } while (lVar158 != 0x40);
    if (local_ca8._32_4_ != local_e00._0_4_) goto LAB_00144b01;
    psVar159 = (secp256k1_context *)local_d98;
    psStack_e10 = (secp256k1_context *)0x143a19;
    testrand256((uchar *)psVar159);
    psStack_e10 = (secp256k1_context *)0x143a30;
    iVar154 = secp256k1_keypair_create(CTX,(secp256k1_keypair *)local_c18,(uchar *)psVar159);
    psVar164 = CTX;
    if (iVar154 == 0) goto LAB_00144b06;
    local_da8 = _local_c08;
    _local_db8 = _local_c18;
    local_e00._4_4_ = 0;
    local_d68._0_8_ = (CTX->illegal_callback).fn;
    local_d68._8_8_ = (CTX->illegal_callback).data;
    in_RCX = (code *)CTX;
    if (secp256k1_context_static == CTX) goto LAB_00144b0b;
    pcVar157 = counting_callback_fn;
    (CTX->illegal_callback).fn = counting_callback_fn;
    puVar169 = local_e00 + 4;
    (psVar164->illegal_callback).data = puVar169;
  }
  else {
    psStack_e10 = (secp256k1_context *)0x144ae8;
    run_extrakeys_tests_cold_70();
LAB_00144ae8:
    psStack_e10 = (secp256k1_context *)0x144aed;
    run_extrakeys_tests_cold_71();
LAB_00144aed:
    psStack_e10 = (secp256k1_context *)0x144af2;
    run_extrakeys_tests_cold_119();
LAB_00144af2:
    psStack_e10 = (secp256k1_context *)0x144af7;
    run_extrakeys_tests_cold_118();
LAB_00144af7:
    psStack_e10 = (secp256k1_context *)0x144afc;
    run_extrakeys_tests_cold_117();
LAB_00144afc:
    psStack_e10 = (secp256k1_context *)0x144b01;
    run_extrakeys_tests_cold_116();
LAB_00144b01:
    psStack_e10 = (secp256k1_context *)0x144b06;
    run_extrakeys_tests_cold_74();
LAB_00144b06:
    psStack_e10 = (secp256k1_context *)0x144b0b;
    run_extrakeys_tests_cold_115();
LAB_00144b0b:
    psStack_e10 = (secp256k1_context *)0x144b1f;
    (*(((secp256k1_context *)in_RCX)->illegal_callback).fn)
              ("ctx != secp256k1_context_static",
               (((secp256k1_context *)in_RCX)->illegal_callback).data);
    pcVar157 = (CTX->illegal_callback).fn;
    puVar169 = (undefined1 *)(CTX->illegal_callback).data;
  }
  psStack_e10 = (secp256k1_context *)0x143aa2;
  (*pcVar157)("seckey != NULL",puVar169);
  psVar164 = CTX;
  (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_d68._0_8_;
  (psVar164->illegal_callback).data = (void *)local_d68._8_8_;
  if (local_e00._4_4_ == 1) {
    local_e00._4_4_ = 0;
    local_d68._0_8_ = (psVar164->illegal_callback).fn;
    local_d68._8_8_ = (psVar164->illegal_callback).data;
    if (secp256k1_context_static == psVar164) goto LAB_00144b3e;
    in_RCX = counting_callback_fn;
    (psVar164->illegal_callback).fn = counting_callback_fn;
    puVar169 = local_e00 + 4;
    (psVar164->illegal_callback).data = puVar169;
  }
  else {
    psStack_e10 = (secp256k1_context *)0x144b3e;
    run_extrakeys_tests_cold_75();
    psVar164 = extraout_RAX_17;
LAB_00144b3e:
    psStack_e10 = (secp256k1_context *)0x144b52;
    (*(psVar164->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar164->illegal_callback).data);
    in_RCX = (CTX->illegal_callback).fn;
    puVar169 = (undefined1 *)(CTX->illegal_callback).data;
  }
  local_da8 = ZEXT816(0);
  _local_db8 = (secp256k1_callback)ZEXT816(0);
  psStack_e10 = (secp256k1_context *)0x143b1a;
  (*in_RCX)("keypair != NULL",puVar169);
  psVar164 = CTX;
  (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_d68._0_8_;
  (psVar164->illegal_callback).data = (void *)local_d68._8_8_;
  if (local_e00._4_4_ == 1) {
    lVar158 = 0;
    do {
      in_RCX = (code *)CONCAT71((int7)((ulong)in_RCX >> 8),*(char *)((long)&local_838 + lVar158));
      if (*(char *)((long)&local_838 + lVar158) != local_db8[lVar158]) goto LAB_00144cfa;
      lVar158 = lVar158 + 1;
    } while (lVar158 != 0x20);
    psStack_e10 = (secp256k1_context *)0x143b6b;
    iVar154 = secp256k1_keypair_create(psVar164,(secp256k1_keypair *)local_c18,local_d98);
    if (iVar154 == 0) goto LAB_00144b71;
    local_da8 = _local_c08;
    _local_db8 = _local_c18;
    lVar158 = 0;
    do {
      in_RCX = (code *)CONCAT71((int7)((ulong)in_RCX >> 8),local_d98[lVar158]);
      if (local_d98[lVar158] != local_db8[lVar158]) goto LAB_00144cff;
      lVar158 = lVar158 + 1;
    } while (lVar158 != 0x20);
    local_bc8._0_16_ = (undefined1  [16])0x0;
    auStack_bd8 = (undefined1  [16])0x0;
    auStack_be8 = (undefined1  [16])0x0;
    local_bf8.fn = (_func_void_char_ptr_void_ptr *)0x0;
    local_bf8.data = (void *)0x0;
    _local_c08 = (undefined1  [16])0x0;
    local_c18 = (undefined1  [8])0x0;
    uStack_c10 = (void *)0x0;
    _local_db8 = (_func_void_char_ptr_void_ptr *)0x0;
    stack0xfffffffffffff250 = (void *)0x0;
    local_da8 = (undefined1  [16])0x0;
    lVar158 = 0;
    do {
      in_RCX = (code *)CONCAT71((int7)((ulong)in_RCX >> 8),*(char *)((long)&local_838 + lVar158));
      if (*(char *)((long)&local_838 + lVar158) != local_db8[lVar158]) goto LAB_00144d04;
      lVar158 = lVar158 + 1;
    } while (lVar158 != 0x20);
    local_bc8._0_16_ = (undefined1  [16])0x0;
    auStack_bd8 = (undefined1  [16])0x0;
    auStack_be8 = (undefined1  [16])0x0;
    local_bf8.fn = (_func_void_char_ptr_void_ptr *)0x0;
    local_bf8.data = (void *)0x0;
    _local_c08 = (undefined1  [16])0x0;
    local_c18 = (undefined1  [8])0x0;
    uStack_c10 = (void *)0x0;
    psVar159 = (secp256k1_context *)local_d98;
    psStack_e10 = (secp256k1_context *)0x143c53;
    testrand256((uchar *)psVar159);
    psStack_e10 = (secp256k1_context *)0x143c60;
    testrand256(local_ca8);
    local_da8._8_4_ = 0xffffffff;
    local_da8._0_8_ = 0xffffffffffffffff;
    local_da8._12_4_ = 0xffffffff;
    auStack_db4._4_4_ = 0xffffffff;
    _local_db8 = (_func_void_char_ptr_void_ptr *)0xffffffffffffffff;
    uStack_dac = 0xffffffff;
    psStack_e10 = (secp256k1_context *)0x143c87;
    iVar154 = secp256k1_keypair_create(CTX,(secp256k1_keypair *)&local_838,(uchar *)psVar159);
    if (iVar154 == 0) goto LAB_00144b76;
    psStack_e10 = (secp256k1_context *)0x143cab;
    iVar154 = secp256k1_keypair_xonly_tweak_add(CTX,(secp256k1_keypair *)&local_838,local_ca8);
    if (iVar154 != 1) goto LAB_00144b7b;
    psStack_e10 = (secp256k1_context *)0x143cd0;
    iVar154 = secp256k1_keypair_xonly_tweak_add(CTX,(secp256k1_keypair *)&local_838,local_ca8);
    if (iVar154 != 1) goto LAB_00144b80;
    psStack_e10 = (secp256k1_context *)0x143cf5;
    iVar154 = secp256k1_keypair_xonly_tweak_add(CTX,(secp256k1_keypair *)&local_838,local_ca8);
    psVar164 = CTX;
    if (iVar154 != 1) goto LAB_00144b85;
    local_df8._0_8_ = local_df8._0_8_ & 0xffffffff00000000;
    local_d08 = CTX->illegal_callback;
    in_RCX = (code *)CTX;
    if (secp256k1_context_static == CTX) goto LAB_00144b8a;
    pcVar157 = counting_callback_fn;
    (CTX->illegal_callback).fn = counting_callback_fn;
    puVar169 = local_df8;
    (psVar164->illegal_callback).data = puVar169;
  }
  else {
    psStack_e10 = (secp256k1_context *)0x144b71;
    run_extrakeys_tests_cold_76();
LAB_00144b71:
    psStack_e10 = (secp256k1_context *)0x144b76;
    run_extrakeys_tests_cold_114();
LAB_00144b76:
    psStack_e10 = (secp256k1_context *)0x144b7b;
    run_extrakeys_tests_cold_113();
LAB_00144b7b:
    psStack_e10 = (secp256k1_context *)0x144b80;
    run_extrakeys_tests_cold_80();
LAB_00144b80:
    psStack_e10 = (secp256k1_context *)0x144b85;
    run_extrakeys_tests_cold_81();
LAB_00144b85:
    psStack_e10 = (secp256k1_context *)0x144b8a;
    run_extrakeys_tests_cold_82();
LAB_00144b8a:
    psStack_e10 = (secp256k1_context *)0x144b9e;
    (*(((secp256k1_context *)in_RCX)->illegal_callback).fn)
              ("ctx != secp256k1_context_static",
               (((secp256k1_context *)in_RCX)->illegal_callback).data);
    pcVar157 = (CTX->illegal_callback).fn;
    puVar169 = (undefined1 *)(CTX->illegal_callback).data;
  }
  psStack_e10 = (secp256k1_context *)0x143d4c;
  (*pcVar157)("keypair != NULL",puVar169);
  psVar164 = CTX;
  (CTX->illegal_callback).fn = local_d08.fn;
  (psVar164->illegal_callback).data = local_d08.data;
  if (local_df8._0_4_ == 1) {
    local_df8._0_8_ = local_df8._0_8_ & 0xffffffff00000000;
    local_d08 = psVar164->illegal_callback;
    if (secp256k1_context_static == psVar164) goto LAB_00144bbd;
    in_RCX = counting_callback_fn;
    (psVar164->illegal_callback).fn = counting_callback_fn;
    puVar169 = local_df8;
    (psVar164->illegal_callback).data = puVar169;
  }
  else {
    psStack_e10 = (secp256k1_context *)0x144bbd;
    run_extrakeys_tests_cold_83();
    psVar164 = extraout_RAX_18;
LAB_00144bbd:
    psStack_e10 = (secp256k1_context *)0x144bd1;
    (*(psVar164->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar164->illegal_callback).data);
    in_RCX = (CTX->illegal_callback).fn;
    puVar169 = (undefined1 *)(CTX->illegal_callback).data;
  }
  psStack_e10 = (secp256k1_context *)0x143db7;
  (*in_RCX)("tweak32 != NULL",puVar169);
  psVar164 = CTX;
  (CTX->illegal_callback).fn = local_d08.fn;
  (psVar164->illegal_callback).data = local_d08.data;
  if (local_df8._0_4_ == 1) {
    lVar158 = 0;
    do {
      in_RCX = (code *)CONCAT71((int7)((ulong)in_RCX >> 8),*(char *)((long)&local_838 + lVar158));
      if (*(char *)((long)&local_838 + lVar158) != local_c18[lVar158]) goto LAB_00143dfa;
      lVar158 = lVar158 + 1;
    } while (lVar158 != 0x60);
    psStack_e10 = (secp256k1_context *)0x143dfa;
    run_extrakeys_tests_cold_112();
LAB_00143dfa:
    psStack_e10 = (secp256k1_context *)0x143e0c;
    iVar154 = secp256k1_keypair_create(psVar164,(secp256k1_keypair *)&local_838,local_d98);
    if (iVar154 == 0) goto LAB_00144bf0;
    psStack_e10 = (secp256k1_context *)0x143e2d;
    iVar154 = secp256k1_keypair_xonly_tweak_add(CTX,(secp256k1_keypair *)&local_838,local_db8);
    if (iVar154 != 0) goto LAB_00144bf5;
    lVar158 = 0;
    do {
      in_RCX = (code *)CONCAT71((int7)((ulong)in_RCX >> 8),*(char *)((long)&local_838 + lVar158));
      if (*(char *)((long)&local_838 + lVar158) != local_c18[lVar158]) goto LAB_00144d09;
      lVar158 = lVar158 + 1;
    } while (lVar158 != 0x60);
    psStack_e10 = (secp256k1_context *)0x143e6d;
    iVar154 = secp256k1_keypair_create(CTX,(secp256k1_keypair *)&local_838,local_d98);
    if (iVar154 == 0) goto LAB_00144bfa;
    psStack_e10 = (secp256k1_context *)0x143e91;
    iVar154 = secp256k1_keypair_xonly_tweak_add(CTX,(secp256k1_keypair *)&local_838,local_c18);
    if (iVar154 != 1) goto LAB_00144bff;
    if (0 < COUNT) {
      unaff_RBP = (code *)0x0;
      psVar159 = (secp256k1_context *)local_d98;
      unaff_R14 = (secp256k1_context *)&local_838;
      unaff_R15 = (secp256k1_context *)&local_d08;
      unaff_R12 = (secp256k1_context *)local_df8;
      unaff_R13 = (secp256k1_context *)local_ca8;
LAB_00143ecb:
      psStack_e10 = (secp256k1_context *)0x143ed3;
      testrand256((uchar *)psVar159);
      psStack_e10 = (secp256k1_context *)0x143ee5;
      iVar154 = secp256k1_keypair_create(CTX,(secp256k1_keypair *)unaff_R14,(uchar *)psVar159);
      if (iVar154 != 0) {
        psStack_e10 = (secp256k1_context *)0x143efd;
        memcpy(unaff_R15,unaff_R14,0x60);
        psStack_e10 = (secp256k1_context *)0x143f0a;
        secp256k1_scalar_set_b32((secp256k1_scalar *)unaff_R12,(uchar *)psVar159,(int *)0x0);
        psStack_e10 = (secp256k1_context *)0x143f15;
        secp256k1_scalar_negate((secp256k1_scalar *)unaff_R12,(secp256k1_scalar *)unaff_R12);
        psStack_e10 = (secp256k1_context *)0x143f20;
        secp256k1_scalar_get_b32((uchar *)unaff_R13,(secp256k1_scalar *)unaff_R12);
        psStack_e10 = (secp256k1_context *)0x143f32;
        iVar154 = secp256k1_keypair_xonly_tweak_add
                            (CTX,(secp256k1_keypair *)unaff_R14,(uchar *)psVar159);
        if (iVar154 != 0) {
          psStack_e10 = (secp256k1_context *)0x143f48;
          iVar154 = secp256k1_keypair_xonly_tweak_add
                              (CTX,(secp256k1_keypair *)unaff_R15,(uchar *)unaff_R13);
          if (iVar154 != 0) goto LAB_00144464;
        }
        lVar158 = 0;
        do {
          in_RCX = (code *)CONCAT71((int7)((ulong)in_RCX >> 8),*(char *)((long)&local_838 + lVar158)
                                   );
          if (*(char *)((long)&local_838 + lVar158) != local_c18[lVar158]) {
            lVar158 = 0;
            goto LAB_00143f6f;
          }
          lVar158 = lVar158 + 1;
        } while (lVar158 != 0x60);
        goto LAB_00143f8c;
      }
      goto LAB_00144432;
    }
LAB_00143f9a:
    local_7e8 = (undefined1  [16])0x0;
    auStack_7f8 = (undefined1  [16])0x0;
    auStack_808 = (undefined1  [16])0x0;
    local_818.fn = (_func_void_char_ptr_void_ptr *)0x0;
    local_818.data = (void *)0x0;
    local_828 = (undefined1  [16])0x0;
    local_838.fn = (_func_void_char_ptr_void_ptr *)0x0;
    local_838.data = (void *)0x0;
    psStack_e10 = (secp256k1_context *)0x143fe1;
    testrand256(local_ca8);
    psVar164 = CTX;
    local_df8._0_8_ = local_df8._0_8_ & 0xffffffff00000000;
    local_d08 = CTX->illegal_callback;
    if (secp256k1_context_static == CTX) goto LAB_00144c04;
    (CTX->illegal_callback).fn = counting_callback_fn;
    in_RCX = (code *)local_df8;
    (psVar164->illegal_callback).data = in_RCX;
  }
  else {
    psStack_e10 = (secp256k1_context *)0x144bf0;
    run_extrakeys_tests_cold_84();
LAB_00144bf0:
    psStack_e10 = (secp256k1_context *)0x144bf5;
    run_extrakeys_tests_cold_111();
LAB_00144bf5:
    psStack_e10 = (secp256k1_context *)0x144bfa;
    run_extrakeys_tests_cold_85();
LAB_00144bfa:
    psStack_e10 = (secp256k1_context *)0x144bff;
    run_extrakeys_tests_cold_110();
LAB_00144bff:
    psStack_e10 = (secp256k1_context *)0x144c04;
    run_extrakeys_tests_cold_87();
    psVar164 = extraout_RAX_19;
LAB_00144c04:
    psStack_e10 = (secp256k1_context *)0x144c18;
    (*(psVar164->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar164->illegal_callback).data);
    psVar164 = CTX;
  }
  psStack_e10 = (secp256k1_context *)0x14403e;
  iVar154 = secp256k1_keypair_xonly_tweak_add(psVar164,(secp256k1_keypair *)&local_838,local_ca8);
  psVar164 = CTX;
  if (iVar154 == 0) {
    (CTX->illegal_callback).fn = local_d08.fn;
    (psVar164->illegal_callback).data = local_d08.data;
    if (local_df8._0_4_ != 1) goto LAB_00144c29;
    lVar158 = 0;
    do {
      in_RCX = (code *)CONCAT71((int7)((ulong)in_RCX >> 8),*(char *)((long)&local_838 + lVar158));
      if (*(char *)((long)&local_838 + lVar158) != local_c18[lVar158]) goto LAB_00144d0e;
      lVar158 = lVar158 + 1;
    } while (lVar158 != 0x60);
    psStack_e10 = (secp256k1_context *)0x14409a;
    iVar154 = secp256k1_keypair_create(psVar164,(secp256k1_keypair *)&local_838,local_d98);
    psVar164 = CTX;
    if (iVar154 == 0) goto LAB_00144c2e;
    local_828 = (undefined1  [16])0x0;
    local_838.fn = (_func_void_char_ptr_void_ptr *)0x0;
    local_838.data = (void *)0x0;
    local_df8._0_8_ = local_df8._0_8_ & 0xffffffff00000000;
    local_d08 = CTX->illegal_callback;
    if (secp256k1_context_static == CTX) goto LAB_00144c33;
    (CTX->illegal_callback).fn = counting_callback_fn;
    in_RCX = (code *)local_df8;
    (psVar164->illegal_callback).data = in_RCX;
  }
  else {
    psStack_e10 = (secp256k1_context *)0x144c29;
    run_extrakeys_tests_cold_90();
LAB_00144c29:
    psStack_e10 = (secp256k1_context *)0x144c2e;
    run_extrakeys_tests_cold_91();
LAB_00144c2e:
    psStack_e10 = (secp256k1_context *)0x144c33;
    run_extrakeys_tests_cold_108();
    psVar164 = extraout_RAX_20;
LAB_00144c33:
    psStack_e10 = (secp256k1_context *)0x144c47;
    (*(psVar164->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar164->illegal_callback).data);
    psVar164 = CTX;
  }
  psStack_e10 = (secp256k1_context *)0x144115;
  iVar154 = secp256k1_keypair_xonly_tweak_add(psVar164,(secp256k1_keypair *)&local_838,local_ca8);
  psVar164 = CTX;
  if (iVar154 == 0) {
    (CTX->illegal_callback).fn = local_d08.fn;
    (psVar164->illegal_callback).data = local_d08.data;
    if (local_df8._0_4_ != 1) goto LAB_00144c58;
    psStack_e10 = (secp256k1_context *)0x144150;
    iVar154 = secp256k1_keypair_create(psVar164,(secp256k1_keypair *)&local_838,local_d98);
    psVar164 = CTX;
    if (iVar154 == 0) goto LAB_00144c5d;
    local_7e8 = ZEXT816(0);
    auStack_7f8 = ZEXT816(0);
    auStack_808 = ZEXT816(0);
    local_818 = (secp256k1_callback)ZEXT816(0);
    local_df8._0_8_ = local_df8._0_8_ & 0xffffffff00000000;
    local_d08 = CTX->illegal_callback;
    if (secp256k1_context_static == CTX) goto LAB_00144c62;
    (CTX->illegal_callback).fn = counting_callback_fn;
    in_RCX = (code *)local_df8;
    (psVar164->illegal_callback).data = in_RCX;
  }
  else {
    psStack_e10 = (secp256k1_context *)0x144c58;
    run_extrakeys_tests_cold_93();
LAB_00144c58:
    psStack_e10 = (secp256k1_context *)0x144c5d;
    run_extrakeys_tests_cold_94();
LAB_00144c5d:
    psStack_e10 = (secp256k1_context *)0x144c62;
    run_extrakeys_tests_cold_107();
    psVar164 = extraout_RAX_21;
LAB_00144c62:
    psStack_e10 = (secp256k1_context *)0x144c76;
    (*(psVar164->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar164->illegal_callback).data);
    psVar164 = CTX;
  }
  psStack_e10 = (secp256k1_context *)0x1441d8;
  iVar154 = secp256k1_keypair_xonly_tweak_add(psVar164,(secp256k1_keypair *)&local_838,local_ca8);
  psVar164 = CTX;
  if (iVar154 == 0) {
    (CTX->illegal_callback).fn = local_d08.fn;
    (psVar164->illegal_callback).data = local_d08.data;
    if (local_df8._0_4_ != 1) goto LAB_00144c87;
    psStack_e10 = (secp256k1_context *)0x144215;
    iVar154 = secp256k1_keypair_create(psVar164,(secp256k1_keypair *)&local_838,local_d98);
    if (iVar154 != 0) {
      if (0 < COUNT) {
        unaff_R12 = (secp256k1_context *)0x0;
        unaff_R14 = (secp256k1_context *)local_ca8;
        unaff_R13 = (secp256k1_context *)&local_d08;
        unaff_R15 = (secp256k1_context *)&local_838;
        unaff_RBP = (code *)local_d68;
        do {
          psStack_e10 = (secp256k1_context *)0x144255;
          testrand256((uchar *)unaff_R14);
          psStack_e10 = (secp256k1_context *)0x144269;
          in_RCX = (code *)unaff_R15;
          iVar154 = secp256k1_keypair_xonly_pub
                              (CTX,(secp256k1_xonly_pubkey *)unaff_R13,(int *)0x0,
                               (secp256k1_keypair *)unaff_R15);
          if (iVar154 == 0) goto LAB_00144437;
          psStack_e10 = (secp256k1_context *)0x144283;
          iVar154 = secp256k1_keypair_xonly_tweak_add
                              (CTX,(secp256k1_keypair *)unaff_R15,(uchar *)unaff_R14);
          psVar164 = unaff_R13;
          if (iVar154 != 1) goto LAB_0014443c;
          psVar164 = (secp256k1_context *)local_df8;
          psStack_e10 = (secp256k1_context *)0x1442b6;
          in_RCX = (code *)unaff_R15;
          local_c20 = unaff_R12;
          iVar154 = secp256k1_keypair_xonly_pub
                              (CTX,(secp256k1_xonly_pubkey *)psVar164,(int *)local_e00,
                               (secp256k1_keypair *)unaff_R15);
          if (iVar154 == 0) goto LAB_00144441;
          psStack_e10 = (secp256k1_context *)0x1442d3;
          iVar154 = secp256k1_xonly_pubkey_serialize
                              (CTX,(uchar *)unaff_RBP,(secp256k1_xonly_pubkey *)psVar164);
          psVar159 = (secp256k1_context *)unaff_RBP;
          psVar160 = unaff_R14;
          psVar184 = unaff_R13;
          if (iVar154 == 0) goto LAB_00144446;
          psStack_e10 = (secp256k1_context *)0x1442fa;
          in_RCX = (code *)unaff_R13;
          in_R8 = unaff_R14;
          iVar154 = secp256k1_xonly_pubkey_tweak_add_check
                              (CTX,(uchar *)unaff_RBP,local_e00._0_4_,
                               (secp256k1_xonly_pubkey *)unaff_R13,(uchar *)unaff_R14);
          if (iVar154 == 0) goto LAB_0014444b;
          local_d18 = local_7e8;
          local_d28 = auStack_7f8;
          _local_d38 = auStack_808;
          _auStack_d48 = local_818;
          psStack_e10 = (secp256k1_context *)0x144359;
          in_RCX = (code *)unaff_R14;
          iVar154 = secp256k1_xonly_pubkey_tweak_add
                              (CTX,(secp256k1_pubkey *)local_c68,(secp256k1_xonly_pubkey *)unaff_R13
                               ,(uchar *)unaff_R14);
          unaff_R12 = local_c20;
          psVar159 = unaff_R15;
          if (iVar154 == 0) goto LAB_00144450;
          lVar158 = 0;
          do {
            in_RCX = (code *)CONCAT71((int7)((ulong)in_RCX >> 8),auStack_d48[lVar158]);
            psVar164 = unaff_R14;
            if (auStack_d48[lVar158] != local_c68[lVar158]) goto LAB_0014481f;
            lVar158 = lVar158 + 1;
          } while (lVar158 != 0x40);
          local_ca8._48_8_ = local_828._0_8_;
          local_ca8._56_8_ = local_828._8_8_;
          local_ca8._32_8_ = local_838.fn;
          local_ca8._40_8_ = local_838.data;
          psStack_e10 = (secp256k1_context *)0x1443cb;
          iVar154 = secp256k1_ec_pubkey_create(CTX,(secp256k1_pubkey *)local_c68,local_ca8 + 0x20);
          if (iVar154 == 0) goto LAB_00144455;
          lVar158 = 0;
          do {
            if (auStack_d48[lVar158] != local_c68[lVar158]) goto LAB_00144824;
            lVar158 = lVar158 + 1;
          } while (lVar158 != 0x40);
          uVar166 = (int)unaff_R12 + 1;
          unaff_R12 = (secp256k1_context *)(ulong)uVar166;
          psVar159 = unaff_R14;
        } while ((int)uVar166 < COUNT);
      }
      return;
    }
  }
  else {
    psStack_e10 = (secp256k1_context *)0x144c87;
    run_extrakeys_tests_cold_95();
LAB_00144c87:
    psStack_e10 = (secp256k1_context *)0x144c8c;
    run_extrakeys_tests_cold_96();
  }
  psStack_e10 = (secp256k1_context *)0x144c91;
  run_extrakeys_tests_cold_106();
LAB_00144c91:
  psStack_e10 = (secp256k1_context *)0x144c96;
  run_extrakeys_tests_cold_89();
LAB_00144c96:
  psStack_e10 = (secp256k1_context *)0x144c9b;
  run_extrakeys_tests_cold_22();
LAB_00144c9b:
  psStack_e10 = (secp256k1_context *)0x144ca0;
  run_extrakeys_tests_cold_5();
LAB_00144ca0:
  psStack_e10 = (secp256k1_context *)0x144ca5;
  run_extrakeys_tests_cold_10();
LAB_00144ca5:
  psStack_e10 = (secp256k1_context *)0x144caa;
  run_extrakeys_tests_cold_15();
LAB_00144caa:
  psStack_e10 = (secp256k1_context *)0x144caf;
  run_extrakeys_tests_cold_17();
LAB_00144caf:
  psStack_e10 = (secp256k1_context *)0x144cb4;
  run_extrakeys_tests_cold_25();
LAB_00144cb4:
  psStack_e10 = (secp256k1_context *)0x144cb9;
  run_extrakeys_tests_cold_27();
  psVar164 = unaff_R14;
LAB_00144cb9:
  psStack_e10 = (secp256k1_context *)0x144cbe;
  run_extrakeys_tests_cold_29();
LAB_00144cbe:
  psStack_e10 = (secp256k1_context *)0x144cc3;
  run_extrakeys_tests_cold_34();
LAB_00144cc3:
  psStack_e10 = (secp256k1_context *)0x144cc8;
  run_extrakeys_tests_cold_43();
LAB_00144cc8:
  psStack_e10 = (secp256k1_context *)0x144ccd;
  run_extrakeys_tests_cold_54();
LAB_00144ccd:
  psStack_e10 = (secp256k1_context *)0x144cd2;
  run_extrakeys_tests_cold_57();
LAB_00144cd2:
  psStack_e10 = (secp256k1_context *)0x144cd7;
  run_extrakeys_tests_cold_59();
  unaff_R14 = psVar164;
LAB_00144cd7:
  psStack_e10 = (secp256k1_context *)0x144cdc;
  run_extrakeys_tests_cold_61();
LAB_00144cdc:
  psStack_e10 = (secp256k1_context *)0x144ce1;
  run_extrakeys_tests_cold_64();
LAB_00144ce1:
  psStack_e10 = (secp256k1_context *)0x144ce6;
  run_extrakeys_tests_cold_65();
LAB_00144ce6:
  psStack_e10 = (secp256k1_context *)0x144ceb;
  run_extrakeys_tests_cold_66();
LAB_00144ceb:
  psStack_e10 = (secp256k1_context *)0x144cf0;
  run_extrakeys_tests_cold_69();
LAB_00144cf0:
  psStack_e10 = (secp256k1_context *)0x144cf5;
  run_extrakeys_tests_cold_72();
LAB_00144cf5:
  psStack_e10 = (secp256k1_context *)0x144cfa;
  run_extrakeys_tests_cold_73();
LAB_00144cfa:
  psStack_e10 = (secp256k1_context *)0x144cff;
  run_extrakeys_tests_cold_77();
LAB_00144cff:
  psStack_e10 = (secp256k1_context *)0x144d04;
  run_extrakeys_tests_cold_78();
LAB_00144d04:
  psStack_e10 = (secp256k1_context *)0x144d09;
  run_extrakeys_tests_cold_79();
LAB_00144d09:
  psStack_e10 = (secp256k1_context *)0x144d0e;
  run_extrakeys_tests_cold_86();
LAB_00144d0e:
  psStack_e10 = (secp256k1_context *)run_schnorrsig_tests;
  run_extrakeys_tests_cold_92();
  psVar179 = (secp256k1_schnorrsig_extraparams *)auStack_11c0;
  auStack_11c0._8_5_ = 0x65636e6f6e;
  auStack_11c0[0] = 'B';
  auStack_11c0[1] = 'I';
  auStack_11c0[2] = 'P';
  auStack_11c0[3] = '0';
  auStack_11c0._4_4_ = 0x2f303433;
  psStackY_1218 = (secp256k1_context *)0x144d61;
  psStack_e38 = psVar159;
  psStack_e30 = unaff_R12;
  psStack_e28 = unaff_R13;
  psStack_e20 = unaff_R14;
  psStack_e18 = unaff_R15;
  psStack_e10 = (secp256k1_context *)unaff_RBP;
  secp256k1_sha256_initialize_tagged((secp256k1_sha256 *)auStack_f70,"BIP0340/nonce",0xd);
  auStack_1030._0_8_ = 0xf4bfbff746615b35;
  auStack_1030._8_8_ = (secp256k1_nonce_function_hardened)0x83627ab39f8dc671;
  pvStack_1020 = (void *)0x5735866160217180;
  auStack_1018[0] = 'T';
  auStack_1018[1] = 0x9e;
  auStack_1018[2] = 0xa2;
  auStack_1018[3] = '!';
  auStack_1018[4] = 'L';
  auStack_1018[5] = '{';
  auStack_1018[6] = 0xb0;
  auStack_1018[7] = 'h';
  auStack_ff0._32_8_ = (void *)0x40;
  psStackY_1218 = (secp256k1_context *)0x144d95;
  test_sha256_eq((secp256k1_sha256 *)auStack_f70,(secp256k1_sha256 *)auStack_1030);
  psStackY_1218 = (secp256k1_context *)0x144da9;
  secp256k1_sha256_initialize_tagged
            ((secp256k1_sha256 *)auStack_f70,"BIP0340/auxBIP0340/nonceBIP0340/challenge",0xb);
  auStack_1030._0_8_ = 0x4eba7e7024dd3219;
  auStack_1030._8_8_ = (secp256k1_nonce_function_hardened)0xfa3166dca0fabb9;
  pvStack_1020 = (void *)0x4c44df973afbe4b1;
  auStack_1018[0] = '9';
  auStack_1018[1] = '\'';
  auStack_1018[2] = 0xac;
  auStack_1018[3] = 'J';
  auStack_1018[4] = '\n';
  auStack_1018[5] = 0x85;
  auStack_1018[6] = 0x9e;
  auStack_1018[7] = '$';
  auStack_ff0._32_8_ = (void *)0x40;
  psStackY_1218 = (secp256k1_context *)0x144dd1;
  test_sha256_eq((secp256k1_sha256 *)auStack_f70,(secp256k1_sha256 *)auStack_1030);
  psStackY_1218 = (secp256k1_context *)0x144de1;
  testrand256(sStack_10c0.magic);
  pubkey_00 = (secp256k1_schnorrsig_extraparams *)&pvStack_1100;
  psStackY_1218 = (secp256k1_context *)0x144df1;
  testrand256((uchar *)pubkey_00);
  pubkey = &sStack_10e0;
  psStackY_1218 = (secp256k1_context *)0x144e01;
  testrand256(pubkey->magic);
  psVar167 = (secp256k1_schnorrsig_extraparams *)auStack_11e0;
  psStackY_1218 = (secp256k1_context *)0x144e0e;
  testrand256((uchar *)psVar167);
  keypair = &sStack_10c0;
  auStack_11a0._16_8_ = pubkey;
  auStack_11a0._24_8_ = psVar179;
  auStack_11a0._0_8_ = &sStack_10c0;
  auStack_11a0._8_8_ = pubkey_00;
  auStack_11a0._32_8_ = psVar167;
  if (0 < COUNT) {
    keypair = (secp256k1_schnorrsig_extraparams *)auStack_11a0;
    psVar167 = (secp256k1_schnorrsig_extraparams *)0x0;
    do {
      psStackY_1218 = (secp256k1_context *)0x144e4f;
      nonce_function_bip340_bitflip((uchar **)keypair,0,0x20,(size_t)in_RCX,(size_t)in_R8);
      psStackY_1218 = (secp256k1_context *)0x144e61;
      nonce_function_bip340_bitflip((uchar **)keypair,1,0x20,(size_t)in_RCX,(size_t)in_R8);
      psStackY_1218 = (secp256k1_context *)0x144e73;
      nonce_function_bip340_bitflip((uchar **)keypair,2,0x20,(size_t)in_RCX,(size_t)in_R8);
      psStackY_1218 = (secp256k1_context *)0x144e85;
      nonce_function_bip340_bitflip((uchar **)keypair,3,0xd,(size_t)in_RCX,(size_t)in_R8);
      psStackY_1218 = (secp256k1_context *)0x144e97;
      nonce_function_bip340_bitflip((uchar **)keypair,3,0xd,(size_t)in_RCX,(size_t)in_R8);
      psStackY_1218 = (secp256k1_context *)0x144ea9;
      nonce_function_bip340_bitflip((uchar **)keypair,4,0x20,(size_t)in_RCX,(size_t)in_R8);
      uVar166 = (int)psVar167 + 1;
      psVar167 = (secp256k1_schnorrsig_extraparams *)(ulong)uVar166;
    } while ((int)uVar166 < COUNT);
  }
  psStackY_1218 = (secp256k1_context *)0x144ef3;
  iVar154 = nonce_function_bip340
                      (auStack_1090,sStack_10c0.magic,0x20,(uchar *)&pvStack_1100,sStack_10e0.magic,
                       auStack_11c0,0xd,(void *)0x0);
  if (iVar154 == 0) goto LAB_001473be;
  keypair = (secp256k1_schnorrsig_extraparams *)auStack_11c0;
  psStackY_1218 = (secp256k1_context *)0x144f0d;
  testrand_bytes_test((uchar *)keypair,0xd);
  psStackY_1218 = (secp256k1_context *)0x144f4b;
  iVar154 = nonce_function_bip340
                      (auStack_1090,sStack_10c0.magic,0x20,(uchar *)&pvStack_1100,sStack_10e0.magic,
                       (uchar *)keypair,0xd,(void *)0x0);
  pcVar157 = (code *)psVar179;
  if (iVar154 == 0) goto LAB_001473c3;
  if (0 < COUNT) {
    psVar167 = (secp256k1_schnorrsig_extraparams *)0x0;
    keypair = &sStack_1140;
    pubkey_00 = &sStack_10c0;
    pubkey = (secp256k1_schnorrsig_extraparams *)&pvStack_1100;
    psVar179 = &sStack_10e0;
    unaff_RBP = (code *)auStack_11c0;
    do {
      psStackY_1218 = (secp256k1_context *)0x144f91;
      uVar155 = testrand_int(0x1f);
      psStackY_1218 = (secp256k1_context *)0x144fbc;
      iVar154 = nonce_function_bip340
                          (keypair->magic,pubkey_00->magic,(ulong)(uVar155 & 0x1f),(uchar *)pubkey,
                           psVar179->magic,(uchar *)unaff_RBP,0xd,(void *)0x0);
      if (iVar154 == 0) goto LAB_00147314;
      lVar158 = 0;
      while (auStack_1090[lVar158] == sStack_1140.magic[lVar158]) {
        lVar158 = lVar158 + 1;
        if (lVar158 == 0x20) goto LAB_001473b4;
      }
      psStackY_1218 = (secp256k1_context *)0x144fee;
      uVar155 = testrand_int(0xc);
      psStackY_1218 = (secp256k1_context *)0x145035;
      iVar154 = nonce_function_bip340
                          (keypair->magic,pubkey_00->magic,0x20,(uchar *)pubkey,psVar179->magic,
                           (uchar *)unaff_RBP,((ulong)uVar155 + 0xd) % 0xd,(void *)0x0);
      psVar168 = psVar167;
      if (iVar154 == 0) goto LAB_00147319;
      lVar158 = 0;
      while (auStack_1090[lVar158] == sStack_1140.magic[lVar158]) {
        lVar158 = lVar158 + 1;
        if (lVar158 == 0x20) goto LAB_001473b9;
      }
      uVar166 = (int)psVar167 + 1;
      psVar167 = (secp256k1_schnorrsig_extraparams *)(ulong)uVar166;
      pcVar157 = (code *)psVar179;
    } while ((int)uVar166 < COUNT);
  }
  auStack_11d0 = (undefined1  [16])0x0;
  auStack_11e0 = (undefined1  [16])0x0;
  psStackY_1218 = (secp256k1_context *)0x1450bc;
  iVar154 = nonce_function_bip340
                      (sStack_1140.magic,sStack_10c0.magic,0x20,(uchar *)&pvStack_1100,
                       sStack_10e0.magic,auStack_11c0,0xd,auStack_11e0);
  if (iVar154 == 0) goto LAB_001473c8;
  psVar159 = (secp256k1_context *)auStack_1090;
  psStackY_1218 = (secp256k1_context *)0x145104;
  iVar154 = nonce_function_bip340
                      ((uchar *)psVar159,sStack_10c0.magic,0x20,(uchar *)&pvStack_1100,
                       sStack_10e0.magic,auStack_11c0,0xd,(void *)0x0);
  psVar168 = psVar167;
  if (iVar154 == 0) goto LAB_001473cd;
  lVar158 = 0;
  do {
    if (sStack_1140.magic[lVar158] != auStack_1090[lVar158]) goto LAB_001476fe;
    lVar158 = lVar158 + 1;
  } while (lVar158 != 0x20);
  auStack_1150 = (undefined1  [16])0x0;
  auStack_1160 = (undefined1  [16])0x0;
  stack0xffffffffffffee90 = (undefined1  [16])0x0;
  auStack_11a0._32_8_ = (secp256k1_schnorrsig_extraparams *)0x0;
  auStack_11a0._40_8_ = 0;
  auStack_11a0._16_8_ = (secp256k1_schnorrsig_extraparams *)0x0;
  auStack_11a0._24_8_ = (secp256k1_schnorrsig_extraparams *)0x0;
  auStack_11a0._0_8_ = (secp256k1_schnorrsig_extraparams *)0x0;
  auStack_11a0._8_8_ = (secp256k1_schnorrsig_extraparams *)0x0;
  auStack_11c0._16_8_ = (void *)0x0;
  auStack_11c0[0] = 0xda;
  auStack_11c0[1] = 'o';
  auStack_11c0[2] = 0xb3;
  auStack_11c0[3] = 0x8c;
  auStack_11c0._4_4_ = 0;
  auStack_11c0._8_5_ = 0;
  auStack_11c0._13_3_ = 0;
  auStack_e50 = (undefined1  [16])0x0;
  pvStack_e40 = (void *)0x0;
  psVar168 = &sStack_10c0;
  psStackY_1218 = (secp256k1_context *)0x14519f;
  testrand256(psVar168->magic);
  psStackY_1218 = (secp256k1_context *)0x1451ac;
  testrand256((uchar *)&pvStack_1100);
  psStackY_1218 = (secp256k1_context *)0x1451b9;
  testrand256(sStack_10e0.magic);
  psStackY_1218 = (secp256k1_context *)0x1451c3;
  testrand256(auStack_11e0);
  psStackY_1218 = (secp256k1_context *)0x1451da;
  iVar154 = secp256k1_keypair_create(CTX,(secp256k1_keypair *)auStack_f70,psVar168->magic);
  if (iVar154 == 0) goto LAB_001473d2;
  keypair = (secp256k1_schnorrsig_extraparams *)(auStack_f58 + 0x48);
  psStackY_1218 = (secp256k1_context *)0x145201;
  iVar154 = secp256k1_keypair_create(CTX,(secp256k1_keypair *)keypair,(uchar *)&pvStack_1100);
  if (iVar154 == 0) goto LAB_001473d7;
  psVar168 = asStack_eb0;
  psStackY_1218 = (secp256k1_context *)0x145228;
  iVar154 = secp256k1_keypair_create(CTX,(secp256k1_keypair *)psVar168,sStack_10e0.magic);
  if (iVar154 == 0) goto LAB_001473dc;
  psStackY_1218 = (secp256k1_context *)0x14524e;
  iVar154 = secp256k1_keypair_xonly_pub
                      (CTX,(secp256k1_xonly_pubkey *)auStack_1030,(int *)0x0,
                       (secp256k1_keypair *)auStack_f70);
  if (iVar154 == 0) goto LAB_001473e1;
  psStackY_1218 = (secp256k1_context *)0x14526f;
  iVar154 = secp256k1_keypair_xonly_pub
                      (CTX,(secp256k1_xonly_pubkey *)auStack_ff0,(int *)0x0,
                       (secp256k1_keypair *)keypair);
  if (iVar154 == 0) goto LAB_001473e6;
  psStackY_1218 = (secp256k1_context *)0x145290;
  iVar154 = secp256k1_keypair_xonly_pub(CTX,&sStack_fb0,(int *)0x0,(secp256k1_keypair *)psVar168);
  if (iVar154 == 0) goto LAB_001473eb;
  auStack_1060 = (undefined1  [16])0x0;
  auStack_1070 = (undefined1  [16])0x0;
  auStack_1080 = (undefined1  [16])0x0;
  auStack_1090 = (undefined1  [16])0x0;
  psStackY_1218 = (secp256k1_context *)0x1452f5;
  iVar154 = secp256k1_schnorrsig_sign_internal
                      (CTX,sStack_1140.magic,auStack_11e0,0x20,(secp256k1_keypair *)auStack_f70,
                       nonce_function_bip340,(void *)0x0);
  psVar159 = CTX;
  if (iVar154 == 0) goto LAB_001473f0;
  iStack_11f4 = 0;
  p_Stack_11f0 = (CTX->illegal_callback).fn;
  pvStack_11e8 = (CTX->illegal_callback).data;
  if (secp256k1_context_static == CTX) goto LAB_001473f5;
  (CTX->illegal_callback).fn = counting_callback_fn;
  (psVar159->illegal_callback).data = &iStack_11f4;
  psVar179 = (secp256k1_schnorrsig_extraparams *)pcVar157;
  do {
    psStackY_1218 = (secp256k1_context *)0x14536a;
    iVar154 = secp256k1_schnorrsig_sign_internal
                        (psVar159,(uchar *)0x0,auStack_11e0,0x20,(secp256k1_keypair *)auStack_f70,
                         nonce_function_bip340,(void *)0x0);
    psVar159 = CTX;
    if (iVar154 == 0) {
      (CTX->illegal_callback).fn = p_Stack_11f0;
      (psVar159->illegal_callback).data = pvStack_11e8;
      if (iStack_11f4 != 1) goto LAB_0014741a;
      iStack_11f4 = 0;
      p_Stack_11f0 = (psVar159->illegal_callback).fn;
      pvStack_11e8 = (psVar159->illegal_callback).data;
      if (secp256k1_context_static == psVar159) goto LAB_0014741f;
      (psVar159->illegal_callback).fn = counting_callback_fn;
      (psVar159->illegal_callback).data = &iStack_11f4;
    }
    else {
      psStackY_1218 = (secp256k1_context *)0x14741a;
      run_schnorrsig_tests_cold_2();
LAB_0014741a:
      psStackY_1218 = (secp256k1_context *)0x14741f;
      run_schnorrsig_tests_cold_3();
      psVar159 = extraout_RAX_23;
LAB_0014741f:
      psStackY_1218 = (secp256k1_context *)0x147433;
      (*(psVar159->illegal_callback).fn)
                ("ctx != secp256k1_context_static",(psVar159->illegal_callback).data);
      psVar159 = CTX;
    }
    psStackY_1218 = (secp256k1_context *)0x1453fc;
    iVar154 = secp256k1_schnorrsig_sign_internal
                        (psVar159,sStack_1140.magic,(uchar *)0x0,0x20,
                         (secp256k1_keypair *)auStack_f70,nonce_function_bip340,(void *)0x0);
    psVar159 = CTX;
    if (iVar154 == 0) {
      (CTX->illegal_callback).fn = p_Stack_11f0;
      (psVar159->illegal_callback).data = pvStack_11e8;
      if (iStack_11f4 != 1) goto LAB_00147444;
      iStack_11f4 = 0;
      p_Stack_11f0 = (psVar159->illegal_callback).fn;
      pvStack_11e8 = (psVar159->illegal_callback).data;
      if (secp256k1_context_static == psVar159) goto LAB_00147449;
      (psVar159->illegal_callback).fn = counting_callback_fn;
      (psVar159->illegal_callback).data = &iStack_11f4;
    }
    else {
      psStackY_1218 = (secp256k1_context *)0x147444;
      run_schnorrsig_tests_cold_4();
LAB_00147444:
      psStackY_1218 = (secp256k1_context *)0x147449;
      run_schnorrsig_tests_cold_5();
      psVar159 = extraout_RAX_24;
LAB_00147449:
      psStackY_1218 = (secp256k1_context *)0x14745d;
      (*(psVar159->illegal_callback).fn)
                ("ctx != secp256k1_context_static",(psVar159->illegal_callback).data);
      psVar159 = CTX;
    }
    psStackY_1218 = (secp256k1_context *)0x14548c;
    iVar154 = secp256k1_schnorrsig_sign_internal
                        (psVar159,sStack_1140.magic,auStack_11e0,0x20,(secp256k1_keypair *)0x0,
                         nonce_function_bip340,(void *)0x0);
    psVar159 = CTX;
    if (iVar154 == 0) {
      (CTX->illegal_callback).fn = p_Stack_11f0;
      (psVar159->illegal_callback).data = pvStack_11e8;
      if (iStack_11f4 != 1) goto LAB_0014746e;
      iStack_11f4 = 0;
      p_Stack_11f0 = (psVar159->illegal_callback).fn;
      pvStack_11e8 = (psVar159->illegal_callback).data;
      if (secp256k1_context_static == psVar159) goto LAB_00147473;
      (psVar159->illegal_callback).fn = counting_callback_fn;
      (psVar159->illegal_callback).data = &iStack_11f4;
    }
    else {
      psStackY_1218 = (secp256k1_context *)0x14746e;
      run_schnorrsig_tests_cold_6();
LAB_0014746e:
      psStackY_1218 = (secp256k1_context *)0x147473;
      run_schnorrsig_tests_cold_7();
      psVar159 = extraout_RAX_25;
LAB_00147473:
      psStackY_1218 = (secp256k1_context *)0x147487;
      (*(psVar159->illegal_callback).fn)
                ("ctx != secp256k1_context_static",(psVar159->illegal_callback).data);
      psVar159 = CTX;
    }
    psStackY_1218 = (secp256k1_context *)0x14551e;
    iVar154 = secp256k1_schnorrsig_sign_internal
                        (psVar159,sStack_1140.magic,auStack_11e0,0x20,
                         (secp256k1_keypair *)auStack_11a0,nonce_function_bip340,(void *)0x0);
    psVar159 = CTX;
    if (iVar154 == 0) {
      (CTX->illegal_callback).fn = p_Stack_11f0;
      (psVar159->illegal_callback).data = pvStack_11e8;
      psVar159 = STATIC_CTX;
      if (iStack_11f4 != 1) goto LAB_00147498;
      iStack_11f4 = 0;
      p_Stack_11f0 = (STATIC_CTX->illegal_callback).fn;
      pvStack_11e8 = (STATIC_CTX->illegal_callback).data;
      if (secp256k1_context_static == STATIC_CTX) goto LAB_0014749d;
      (STATIC_CTX->illegal_callback).fn = counting_callback_fn;
      (psVar159->illegal_callback).data = &iStack_11f4;
    }
    else {
      psStackY_1218 = (secp256k1_context *)0x147498;
      run_schnorrsig_tests_cold_8();
LAB_00147498:
      psStackY_1218 = (secp256k1_context *)0x14749d;
      run_schnorrsig_tests_cold_9();
      psVar159 = extraout_RAX_26;
LAB_0014749d:
      psStackY_1218 = (secp256k1_context *)0x1474b1;
      (*(psVar159->illegal_callback).fn)
                ("ctx != secp256k1_context_static",(psVar159->illegal_callback).data);
      psVar159 = STATIC_CTX;
    }
    psStackY_1218 = (secp256k1_context *)0x1455b7;
    iVar154 = secp256k1_schnorrsig_sign_internal
                        (psVar159,sStack_1140.magic,auStack_11e0,0x20,
                         (secp256k1_keypair *)auStack_f70,nonce_function_bip340,(void *)0x0);
    psVar159 = STATIC_CTX;
    if (iVar154 == 0) {
      (STATIC_CTX->illegal_callback).fn = p_Stack_11f0;
      (psVar159->illegal_callback).data = pvStack_11e8;
      if (iStack_11f4 != 1) goto LAB_001474c2;
      psStackY_1218 = (secp256k1_context *)0x145608;
      iVar154 = secp256k1_schnorrsig_sign_custom
                          (CTX,sStack_1140.magic,auStack_11e0,0x20,(secp256k1_keypair *)auStack_f70,
                           (secp256k1_schnorrsig_extraparams *)auStack_11c0);
      psVar159 = CTX;
      if (iVar154 == 0) goto LAB_001474c7;
      iStack_11f4 = 0;
      p_Stack_11f0 = (CTX->illegal_callback).fn;
      pvStack_11e8 = (CTX->illegal_callback).data;
      if (secp256k1_context_static == CTX) goto LAB_001474cc;
      (CTX->illegal_callback).fn = counting_callback_fn;
      (psVar159->illegal_callback).data = &iStack_11f4;
    }
    else {
      psStackY_1218 = (secp256k1_context *)0x1474c2;
      run_schnorrsig_tests_cold_10();
LAB_001474c2:
      psStackY_1218 = (secp256k1_context *)0x1474c7;
      run_schnorrsig_tests_cold_11();
LAB_001474c7:
      psStackY_1218 = (secp256k1_context *)0x1474cc;
      run_schnorrsig_tests_cold_84();
      psVar159 = extraout_RAX_27;
LAB_001474cc:
      psStackY_1218 = (secp256k1_context *)0x1474e0;
      (*(psVar159->illegal_callback).fn)
                ("ctx != secp256k1_context_static",(psVar159->illegal_callback).data);
      psVar159 = CTX;
    }
    psStackY_1218 = (secp256k1_context *)0x145673;
    iVar154 = secp256k1_schnorrsig_sign_custom
                        (psVar159,(uchar *)0x0,auStack_11e0,0x20,(secp256k1_keypair *)auStack_f70,
                         (secp256k1_schnorrsig_extraparams *)auStack_11c0);
    psVar159 = CTX;
    if (iVar154 == 0) {
      (CTX->illegal_callback).fn = p_Stack_11f0;
      (psVar159->illegal_callback).data = pvStack_11e8;
      if (iStack_11f4 != 1) goto LAB_001474f1;
      iStack_11f4 = 0;
      p_Stack_11f0 = (psVar159->illegal_callback).fn;
      pvStack_11e8 = (psVar159->illegal_callback).data;
      if (secp256k1_context_static == psVar159) goto LAB_001474f6;
      (psVar159->illegal_callback).fn = counting_callback_fn;
      (psVar159->illegal_callback).data = &iStack_11f4;
    }
    else {
      psStackY_1218 = (secp256k1_context *)0x1474f1;
      run_schnorrsig_tests_cold_12();
LAB_001474f1:
      psStackY_1218 = (secp256k1_context *)0x1474f6;
      run_schnorrsig_tests_cold_13();
      psVar159 = extraout_RAX_28;
LAB_001474f6:
      psStackY_1218 = (secp256k1_context *)0x14750a;
      (*(psVar159->illegal_callback).fn)
                ("ctx != secp256k1_context_static",(psVar159->illegal_callback).data);
      psVar159 = CTX;
    }
    psStackY_1218 = (secp256k1_context *)0x1456fb;
    iVar154 = secp256k1_schnorrsig_sign_custom
                        (psVar159,sStack_1140.magic,(uchar *)0x0,0x20,
                         (secp256k1_keypair *)auStack_f70,
                         (secp256k1_schnorrsig_extraparams *)auStack_11c0);
    psVar159 = CTX;
    if (iVar154 == 0) {
      (CTX->illegal_callback).fn = p_Stack_11f0;
      (psVar159->illegal_callback).data = pvStack_11e8;
      if (iStack_11f4 != 1) goto LAB_0014751b;
      psStackY_1218 = (secp256k1_context *)0x14573f;
      iVar154 = secp256k1_schnorrsig_sign_custom
                          (psVar159,sStack_1140.magic,(uchar *)0x0,0,
                           (secp256k1_keypair *)auStack_f70,
                           (secp256k1_schnorrsig_extraparams *)auStack_11c0);
      psVar159 = CTX;
      if (iVar154 == 0) goto LAB_00147520;
      iStack_11f4 = 0;
      p_Stack_11f0 = (CTX->illegal_callback).fn;
      pvStack_11e8 = (CTX->illegal_callback).data;
      if (secp256k1_context_static == CTX) goto LAB_00147525;
      (CTX->illegal_callback).fn = counting_callback_fn;
      (psVar159->illegal_callback).data = &iStack_11f4;
    }
    else {
      psStackY_1218 = (secp256k1_context *)0x14751b;
      run_schnorrsig_tests_cold_14();
LAB_0014751b:
      psStackY_1218 = (secp256k1_context *)0x147520;
      run_schnorrsig_tests_cold_15();
LAB_00147520:
      psStackY_1218 = (secp256k1_context *)0x147525;
      run_schnorrsig_tests_cold_83();
      psVar159 = extraout_RAX_29;
LAB_00147525:
      psStackY_1218 = (secp256k1_context *)0x147539;
      (*(psVar159->illegal_callback).fn)
                ("ctx != secp256k1_context_static",(psVar159->illegal_callback).data);
      psVar159 = CTX;
    }
    psStackY_1218 = (secp256k1_context *)0x1457ab;
    iVar154 = secp256k1_schnorrsig_sign_custom
                        (psVar159,sStack_1140.magic,auStack_11e0,0x20,(secp256k1_keypair *)0x0,
                         (secp256k1_schnorrsig_extraparams *)auStack_11c0);
    psVar159 = CTX;
    if (iVar154 == 0) {
      (CTX->illegal_callback).fn = p_Stack_11f0;
      (psVar159->illegal_callback).data = pvStack_11e8;
      if (iStack_11f4 != 1) goto LAB_0014754a;
      iStack_11f4 = 0;
      p_Stack_11f0 = (psVar159->illegal_callback).fn;
      pvStack_11e8 = (psVar159->illegal_callback).data;
      if (secp256k1_context_static == psVar159) goto LAB_0014754f;
      (psVar159->illegal_callback).fn = counting_callback_fn;
      (psVar159->illegal_callback).data = &iStack_11f4;
    }
    else {
      psStackY_1218 = (secp256k1_context *)0x14754a;
      run_schnorrsig_tests_cold_16();
LAB_0014754a:
      psStackY_1218 = (secp256k1_context *)0x14754f;
      run_schnorrsig_tests_cold_17();
      psVar159 = extraout_RAX_30;
LAB_0014754f:
      psStackY_1218 = (secp256k1_context *)0x147563;
      (*(psVar159->illegal_callback).fn)
                ("ctx != secp256k1_context_static",(psVar159->illegal_callback).data);
      psVar159 = CTX;
    }
    psStackY_1218 = (secp256k1_context *)0x145833;
    iVar154 = secp256k1_schnorrsig_sign_custom
                        (psVar159,sStack_1140.magic,auStack_11e0,0x20,
                         (secp256k1_keypair *)auStack_11a0,
                         (secp256k1_schnorrsig_extraparams *)auStack_11c0);
    psVar159 = CTX;
    if (iVar154 == 0) {
      (CTX->illegal_callback).fn = p_Stack_11f0;
      (psVar159->illegal_callback).data = pvStack_11e8;
      if (iStack_11f4 != 1) goto LAB_00147574;
      psStackY_1218 = (secp256k1_context *)0x145883;
      iVar154 = secp256k1_schnorrsig_sign_internal
                          (psVar159,sStack_1140.magic,auStack_11e0,0x20,
                           (secp256k1_keypair *)auStack_f70,(secp256k1_nonce_function_hardened)0x0,
                           (void *)0x0);
      psVar159 = CTX;
      if (iVar154 == 0) goto LAB_00147579;
      iStack_11f4 = 0;
      p_Stack_11f0 = (CTX->illegal_callback).fn;
      pvStack_11e8 = (CTX->illegal_callback).data;
      if (secp256k1_context_static == CTX) goto LAB_0014757e;
      (CTX->illegal_callback).fn = counting_callback_fn;
      (psVar159->illegal_callback).data = &iStack_11f4;
    }
    else {
      psStackY_1218 = (secp256k1_context *)0x147574;
      run_schnorrsig_tests_cold_18();
LAB_00147574:
      psStackY_1218 = (secp256k1_context *)0x147579;
      run_schnorrsig_tests_cold_19();
LAB_00147579:
      psStackY_1218 = (secp256k1_context *)0x14757e;
      run_schnorrsig_tests_cold_82();
      psVar159 = extraout_RAX_31;
LAB_0014757e:
      psStackY_1218 = (secp256k1_context *)0x147592;
      (*(psVar159->illegal_callback).fn)
                ("ctx != secp256k1_context_static",(psVar159->illegal_callback).data);
      psVar159 = CTX;
    }
    psStackY_1218 = (secp256k1_context *)0x1458f7;
    iVar154 = secp256k1_schnorrsig_sign_custom
                        (psVar159,sStack_1140.magic,auStack_11e0,0x20,
                         (secp256k1_keypair *)auStack_f70,
                         (secp256k1_schnorrsig_extraparams *)auStack_e50);
    psVar159 = CTX;
    if (iVar154 == 0) {
      (CTX->illegal_callback).fn = p_Stack_11f0;
      (psVar159->illegal_callback).data = pvStack_11e8;
      psVar159 = STATIC_CTX;
      if (iStack_11f4 != 1) goto LAB_001475a3;
      iStack_11f4 = 0;
      p_Stack_11f0 = (STATIC_CTX->illegal_callback).fn;
      pvStack_11e8 = (STATIC_CTX->illegal_callback).data;
      if (secp256k1_context_static == STATIC_CTX) goto LAB_001475a8;
      (STATIC_CTX->illegal_callback).fn = counting_callback_fn;
      (psVar159->illegal_callback).data = &iStack_11f4;
    }
    else {
      psStackY_1218 = (secp256k1_context *)0x1475a3;
      run_schnorrsig_tests_cold_20();
LAB_001475a3:
      psStackY_1218 = (secp256k1_context *)0x1475a8;
      run_schnorrsig_tests_cold_21();
      psVar159 = extraout_RAX_32;
LAB_001475a8:
      psStackY_1218 = (secp256k1_context *)0x1475bc;
      (*(psVar159->illegal_callback).fn)
                ("ctx != secp256k1_context_static",(psVar159->illegal_callback).data);
      psVar159 = STATIC_CTX;
    }
    psVar164 = (secp256k1_context *)0x20;
    psStackY_1218 = (secp256k1_context *)0x145986;
    iVar154 = secp256k1_schnorrsig_sign_custom
                        (psVar159,sStack_1140.magic,auStack_11e0,0x20,
                         (secp256k1_keypair *)auStack_f70,
                         (secp256k1_schnorrsig_extraparams *)auStack_11c0);
    psVar159 = STATIC_CTX;
    if (iVar154 == 0) {
      (STATIC_CTX->illegal_callback).fn = p_Stack_11f0;
      (psVar159->illegal_callback).data = pvStack_11e8;
      if (iStack_11f4 != 1) goto LAB_001475cd;
      psVar164 = (secp256k1_context *)0x20;
      psStackY_1218 = (secp256k1_context *)0x1459e1;
      iVar154 = secp256k1_schnorrsig_sign_internal
                          (CTX,sStack_1140.magic,auStack_11e0,0x20,(secp256k1_keypair *)auStack_f70,
                           nonce_function_bip340,(void *)0x0);
      if (iVar154 == 0) goto LAB_001475d2;
      psVar164 = (secp256k1_context *)0x20;
      psStackY_1218 = (secp256k1_context *)0x145a0f;
      iVar154 = secp256k1_schnorrsig_verify
                          (CTX,sStack_1140.magic,auStack_11e0,0x20,
                           (secp256k1_xonly_pubkey *)auStack_1030);
      psVar159 = CTX;
      if (iVar154 == 0) goto LAB_001475d7;
      iStack_11f4 = 0;
      p_Stack_11f0 = (CTX->illegal_callback).fn;
      pvStack_11e8 = (CTX->illegal_callback).data;
      psVar164 = CTX;
      if (secp256k1_context_static == CTX) goto LAB_001475dc;
      pcVar157 = counting_callback_fn;
      (CTX->illegal_callback).fn = counting_callback_fn;
      piVar170 = &iStack_11f4;
      (psVar159->illegal_callback).data = piVar170;
    }
    else {
      psStackY_1218 = (secp256k1_context *)0x1475cd;
      run_schnorrsig_tests_cold_22();
LAB_001475cd:
      psStackY_1218 = (secp256k1_context *)0x1475d2;
      run_schnorrsig_tests_cold_23();
LAB_001475d2:
      psStackY_1218 = (secp256k1_context *)0x1475d7;
      run_schnorrsig_tests_cold_81();
LAB_001475d7:
      psStackY_1218 = (secp256k1_context *)0x1475dc;
      run_schnorrsig_tests_cold_80();
LAB_001475dc:
      psStackY_1218 = (secp256k1_context *)0x1475f0;
      (*(psVar164->illegal_callback).fn)
                ("ctx != secp256k1_context_static",(psVar164->illegal_callback).data);
      pcVar157 = (CTX->illegal_callback).fn;
      piVar170 = (int *)(CTX->illegal_callback).data;
    }
    psStackY_1218 = (secp256k1_context *)0x145a62;
    (*pcVar157)("sig64 != NULL",piVar170);
    psVar159 = CTX;
    (CTX->illegal_callback).fn = p_Stack_11f0;
    (psVar159->illegal_callback).data = pvStack_11e8;
    if (iStack_11f4 == 1) {
      iStack_11f4 = 0;
      p_Stack_11f0 = (psVar159->illegal_callback).fn;
      pvStack_11e8 = (psVar159->illegal_callback).data;
      if (secp256k1_context_static == psVar159) goto LAB_0014760f;
      pcVar157 = counting_callback_fn;
      (psVar159->illegal_callback).fn = counting_callback_fn;
      piVar170 = &iStack_11f4;
      (psVar159->illegal_callback).data = piVar170;
    }
    else {
      psStackY_1218 = (secp256k1_context *)0x14760f;
      run_schnorrsig_tests_cold_24();
      psVar159 = extraout_RAX_33;
LAB_0014760f:
      psStackY_1218 = (secp256k1_context *)0x147623;
      (*(psVar159->illegal_callback).fn)
                ("ctx != secp256k1_context_static",(psVar159->illegal_callback).data);
      pcVar157 = (CTX->illegal_callback).fn;
      piVar170 = (int *)(CTX->illegal_callback).data;
    }
    psStackY_1218 = (secp256k1_context *)0x145ac7;
    (*pcVar157)("msg != NULL || msglen == 0",piVar170);
    psVar159 = CTX;
    (CTX->illegal_callback).fn = p_Stack_11f0;
    (psVar159->illegal_callback).data = pvStack_11e8;
    if (iStack_11f4 == 1) {
      pcVar157 = (code *)0x0;
      psStackY_1218 = (secp256k1_context *)0x145afe;
      iVar154 = secp256k1_schnorrsig_verify
                          (psVar159,sStack_1140.magic,(uchar *)0x0,0,
                           (secp256k1_xonly_pubkey *)auStack_1030);
      psVar159 = CTX;
      if (iVar154 != 0) goto LAB_00147642;
      iStack_11f4 = 0;
      p_Stack_11f0 = (CTX->illegal_callback).fn;
      pvStack_11e8 = (CTX->illegal_callback).data;
      pcVar157 = (code *)CTX;
      if (secp256k1_context_static == CTX) goto LAB_00147647;
      pcVar157 = counting_callback_fn;
      (CTX->illegal_callback).fn = counting_callback_fn;
      piVar170 = &iStack_11f4;
      (psVar159->illegal_callback).data = piVar170;
    }
    else {
      psStackY_1218 = (secp256k1_context *)0x147642;
      run_schnorrsig_tests_cold_25();
LAB_00147642:
      psStackY_1218 = (secp256k1_context *)0x147647;
      run_schnorrsig_tests_cold_26();
LAB_00147647:
      psStackY_1218 = (secp256k1_context *)0x14765b;
      (*(((secp256k1_context *)pcVar157)->illegal_callback).fn)
                ("ctx != secp256k1_context_static",
                 (((secp256k1_context *)pcVar157)->illegal_callback).data);
      pcVar157 = (CTX->illegal_callback).fn;
      piVar170 = (int *)(CTX->illegal_callback).data;
    }
    psStackY_1218 = (secp256k1_context *)0x145b51;
    (*pcVar157)("pubkey != NULL",piVar170);
    psVar159 = CTX;
    (CTX->illegal_callback).fn = p_Stack_11f0;
    (psVar159->illegal_callback).data = pvStack_11e8;
    if (iStack_11f4 == 1) {
      iStack_11f4 = 0;
      p_Stack_11f0 = (psVar159->illegal_callback).fn;
      pvStack_11e8 = (psVar159->illegal_callback).data;
      if (secp256k1_context_static == psVar159) goto LAB_0014767a;
      (psVar159->illegal_callback).fn = counting_callback_fn;
      (psVar159->illegal_callback).data = &iStack_11f4;
    }
    else {
      psStackY_1218 = (secp256k1_context *)0x14767a;
      run_schnorrsig_tests_cold_27();
      psVar159 = extraout_RAX_34;
LAB_0014767a:
      psStackY_1218 = (secp256k1_context *)0x14768e;
      (*(psVar159->illegal_callback).fn)
                ("ctx != secp256k1_context_static",(psVar159->illegal_callback).data);
      psVar159 = CTX;
    }
    psStackY_1218 = (secp256k1_context *)0x145bcf;
    iVar154 = secp256k1_schnorrsig_verify
                        (psVar159,sStack_1140.magic,auStack_11e0,0x20,
                         (secp256k1_xonly_pubkey *)auStack_1090);
    psVar164 = CTX;
    if (iVar154 != 0) {
      psStackY_1218 = (secp256k1_context *)0x14769f;
      run_schnorrsig_tests_cold_28();
LAB_0014769f:
      psStackY_1218 = (secp256k1_context *)0x1476a4;
      run_schnorrsig_tests_cold_29();
LAB_001476a4:
      psStackY_1218 = (secp256k1_context *)0x1476a9;
      run_schnorrsig_tests_cold_30();
LAB_001476a9:
      psStackY_1218 = (secp256k1_context *)0x1476ae;
      run_schnorrsig_tests_cold_31();
LAB_001476ae:
      psStackY_1218 = (secp256k1_context *)0x1476b3;
      run_schnorrsig_tests_cold_55();
LAB_001476b3:
      psStackY_1218 = (secp256k1_context *)0x1476b8;
      run_schnorrsig_tests_cold_54();
LAB_001476b8:
      psStackY_1218 = (secp256k1_context *)0x1476bd;
      run_schnorrsig_tests_cold_53();
LAB_001476bd:
      psStackY_1218 = (secp256k1_context *)0x1476c2;
      run_schnorrsig_tests_cold_44();
LAB_001476c2:
      psStackY_1218 = (secp256k1_context *)0x1476c7;
      run_schnorrsig_tests_cold_52();
LAB_001476c7:
      psStackY_1218 = (secp256k1_context *)0x1476cc;
      run_schnorrsig_tests_cold_51();
LAB_001476cc:
      psStackY_1218 = (secp256k1_context *)0x1476d1;
      run_schnorrsig_tests_cold_50();
LAB_001476d1:
      psStackY_1218 = (secp256k1_context *)0x1476d6;
      run_schnorrsig_tests_cold_49();
LAB_001476d6:
      psStackY_1218 = (secp256k1_context *)0x1476db;
      run_schnorrsig_tests_cold_48();
LAB_001476db:
      psStackY_1218 = (secp256k1_context *)0x1476e0;
      run_schnorrsig_tests_cold_47();
LAB_001476e0:
      psStackY_1218 = (secp256k1_context *)0x1476e5;
      run_schnorrsig_tests_cold_46();
LAB_001476e5:
      psStackY_1218 = (secp256k1_context *)0x1476ea;
      run_schnorrsig_tests_cold_45();
LAB_001476ea:
      pcVar157 = (code *)pubkey_00;
      psStackY_1218 = (secp256k1_context *)0x1476ef;
      run_schnorrsig_tests_cold_32();
LAB_001476ef:
      psStackY_1218 = (secp256k1_context *)0x1476f4;
      run_schnorrsig_tests_cold_34();
      psVar167 = psVar168;
      pubkey_00 = (secp256k1_schnorrsig_extraparams *)pcVar157;
LAB_001476f4:
      pcVar157 = (code *)psVar179;
      psStackY_1218 = (secp256k1_context *)0x1476f9;
      run_schnorrsig_tests_cold_36();
LAB_001476f9:
      psStackY_1218 = (secp256k1_context *)0x1476fe;
      run_schnorrsig_tests_cold_37();
LAB_001476fe:
      psStackY_1218 = (secp256k1_context *)secp256k1_ge_is_valid_var;
      run_schnorrsig_tests_cold_1();
      if ((int)(psVar159->ecmult_gen_ctx).ge_offset.y.n[0] == 0) {
        uVar165 = (psVar159->ecmult_gen_ctx).ge_offset.x.n[0];
        uVar171 = (psVar159->ecmult_gen_ctx).ge_offset.x.n[1];
        uVar175 = (psVar159->ecmult_gen_ctx).ge_offset.x.n[3];
        uVar163 = uVar165 * 2;
        auVar2._8_8_ = 0;
        auVar2._0_8_ = uVar175;
        auVar75._8_8_ = 0;
        auVar75._0_8_ = uVar163;
        uVar180 = (psVar159->ecmult_gen_ctx).ge_offset.x.n[2];
        auVar3._8_8_ = 0;
        auVar3._0_8_ = uVar180;
        auVar76._8_8_ = 0;
        auVar76._0_8_ = uVar171 * 2;
        uVar1 = (psVar159->ecmult_gen_ctx).ge_offset.x.n[4];
        auVar4._8_8_ = 0;
        auVar4._0_8_ = uVar1;
        auVar77._8_8_ = 0;
        auVar77._0_8_ = uVar1;
        auVar5._8_8_ = 0;
        auVar5._0_8_ = SUB168(auVar4 * auVar77,0);
        auVar189 = auVar2 * auVar75 + auVar3 * auVar76 + auVar5 * ZEXT816(0x1000003d10);
        uVar1 = uVar1 * 2;
        auVar6._8_8_ = 0;
        auVar6._0_8_ = uVar1;
        auVar78._8_8_ = 0;
        auVar78._0_8_ = uVar165;
        auVar7._8_8_ = 0;
        auVar7._0_8_ = uVar175;
        auVar79._8_8_ = 0;
        auVar79._0_8_ = uVar171 * 2;
        auVar8._8_8_ = 0;
        auVar8._0_8_ = uVar180;
        auVar80._8_8_ = 0;
        auVar80._0_8_ = uVar180;
        auVar9._8_8_ = 0;
        auVar9._0_8_ = SUB168(auVar4 * auVar77,8);
        auVar130 = auVar9 * ZEXT816(0x1000003d10000) +
                   auVar6 * auVar78 + auVar8 * auVar80 + auVar7 * auVar79 + (auVar189 >> 0x34);
        auVar10._8_8_ = 0;
        auVar10._0_8_ = uVar165;
        auVar81._8_8_ = 0;
        auVar81._0_8_ = uVar165;
        auVar11._8_8_ = 0;
        auVar11._0_8_ = uVar1;
        auVar82._8_8_ = 0;
        auVar82._0_8_ = uVar171;
        auVar12._8_8_ = 0;
        auVar12._0_8_ = uVar175;
        auVar83._8_8_ = 0;
        auVar83._0_8_ = uVar180 * 2;
        auVar131 = auVar12 * auVar83 + auVar11 * auVar82 + (auVar130 >> 0x34);
        auVar13._8_8_ = 0;
        auVar13._0_8_ = (auVar131._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar130._6_2_ & 0xf);
        auVar133 = auVar13 * ZEXT816(0x1000003d1) + auVar10 * auVar81;
        uVar161 = auVar133._0_8_;
        uVar165 = auVar133._8_8_;
        auVar153._8_8_ = uVar165 >> 0x34;
        auVar153._0_8_ = uVar165 * 0x1000 | uVar161 >> 0x34;
        auVar14._8_8_ = 0;
        auVar14._0_8_ = uVar171;
        auVar84._8_8_ = 0;
        auVar84._0_8_ = uVar163;
        auVar15._8_8_ = 0;
        auVar15._0_8_ = uVar1;
        auVar85._8_8_ = 0;
        auVar85._0_8_ = uVar180;
        auVar16._8_8_ = 0;
        auVar16._0_8_ = uVar175;
        auVar86._8_8_ = 0;
        auVar86._0_8_ = uVar175;
        auVar131 = auVar16 * auVar86 + auVar15 * auVar85 + (auVar131 >> 0x34);
        auVar17._8_8_ = 0;
        auVar17._0_8_ = auVar131._0_8_ & 0xfffffffffffff;
        auVar153 = auVar17 * ZEXT816(0x1000003d10) + auVar14 * auVar84 + auVar153;
        uVar162 = auVar153._0_8_;
        uVar165 = auVar153._8_8_;
        auVar132._8_8_ = uVar165 >> 0x34;
        auVar132._0_8_ = uVar165 * 0x1000 | uVar162 >> 0x34;
        auVar18._8_8_ = 0;
        auVar18._0_8_ = uVar180;
        auVar87._8_8_ = 0;
        auVar87._0_8_ = uVar163;
        auVar19._8_8_ = 0;
        auVar19._0_8_ = uVar171;
        auVar88._8_8_ = 0;
        auVar88._0_8_ = uVar171;
        auVar20._8_8_ = 0;
        auVar20._0_8_ = uVar1;
        auVar89._8_8_ = 0;
        auVar89._0_8_ = uVar175;
        auVar131 = auVar20 * auVar89 + (auVar131 >> 0x34);
        auVar21._8_8_ = 0;
        auVar21._0_8_ = auVar131._0_8_;
        auVar132 = auVar21 * ZEXT816(0x1000003d10) + auVar19 * auVar88 + auVar18 * auVar87 +
                   auVar132;
        auVar133 = auVar132 >> 0x34;
        auVar138._8_8_ = 0;
        auVar138._0_8_ = auVar133._0_8_;
        auVar22._8_8_ = 0;
        auVar22._0_8_ = auVar131._8_8_;
        auVar137._8_8_ = auVar133._8_8_;
        auVar137._0_8_ = auVar189._0_8_ & 0xffffffffffffe;
        auVar138 = auVar22 * ZEXT816(0x1000003d10000) + auVar137 + auVar138;
        uVar172 = auVar138._0_8_;
        uVar165 = *(ulong *)&psVar159->ecmult_gen_ctx;
        uVar171 = (psVar159->ecmult_gen_ctx).scalar_offset.d[2];
        uVar163 = uVar165 * 2;
        auVar23._8_8_ = 0;
        auVar23._0_8_ = uVar171;
        auVar90._8_8_ = 0;
        auVar90._0_8_ = uVar163;
        uVar175 = (psVar159->ecmult_gen_ctx).scalar_offset.d[0];
        uVar180 = (psVar159->ecmult_gen_ctx).scalar_offset.d[1];
        auVar24._8_8_ = 0;
        auVar24._0_8_ = uVar180;
        auVar91._8_8_ = 0;
        auVar91._0_8_ = uVar175 * 2;
        uVar1 = (psVar159->ecmult_gen_ctx).scalar_offset.d[3];
        auVar25._8_8_ = 0;
        auVar25._0_8_ = uVar1;
        auVar92._8_8_ = 0;
        auVar92._0_8_ = uVar1;
        auVar26._8_8_ = 0;
        auVar26._0_8_ = SUB168(auVar25 * auVar92,0);
        auVar189 = auVar26 * ZEXT816(0x1000003d10) + auVar24 * auVar91 + auVar23 * auVar90;
        uVar177 = uVar1 * 2;
        auVar27._8_8_ = 0;
        auVar27._0_8_ = uVar177;
        auVar93._8_8_ = 0;
        auVar93._0_8_ = uVar165;
        auVar28._8_8_ = 0;
        auVar28._0_8_ = uVar171;
        auVar94._8_8_ = 0;
        auVar94._0_8_ = uVar175 * 2;
        auVar29._8_8_ = 0;
        auVar29._0_8_ = uVar180;
        auVar95._8_8_ = 0;
        auVar95._0_8_ = uVar180;
        auVar30._8_8_ = 0;
        auVar30._0_8_ = SUB168(auVar25 * auVar92,8);
        auVar139 = auVar30 * ZEXT816(0x1000003d10000) +
                   auVar27 * auVar93 + auVar29 * auVar95 + auVar28 * auVar94 + (auVar189 >> 0x34);
        auVar31._8_8_ = 0;
        auVar31._0_8_ = uVar165;
        auVar96._8_8_ = 0;
        auVar96._0_8_ = uVar165;
        auVar32._8_8_ = 0;
        auVar32._0_8_ = uVar177;
        auVar97._8_8_ = 0;
        auVar97._0_8_ = uVar175;
        auVar33._8_8_ = 0;
        auVar33._0_8_ = uVar171;
        auVar98._8_8_ = 0;
        auVar98._0_8_ = uVar180 * 2;
        auVar131 = auVar33 * auVar98 + auVar32 * auVar97 + (auVar139 >> 0x34);
        auVar34._8_8_ = 0;
        auVar34._0_8_ = (auVar131._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar139._6_2_ & 0xf);
        auVar133 = auVar34 * ZEXT816(0x1000003d1) + auVar31 * auVar96;
        auVar35._8_8_ = 0;
        auVar35._0_8_ = uVar175;
        auVar99._8_8_ = 0;
        auVar99._0_8_ = uVar163;
        auVar36._8_8_ = 0;
        auVar36._0_8_ = uVar177;
        auVar100._8_8_ = 0;
        auVar100._0_8_ = uVar180;
        auVar37._8_8_ = 0;
        auVar37._0_8_ = uVar171;
        auVar101._8_8_ = 0;
        auVar101._0_8_ = uVar171;
        auVar131 = auVar37 * auVar101 + auVar36 * auVar100 + (auVar131 >> 0x34);
        auVar38._8_8_ = 0;
        auVar38._0_8_ = auVar131._0_8_ & 0xfffffffffffff;
        auVar144 = (auVar133 >> 0x34) + auVar35 * auVar99 + auVar38 * ZEXT816(0x1000003d10);
        uVar173 = auVar144._0_8_;
        uVar176 = auVar144._8_8_;
        auVar39._8_8_ = 0;
        auVar39._0_8_ = uVar180;
        auVar102._8_8_ = 0;
        auVar102._0_8_ = uVar163;
        auVar134._8_8_ = uVar176 >> 0x34;
        auVar134._0_8_ = uVar176 * 0x1000 | uVar173 >> 0x34;
        auVar40._8_8_ = 0;
        auVar40._0_8_ = uVar175;
        auVar103._8_8_ = 0;
        auVar103._0_8_ = uVar175;
        auVar41._8_8_ = 0;
        auVar41._0_8_ = uVar177;
        auVar104._8_8_ = 0;
        auVar104._0_8_ = uVar171;
        auVar131 = auVar41 * auVar104 + (auVar131 >> 0x34);
        auVar42._8_8_ = 0;
        auVar42._0_8_ = auVar131._0_8_;
        auVar134 = auVar39 * auVar102 + auVar40 * auVar103 + auVar42 * ZEXT816(0x1000003d10) +
                   auVar134;
        auVar144 = auVar134 >> 0x34;
        auVar140._8_8_ = auVar144._8_8_;
        auVar140._0_8_ = auVar189._0_8_ & 0xffffffffffffe;
        auVar141._8_8_ = 0;
        auVar141._0_8_ = auVar144._0_8_;
        auVar43._8_8_ = 0;
        auVar43._0_8_ = auVar131._8_8_;
        auVar141 = auVar43 * ZEXT816(0x1000003d10000) + auVar140 + auVar141;
        uVar177 = auVar141._0_8_;
        uVar163 = auVar133._0_8_ & 0xfffffffffffff;
        auVar44._8_8_ = 0;
        auVar44._0_8_ = uVar163;
        auVar105._8_8_ = 0;
        auVar105._0_8_ = uVar171;
        uVar185 = (auVar141._8_8_ << 0xc | uVar177 >> 0x34) + (auVar139._0_8_ & 0xffffffffffff);
        uVar173 = uVar173 & 0xfffffffffffff;
        auVar45._8_8_ = 0;
        auVar45._0_8_ = uVar173;
        auVar106._8_8_ = 0;
        auVar106._0_8_ = uVar180;
        uVar181 = auVar134._0_8_ & 0xfffffffffffff;
        auVar46._8_8_ = 0;
        auVar46._0_8_ = uVar181;
        auVar107._8_8_ = 0;
        auVar107._0_8_ = uVar175;
        uVar177 = uVar177 & 0xfffffffffffff;
        auVar47._8_8_ = 0;
        auVar47._0_8_ = uVar177;
        auVar108._8_8_ = 0;
        auVar108._0_8_ = uVar165;
        auVar48._8_8_ = 0;
        auVar48._0_8_ = uVar185;
        auVar109._8_8_ = 0;
        auVar109._0_8_ = uVar1;
        auVar49._8_8_ = 0;
        auVar49._0_8_ = SUB168(auVar48 * auVar109,0);
        auVar133 = auVar45 * auVar106 + auVar44 * auVar105 + auVar46 * auVar107 + auVar47 * auVar108
                   + auVar49 * ZEXT816(0x1000003d10);
        auVar50._8_8_ = 0;
        auVar50._0_8_ = uVar163;
        auVar110._8_8_ = 0;
        auVar110._0_8_ = uVar1;
        auVar51._8_8_ = 0;
        auVar51._0_8_ = uVar173;
        auVar111._8_8_ = 0;
        auVar111._0_8_ = uVar171;
        auVar52._8_8_ = 0;
        auVar52._0_8_ = uVar181;
        auVar112._8_8_ = 0;
        auVar112._0_8_ = uVar180;
        auVar53._8_8_ = 0;
        auVar53._0_8_ = uVar177;
        auVar113._8_8_ = 0;
        auVar113._0_8_ = uVar175;
        auVar54._8_8_ = 0;
        auVar54._0_8_ = uVar185;
        auVar114._8_8_ = 0;
        auVar114._0_8_ = uVar165;
        auVar55._8_8_ = 0;
        auVar55._0_8_ = SUB168(auVar48 * auVar109,8);
        auVar189 = auVar55 * ZEXT816(0x1000003d10000) +
                   auVar54 * auVar114 +
                   auVar53 * auVar113 + auVar52 * auVar112 + auVar51 * auVar111 + auVar50 * auVar110
                   + (auVar133 >> 0x34);
        auVar56._8_8_ = 0;
        auVar56._0_8_ = uVar163;
        auVar115._8_8_ = 0;
        auVar115._0_8_ = uVar165;
        auVar57._8_8_ = 0;
        auVar57._0_8_ = uVar173;
        auVar116._8_8_ = 0;
        auVar116._0_8_ = uVar1;
        auVar58._8_8_ = 0;
        auVar58._0_8_ = uVar181;
        auVar117._8_8_ = 0;
        auVar117._0_8_ = uVar171;
        auVar59._8_8_ = 0;
        auVar59._0_8_ = uVar177;
        auVar118._8_8_ = 0;
        auVar118._0_8_ = uVar180;
        auVar60._8_8_ = 0;
        auVar60._0_8_ = uVar185;
        auVar119._8_8_ = 0;
        auVar119._0_8_ = uVar175;
        auVar131 = auVar60 * auVar119 + auVar59 * auVar118 + auVar58 * auVar117 + auVar57 * auVar116
                   + (auVar189 >> 0x34);
        auVar61._8_8_ = 0;
        auVar61._0_8_ = (auVar131._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar189._6_2_ & 0xf);
        auVar139 = auVar61 * ZEXT816(0x1000003d1) + auVar56 * auVar115;
        uVar176 = auVar139._0_8_;
        uVar178 = auVar139._8_8_;
        auVar135._8_8_ = uVar178 >> 0x34;
        auVar135._0_8_ = uVar178 * 0x1000 | uVar176 >> 0x34;
        auVar62._8_8_ = 0;
        auVar62._0_8_ = uVar163;
        auVar120._8_8_ = 0;
        auVar120._0_8_ = uVar175;
        auVar63._8_8_ = 0;
        auVar63._0_8_ = uVar173;
        auVar121._8_8_ = 0;
        auVar121._0_8_ = uVar165;
        auVar64._8_8_ = 0;
        auVar64._0_8_ = uVar181;
        auVar122._8_8_ = 0;
        auVar122._0_8_ = uVar1;
        auVar65._8_8_ = 0;
        auVar65._0_8_ = uVar177;
        auVar123._8_8_ = 0;
        auVar123._0_8_ = uVar171;
        auVar66._8_8_ = 0;
        auVar66._0_8_ = uVar185;
        auVar124._8_8_ = 0;
        auVar124._0_8_ = uVar180;
        auVar131 = (auVar131 >> 0x34) + auVar66 * auVar124 + auVar65 * auVar123 + auVar64 * auVar122
        ;
        uVar182 = auVar131._0_8_;
        uVar178 = auVar131._8_8_;
        auVar67._8_8_ = 0;
        auVar67._0_8_ = uVar182 & 0xfffffffffffff;
        auVar135 = auVar67 * ZEXT816(0x1000003d10) + auVar63 * auVar121 + auVar62 * auVar120 +
                   auVar135;
        auVar136._8_8_ = uVar178 >> 0x34;
        auVar136._0_8_ = uVar178 * 0x1000 | uVar182 >> 0x34;
        auVar68._8_8_ = 0;
        auVar68._0_8_ = uVar163;
        auVar125._8_8_ = 0;
        auVar125._0_8_ = uVar180;
        auVar69._8_8_ = 0;
        auVar69._0_8_ = uVar173;
        auVar126._8_8_ = 0;
        auVar126._0_8_ = uVar175;
        auVar70._8_8_ = 0;
        auVar70._0_8_ = uVar181;
        auVar127._8_8_ = 0;
        auVar127._0_8_ = uVar165;
        auVar71._8_8_ = 0;
        auVar71._0_8_ = uVar177;
        auVar128._8_8_ = 0;
        auVar128._0_8_ = uVar1;
        auVar72._8_8_ = 0;
        auVar72._0_8_ = uVar185;
        auVar129._8_8_ = 0;
        auVar129._0_8_ = uVar171;
        auVar136 = auVar72 * auVar129 + auVar71 * auVar128 + auVar136;
        auVar73._8_8_ = 0;
        auVar73._0_8_ = auVar136._0_8_;
        auVar131 = auVar73 * ZEXT816(0x1000003d10) +
                   auVar70 * auVar127 + auVar69 * auVar126 + auVar68 * auVar125 + (auVar135 >> 0x34)
        ;
        auVar139 = auVar131 >> 0x34;
        auVar143._8_8_ = 0;
        auVar143._0_8_ = auVar139._0_8_;
        auVar74._8_8_ = 0;
        auVar74._0_8_ = auVar136._8_8_;
        auVar142._8_8_ = auVar139._8_8_;
        auVar142._0_8_ = auVar133._0_8_ & 0xfffffffffffff;
        auVar143 = auVar74 * ZEXT816(0x1000003d10000) + auVar142 + auVar143;
        uVar165 = auVar143._0_8_;
        sStackY_1268.n[0] =
             ((uVar176 & 0xfffffffffffff) - (uVar161 & 0xfffffffffffff)) + 0x3ffffbfffff0c3;
        sStackY_1268.n[1] =
             ((auVar135._0_8_ & 0xfffffffffffff) - (uVar162 & 0xfffffffffffff)) + 0x3ffffffffffffc;
        sStackY_1268.n[2] =
             ((auVar131._0_8_ & 0xfffffffffffff) - (auVar132._0_8_ & 0xfffffffffffff)) +
             0x3ffffffffffffc;
        sStackY_1268.n[3] =
             ((uVar165 & 0xfffffffffffff) - (uVar172 & 0xfffffffffffff)) + 0x3ffffffffffffc;
        sStackY_1268.n[4] =
             ((auVar189._0_8_ & 0xffffffffffff) -
             ((auVar138._8_8_ << 0xc | uVar172 >> 0x34) + (auVar130._0_8_ & 0xffffffffffff))) +
             0x3fffffffffffc + (auVar143._8_8_ << 0xc | uVar165 >> 0x34);
        psStackY_1240 = psVar167;
        psStackY_1238 = pubkey;
        psStackY_1230 = (secp256k1_schnorrsig_extraparams *)pcVar157;
        psStackY_1228 = keypair;
        psStackY_1220 = pubkey_00;
        psStackY_1218 = (secp256k1_context *)unaff_RBP;
        secp256k1_fe_impl_normalizes_to_zero(&sStackY_1268);
        return;
      }
      return;
    }
    (CTX->illegal_callback).fn = p_Stack_11f0;
    (psVar164->illegal_callback).data = pvStack_11e8;
    if (iStack_11f4 != 1) goto LAB_0014769f;
    psStackY_1218 = (secp256k1_context *)0x145c11;
    secp256k1_sha256_initialize_tagged
              ((secp256k1_sha256 *)auStack_f70,(uchar *)"BIP0340/challenge",0x11);
    auStack_1030._0_8_ = 0x239253819cecba11;
    auStack_1030._8_8_ = (secp256k1_nonce_function_hardened)0xd1627e0f11679112;
    pvStack_1020 = (void *)0x3cc76597c87550;
    auStack_1018[0] = 'd';
    auStack_1018[1] = '\x11';
    auStack_1018[2] = 0xf6;
    auStack_1018[3] = 0x90;
    auStack_1018[4] = 'j';
    auStack_1018[5] = 0xb6;
    auStack_1018[6] = 0xe9;
    auStack_1018[7] = '3';
    auStack_ff0._32_8_ = (void *)0x40;
    psStackY_1218 = (secp256k1_context *)0x145c41;
    test_sha256_eq((secp256k1_sha256 *)auStack_f70,(secp256k1_sha256 *)auStack_1030);
    pvStack_1020 = (void *)0x0;
    auStack_1018[0] = '\0';
    auStack_1018[1] = '\0';
    auStack_1018[2] = '\0';
    auStack_1018[3] = '\0';
    auStack_1018[4] = '\0';
    auStack_1018[5] = '\0';
    auStack_1018[6] = '\0';
    auStack_1018[7] = '\x03';
    auStack_1030._0_8_ = 0;
    auStack_1030._8_8_ = (secp256k1_nonce_function_hardened)0x0;
    auStack_11a0._16_8_ = (void *)0xb0996f8345c831b5;
    auStack_11a0._24_8_ = 0xf936e0bc13f10186;
    auStack_11a0._0_8_ = 0x10c35892018a30f9;
    auStack_11a0._8_8_ = (secp256k1_nonce_function_hardened)0x29529df8854f3449;
    auStack_1080 = ZEXT816(0);
    auStack_1090 = ZEXT816(0);
    sStack_1140.ndata = (void *)0x0;
    uStack_1128 = 0;
    sStack_1140.magic[0] = '\0';
    sStack_1140.magic[1] = '\0';
    sStack_1140.magic[2] = '\0';
    sStack_1140.magic[3] = '\0';
    sStack_1140._4_4_ = 0;
    sStack_1140.noncefp = (secp256k1_nonce_function_hardened)0x0;
    auStack_f58[0x18] = 0xeb;
    auStack_f58[0x19] = 0xee;
    auStack_f58[0x1a] = 0xe8;
    auStack_f58[0x1b] = 0xfd;
    auStack_f58[0x1c] = 0xb2;
    auStack_f58[0x1d] = '\x17';
    auStack_f58[0x1e] = '/';
    auStack_f58[0x1f] = 'G';
    auStack_f58[0x20] = '}';
    auStack_f58[0x21] = 0xf4;
    auStack_f58[0x22] = 0x90;
    auStack_f58[0x23] = '\r';
    auStack_f58[0x24] = '1';
    auStack_f58[0x25] = '\x05';
    auStack_f58[0x26] = '6';
    auStack_f58[0x27] = 0xc0;
    auStack_f58[8] = '%';
    auStack_f58[9] = 0xf6;
    auStack_f58[10] = 'j';
    auStack_f58[0xb] = 'J';
    auStack_f58[0xc] = 0x85;
    auStack_f58[0xd] = 0xea;
    auStack_f58[0xe] = 0x8b;
    auStack_f58[0xf] = 'q';
    auStack_f58[0x10] = 0xe4;
    auStack_f58[0x11] = 0x82;
    auStack_f58[0x12] = 0xa7;
    auStack_f58[0x13] = 'O';
    auStack_f58[0x14] = '8';
    auStack_f58[0x15] = '-';
    auStack_f58[0x16] = ',';
    auStack_f58[0x17] = 0xe5;
    pvStack_f60 = (void *)0x8b007835f1cdf4b;
    auStack_f58[0] = 'L';
    auStack_f58[1] = 'U';
    auStack_f58[2] = 0xf1;
    auStack_f58[3] = 0xce;
    auStack_f58[4] = '-';
    auStack_f58[5] = 0xca;
    auStack_f58[6] = 0x82;
    auStack_f58[7] = '\x15';
    auStack_f70[0] = 0xe9;
    auStack_f70[1] = '\a';
    auStack_f70[2] = 0x83;
    auStack_f70[3] = '\x1f';
    auStack_f70._4_4_ = 0x108d8480;
    auStack_f70._8_8_ = (secp256k1_nonce_function_hardened)0x361024401b37a569;
    psStackY_1218 = (secp256k1_context *)0x145cf2;
    test_schnorrsig_bip_vectors_check_signing
              (auStack_1030,auStack_11a0,auStack_1090,sStack_1140.magic,0x20,auStack_f70);
    psStackY_1218 = (secp256k1_context *)0x145d0b;
    test_schnorrsig_bip_vectors_check_verify(auStack_11a0,sStack_1140.magic,0x20,auStack_f70,1);
    pvStack_1020 = (void *)0x56dab4380f16e762;
    auStack_1018[0] = 0xa7;
    auStack_1018[1] = 0x84;
    auStack_1018[2] = 0xd9;
    auStack_1018[3] = '\x04';
    auStack_1018[4] = 'Q';
    auStack_1018[5] = 0x90;
    auStack_1018[6] = 0xcf;
    auStack_1018[7] = 0xef;
    auStack_1030._0_8_ = 0x6a2aed8a6251e1b7;
    auStack_1030._8_8_ = (secp256k1_nonce_function_hardened)0xc7f3f49c805871bf;
    auStack_11a0._16_8_ = (void *)0xd8cedea21daefe58;
    auStack_11a0._24_8_ = 0x59a62b507b0f2443;
    auStack_11a0._0_8_ = 0x5f1c672a7fd7f1df;
    auStack_11a0._8_8_ = (secp256k1_nonce_function_hardened)0xbe4123db26371836;
    auStack_1080._0_8_ = (void *)0x0;
    auStack_1080._8_8_ = 0x100000000000000;
    auStack_1090 = ZEXT816(0);
    sStack_1140.ndata = (void *)0xd0319f29223809a4;
    uStack_1128 = 0x896c4eec98fa2e08;
    sStack_1140.magic[0] = '$';
    sStack_1140.magic[1] = '?';
    sStack_1140.magic[2] = 'j';
    sStack_1140.magic[3] = 0x88;
    sStack_1140._4_4_ = 0xd308a385;
    sStack_1140.noncefp = (secp256k1_nonce_function_hardened)0x447370032e8a1913;
    auStack_f58[0x18] = 0x89;
    auStack_f58[0x19] = '~';
    auStack_f58[0x1a] = 0xfc;
    auStack_f58[0x1b] = 0xb6;
    auStack_f58[0x1c] = '9';
    auStack_f58[0x1d] = 0xea;
    auStack_f58[0x1e] = 0x87;
    auStack_f58[0x1f] = '\x1c';
    auStack_f58[0x20] = 0xfa;
    auStack_f58[0x21] = 0x95;
    auStack_f58[0x22] = 0xf6;
    auStack_f58[0x23] = 0xde;
    auStack_f58[0x24] = '3';
    auStack_f58[0x25] = 0x9e;
    auStack_f58[0x26] = 'K';
    auStack_f58[0x27] = '\n';
    auStack_f58[8] = 0x89;
    auStack_f58[9] = '\x06';
    auStack_f58[10] = 0xd1;
    auStack_f58[0xb] = '\x1a';
    auStack_f58[0xc] = 0xc9;
    auStack_f58[0xd] = 'v';
    auStack_f58[0xe] = 0xab;
    auStack_f58[0xf] = 0xcc;
    auStack_f58[0x10] = 0xb2;
    auStack_f58[0x11] = '\v';
    auStack_f58[0x12] = '\t';
    auStack_f58[0x13] = '\x12';
    auStack_f58[0x14] = 0x92;
    auStack_f58[0x15] = 0xbf;
    auStack_f58[0x16] = 0xf4;
    auStack_f58[0x17] = 0xea;
    pvStack_f60 = (void *)0x17f9436d3e41de1b;
    auStack_f58[0] = 0xdc;
    auStack_f58[1] = 0x8d;
    auStack_f58[2] = 0xcf;
    auStack_f58[3] = 0x8c;
    auStack_f58[4] = 'x';
    auStack_f58[5] = 0xde;
    auStack_f58[6] = '3';
    auStack_f58[7] = 'A';
    auStack_f70[0] = 'h';
    auStack_f70[1] = 0x96;
    auStack_f70[2] = 0xbd;
    auStack_f70[3] = '`';
    auStack_f70._4_4_ = 0x6d29aeee;
    auStack_f70._8_8_ = (secp256k1_nonce_function_hardened)0x7fe1df79f228ab4;
    psStackY_1218 = (secp256k1_context *)0x145dd8;
    test_schnorrsig_bip_vectors_check_signing
              (auStack_1030,auStack_11a0,auStack_1090,sStack_1140.magic,0x20,auStack_f70);
    psStackY_1218 = (secp256k1_context *)0x145df1;
    test_schnorrsig_bip_vectors_check_verify(auStack_11a0,sStack_1140.magic,0x20,auStack_f70,1);
    pvStack_1020 = (void *)0x74cc678a084e0229;
    auStack_1018[0] = '\x02';
    auStack_1018[1] = '\v';
    auStack_1018[2] = 0xbe;
    auStack_1018[3] = 0xa6;
    auStack_1018[4] = ';';
    auStack_1018[5] = '\x14';
    auStack_1018[6] = 0xe5;
    auStack_1018[7] = 0xc9;
    auStack_1030._0_8_ = 0x34c26821a2da0fc9;
    auStack_1030._8_8_ = (secp256k1_nonce_function_hardened)0xd11cdc808b62c6c4;
    auStack_11a0._16_8_ = (void *)0xc986b00953713901;
    auStack_11a0._24_8_ = 0xb84e7769d98fe160;
    auStack_11a0._0_8_ = 0x137e77c5fe8a30dd;
    auStack_11a0._8_8_ = (secp256k1_nonce_function_hardened)0xccb7c19c2ba71f12;
    auStack_1080._8_8_ = 0x6d9e698d7620b4b;
    auStack_1080._0_8_ = 0x2c69d1c6cd760e08;
    auStack_1090._8_8_ = 0xccbcbbb5a235b02e;
    auStack_1090._0_8_ = 0xaed7b42438a57ac8;
    sStack_1140.ndata = (void *)0x33776cb5aa0598da;
    uStack_1128 = 0x5cb708a5d0b92430;
    sStack_1140.magic[0] = '~';
    sStack_1140.magic[1] = '-';
    sStack_1140.magic[2] = 'X';
    sStack_1140.magic[3] = 0xd8;
    sStack_1140._4_4_ = 0x1adfbcb3;
    sStack_1140.noncefp = (secp256k1_nonce_function_hardened)0xdf9549082c7deba;
    auStack_f58[0x18] = 'z';
    auStack_f58[0x19] = 0xde;
    auStack_f58[0x1a] = 0xa9;
    auStack_f58[0x1b] = 0x8d;
    auStack_f58[0x1c] = 0x82;
    auStack_f58[0x1d] = 0xf8;
    auStack_f58[0x1e] = 'H';
    auStack_f58[0x1f] = '\x1e';
    auStack_f58[0x20] = '\x0e';
    auStack_f58[0x21] = '\x1e';
    auStack_f58[0x22] = '\x03';
    auStack_f58[0x23] = 'g';
    auStack_f58[0x24] = 'J';
    auStack_f58[0x25] = 'o';
    auStack_f58[0x26] = '?';
    auStack_f58[0x27] = 0xb7;
    auStack_f58[8] = 0xab;
    auStack_f58[9] = 't';
    auStack_f58[10] = 'X';
    auStack_f58[0xb] = 'y';
    auStack_f58[0xc] = 0xa5;
    auStack_f58[0xd] = 0xad;
    auStack_f58[0xe] = 0x95;
    auStack_f58[0xf] = 'J';
    auStack_f58[0x10] = 'r';
    auStack_f58[0x11] = 0xc4;
    auStack_f58[0x12] = 'Z';
    auStack_f58[0x13] = 0x91;
    auStack_f58[0x14] = 0xc3;
    auStack_f58[0x15] = 0xa5;
    auStack_f58[0x16] = '\x1d';
    auStack_f58[0x17] = '<';
    pvStack_f60 = (void *)0x8b8d72602acf9bc4;
    auStack_f58[0] = 'L';
    auStack_f58[1] = ' ';
    auStack_f58[2] = '\x0f';
    auStack_f58[3] = 'P';
    auStack_f58[4] = 0xdd;
    auStack_f58[5] = '1';
    auStack_f58[6] = '<';
    auStack_f58[7] = '\x1b';
    auStack_f70[0] = 'X';
    auStack_f70[1] = '1';
    auStack_f70[2] = 0xaa;
    auStack_f70[3] = 0xee;
    auStack_f70._4_4_ = 0xb74bb4d7;
    auStack_f70._8_8_ = (secp256k1_nonce_function_hardened)0x94429dba94ab5e4e;
    psVar179 = (secp256k1_schnorrsig_extraparams *)auStack_1030;
    psStackY_1218 = (secp256k1_context *)0x145eba;
    test_schnorrsig_bip_vectors_check_signing
              ((uchar *)psVar179,auStack_11a0,auStack_1090,sStack_1140.magic,0x20,auStack_f70);
    psStackY_1218 = (secp256k1_context *)0x145ed3;
    test_schnorrsig_bip_vectors_check_verify(auStack_11a0,sStack_1140.magic,0x20,auStack_f70,1);
    pvStack_1020 = (void *)0x54a23fcf62307712;
    auStack_1018[0] = 0x9e;
    auStack_1018[1] = 'D';
    auStack_1018[2] = 0xf5;
    auStack_1018[3] = 0x8e;
    auStack_1018[4] = 0xd2;
    auStack_1018[5] = '@';
    auStack_1018[6] = '\x17';
    auStack_1018[7] = '\x10';
    auStack_1030._0_8_ = 0x81739377262b430b;
    auStack_1030._8_8_ = (secp256k1_nonce_function_hardened)0xd0ec662ab05bf0ae;
    auStack_11a0._16_8_ = (void *)0x8a461df2fb950d3a;
    auStack_11a0._24_8_ = 0x17f5d860c1f8331b;
    auStack_11a0._0_8_ = 0x25f50551f9dfd125;
    auStack_11a0._8_8_ = (secp256k1_nonce_function_hardened)0xad96a928f622403c;
    auStack_1080._8_4_ = 0xffffffff;
    auStack_1080._0_8_ = 0xffffffffffffffff;
    auStack_1080._12_4_ = 0xffffffff;
    auStack_1090._8_4_ = 0xffffffff;
    auStack_1090._0_8_ = 0xffffffffffffffff;
    auStack_1090._12_4_ = 0xffffffff;
    sStack_1140.ndata = (void *)0xffffffffffffffff;
    uStack_1128 = 0xffffffffffffffff;
    sStack_1140.magic[0] = 0xff;
    sStack_1140.magic[1] = 0xff;
    sStack_1140.magic[2] = 0xff;
    sStack_1140.magic[3] = 0xff;
    sStack_1140._4_4_ = 0xffffffff;
    sStack_1140.noncefp = (secp256k1_nonce_function_hardened)0xffffffffffffffff;
    auStack_f58[0x18] = 0xf2;
    auStack_f58[0x19] = '_';
    auStack_f58[0x1a] = 0xd7;
    auStack_f58[0x1b] = 0x88;
    auStack_f58[0x1c] = 0x81;
    auStack_f58[0x1d] = 0xeb;
    auStack_f58[0x1e] = 0xb3;
    auStack_f58[0x1f] = '\'';
    auStack_f58[0x20] = 'q';
    auStack_f58[0x21] = 0xfc;
    auStack_f58[0x22] = 'Y';
    auStack_f58[0x23] = '\"';
    auStack_f58[0x24] = 0xef;
    auStack_f58[0x25] = 0xc6;
    auStack_f58[0x26] = 'n';
    auStack_f58[0x27] = 0xa3;
    auStack_f58[8] = 0x97;
    auStack_f58[9] = 'X';
    auStack_f58[10] = '+';
    auStack_f58[0xb] = 0x9c;
    auStack_f58[0xc] = 0xb1;
    auStack_f58[0xd] = '=';
    auStack_f58[0xe] = 0xb3;
    auStack_f58[0xf] = 0x93;
    auStack_f58[0x10] = '7';
    auStack_f58[0x11] = '\x05';
    auStack_f58[0x12] = 0xb3;
    auStack_f58[0x13] = '+';
    auStack_f58[0x14] = 0xa9;
    auStack_f58[0x15] = 0x82;
    auStack_f58[0x16] = 0xaf;
    auStack_f58[0x17] = 'Z';
    pvStack_f60 = (void *)0xb651dd87a1c1ec65;
    auStack_f58[0] = 'O';
    auStack_f58[1] = 0xda;
    auStack_f58[2] = '\x1e';
    auStack_f58[3] = 0xdc;
    auStack_f58[4] = 0x96;
    auStack_f58[5] = '7';
    auStack_f58[6] = 0xd5;
    auStack_f58[7] = 0xec;
    auStack_f70[0] = '~';
    auStack_f70[1] = 0xb0;
    auStack_f70[2] = 'P';
    auStack_f70[3] = 0x97;
    auStack_f70._4_4_ = 0xf146e257;
    auStack_f70._8_8_ = (secp256k1_nonce_function_hardened)0xb91c615156884994;
    pubkey_00 = (secp256k1_schnorrsig_extraparams *)auStack_1030;
    keypair = (secp256k1_schnorrsig_extraparams *)auStack_11a0;
    pubkey = &sStack_1140;
    psStackY_1218 = (secp256k1_context *)0x145f87;
    test_schnorrsig_bip_vectors_check_signing
              ((uchar *)pubkey_00,(uchar *)keypair,auStack_1090,pubkey->magic,0x20,auStack_f70);
    psStackY_1218 = (secp256k1_context *)0x145fa0;
    test_schnorrsig_bip_vectors_check_verify((uchar *)keypair,pubkey->magic,0x20,auStack_f70,1);
    pvStack_1020 = (void *)0xaae28b6d7430fa7d;
    auStack_1018[0] = 'e';
    auStack_1018[1] = 0x97;
    auStack_1018[2] = '_';
    auStack_1018[3] = ')';
    auStack_1018[4] = 0xd2;
    auStack_1018[5] = '-';
    auStack_1018[6] = 199;
    auStack_1018[7] = 0xb9;
    auStack_1030._0_8_ = 0x12e499bb09359cd6;
    auStack_1030._8_8_ = (secp256k1_nonce_function_hardened)0x83724e54e80f8be6;
    auStack_11a0._16_8_ = (secp256k1_schnorrsig_extraparams *)0x9b591ac87578f199;
    auStack_11a0._24_8_ = (secp256k1_schnorrsig_extraparams *)0x36769b989986c56;
    auStack_11a0._0_8_ = (secp256k1_schnorrsig_extraparams *)0xb283cc8ff6c3f34d;
    auStack_11a0._8_8_ = (secp256k1_schnorrsig_extraparams *)0x24a73104c9429d7e;
    auStack_f58[0x18] = '`';
    auStack_f58[0x19] = 0xcb;
    auStack_f58[0x1a] = 'q';
    auStack_f58[0x1b] = 0xc0;
    auStack_f58[0x1c] = 'N';
    auStack_f58[0x1d] = 0x80;
    auStack_f58[0x1e] = 0xf5;
    auStack_f58[0x1f] = 0x93;
    auStack_f58[0x20] = '\x06';
    auStack_f58[0x21] = '\v';
    auStack_f58[0x22] = '\a';
    auStack_f58[0x23] = 0xd2;
    auStack_f58[0x24] = 0x83;
    auStack_f58[0x25] = '\b';
    auStack_f58[0x26] = 0xd7;
    auStack_f58[0x27] = 0xf4;
    auStack_f58[8] = 'v';
    auStack_f58[9] = 0xaf;
    auStack_f58[10] = 0xb1;
    auStack_f58[0xb] = 'T';
    auStack_f58[0xc] = 0x8a;
    auStack_f58[0xd] = 0xf6;
    auStack_f58[0xe] = '\x03';
    auStack_f58[0xf] = 0xb3;
    auStack_f58[0x10] = 0xeb;
    auStack_f58[0x11] = 'E';
    auStack_f58[0x12] = 0xc9;
    auStack_f58[0x13] = 0xf8;
    auStack_f58[0x14] = ' ';
    auStack_f58[0x15] = '}';
    auStack_f58[0x16] = 0xee;
    auStack_f58[0x17] = '\x10';
    pvStack_f60 = (void *)0x28aaf51494eda089;
    auStack_f58[0] = 0xad;
    auStack_f58[1] = '\r';
    auStack_f58[2] = 0x96;
    auStack_f58[3] = 0xd6;
    auStack_f58[4] = 'y';
    auStack_f58[5] = '_';
    auStack_f58[6] = 0x9c;
    auStack_f58[7] = 'c';
    auStack_f70[0] = '\0';
    auStack_f70[1] = '\0';
    auStack_f70[2] = '\0';
    auStack_f70[3] = '\0';
    auStack_f70._4_4_ = 0;
    auStack_f70._8_8_ = (secp256k1_nonce_function_hardened)0x3f56ce783b000000;
    psVar168 = (secp256k1_schnorrsig_extraparams *)auStack_1030;
    psStackY_1218 = (secp256k1_context *)0x146021;
    test_schnorrsig_bip_vectors_check_verify((uchar *)psVar168,auStack_11a0,0x20,auStack_f70,1);
    pvStack_1020 = (void *)0x8776b979ae9898eb;
    auStack_1018[0] = 'f';
    auStack_1018[1] = 0xe4;
    auStack_1018[2] = 0xfa;
    auStack_1018[3] = 0xa0;
    auStack_1018[4] = 'J';
    auStack_1018[5] = '-';
    auStack_1018[6] = 'J';
    auStack_1018[7] = '4';
    auStack_1030._0_8_ = 0x507767db4ceafdee;
    auStack_1030._8_8_ = (secp256k1_nonce_function_hardened)0x21cfea07e8fe20a4;
    psStackY_1218 = (secp256k1_context *)0x146052;
    psVar159 = CTX;
    iVar154 = secp256k1_xonly_pubkey_parse(CTX,(secp256k1_xonly_pubkey *)auStack_f70,auStack_1030);
    if (iVar154 != 0) goto LAB_001476a4;
    pvStack_1020 = (void *)0xd8cedea21daefe58;
    auStack_1018[0] = 'C';
    auStack_1018[1] = '$';
    auStack_1018[2] = '\x0f';
    auStack_1018[3] = '{';
    auStack_1018[4] = 'P';
    auStack_1018[5] = '+';
    auStack_1018[6] = 0xa6;
    auStack_1018[7] = 'Y';
    auStack_1030._0_8_ = 0x5f1c672a7fd7f1df;
    auStack_1030._8_8_ = (secp256k1_nonce_function_hardened)0xbe4123db26371836;
    auStack_11a0._16_8_ = (void *)0xd0319f29223809a4;
    auStack_11a0._24_8_ = 0x896c4eec98fa2e08;
    auStack_11a0._0_8_ = 0xd308a385886a3f24;
    auStack_11a0._8_8_ = (secp256k1_nonce_function_hardened)0x447370032e8a1913;
    auStack_f58[0x18] = 'z';
    auStack_f58[0x19] = 's';
    auStack_f58[0x1a] = 0xc6;
    auStack_f58[0x1b] = 'C';
    auStack_f58[0x1c] = 0xe1;
    auStack_f58[0x1d] = 'f';
    auStack_f58[0x1e] = 0xbe;
    auStack_f58[0x1f] = '^';
    auStack_f58[0x20] = 0xbe;
    auStack_f58[0x21] = 0xaf;
    auStack_f58[0x22] = 0xa3;
    auStack_f58[0x23] = 'K';
    auStack_f58[0x24] = '\x1a';
    auStack_f58[0x25] = 0xc5;
    auStack_f58[0x26] = 'S';
    auStack_f58[0x27] = 0xe2;
    auStack_f58[8] = '<';
    auStack_f58[9] = 0xc2;
    auStack_f58[10] = 'y';
    auStack_f58[0xb] = 'D';
    auStack_f58[0xc] = 'd';
    auStack_f58[0xd] = '\n';
    auStack_f58[0xe] = 0xc6;
    auStack_f58[0xf] = '\a';
    auStack_f58[0x10] = 0xcd;
    auStack_f58[0x11] = '\x10';
    auStack_f58[0x12] = 'z';
    auStack_f58[0x13] = 0xe1;
    auStack_f58[0x14] = '\t';
    auStack_f58[0x15] = '#';
    auStack_f58[0x16] = 0xd9;
    auStack_f58[0x17] = 0xef;
    pvStack_f60 = (void *)0x8ba168852f47f682;
    auStack_f58[0] = '/';
    auStack_f58[1] = '\x05';
    auStack_f58[2] = 'z';
    auStack_f58[3] = '\x14';
    auStack_f58[4] = '`';
    auStack_f58[5] = ')';
    auStack_f58[6] = 'u';
    auStack_f58[7] = 'V';
    auStack_f70[0] = 0xff;
    auStack_f70[1] = 0xf9;
    auStack_f70[2] = '{';
    auStack_f70[3] = 0xd5;
    auStack_f70._4_4_ = 0xa4ee5e75;
    auStack_f70._8_8_ = (secp256k1_nonce_function_hardened)0xd3355235143a4520;
    psStackY_1218 = (secp256k1_context *)0x1460de;
    test_schnorrsig_bip_vectors_check_verify(auStack_1030,auStack_11a0,0x20,auStack_f70,0);
    pvStack_1020 = (void *)0xd8cedea21daefe58;
    auStack_1018[0] = 'C';
    auStack_1018[1] = '$';
    auStack_1018[2] = '\x0f';
    auStack_1018[3] = '{';
    auStack_1018[4] = 'P';
    auStack_1018[5] = '+';
    auStack_1018[6] = 0xa6;
    auStack_1018[7] = 'Y';
    auStack_1030._0_8_ = 0x5f1c672a7fd7f1df;
    auStack_1030._8_8_ = (secp256k1_nonce_function_hardened)0xbe4123db26371836;
    auStack_11a0._16_8_ = (void *)0xd0319f29223809a4;
    auStack_11a0._24_8_ = 0x896c4eec98fa2e08;
    auStack_11a0._0_8_ = 0xd308a385886a3f24;
    auStack_11a0._8_8_ = (secp256k1_nonce_function_hardened)0x447370032e8a1913;
    auStack_f58[0x18] = 'b';
    auStack_f58[0x19] = '*';
    auStack_f58[0x1a] = 0x95;
    auStack_f58[0x1b] = 'L';
    auStack_f58[0x1c] = 0xfe;
    auStack_f58[0x1d] = 'T';
    auStack_f58[0x1e] = 'W';
    auStack_f58[0x1f] = '5';
    auStack_f58[0x20] = 0xaa;
    auStack_f58[0x21] = 0xea;
    auStack_f58[0x22] = 'Q';
    auStack_f58[0x23] = '4';
    auStack_f58[0x24] = 0xfc;
    auStack_f58[0x25] = 0xcd;
    auStack_f58[0x26] = 0xb2;
    auStack_f58[0x27] = 0xbd;
    auStack_f58[8] = '(';
    auStack_f58[9] = 0x89;
    auStack_f58[10] = '\v';
    auStack_f58[0xb] = '>';
    auStack_f58[0xc] = 0xdb;
    auStack_f58[0xd] = 'n';
    auStack_f58[0xe] = 'q';
    auStack_f58[0xf] = 0x89;
    auStack_f58[0x10] = 0xb6;
    auStack_f58[0x11] = '0';
    auStack_f58[0x12] = 'D';
    auStack_f58[0x13] = 0x8b;
    auStack_f58[0x14] = 'Q';
    auStack_f58[0x15] = '\\';
    auStack_f58[0x16] = 0xe4;
    auStack_f58[0x17] = 0xf8;
    pvStack_f60 = (void *)0xf46f3fdf13b032b4;
    auStack_f58[0] = 0xf9;
    auStack_f58[1] = 0x9f;
    auStack_f58[2] = 0xcb;
    auStack_f58[3] = '3';
    auStack_f58[4] = 0xe0;
    auStack_f58[5] = 0xe1;
    auStack_f58[6] = 'Q';
    auStack_f58[7] = '_';
    auStack_f70[0] = '\x1f';
    auStack_f70[1] = 0xa6;
    auStack_f70[2] = '.';
    auStack_f70[3] = '3';
    auStack_f70._4_4_ = 0x1cc2db1e;
    auStack_f70._8_8_ = (secp256k1_nonce_function_hardened)0xa70011abd2924739;
    psStackY_1218 = (secp256k1_context *)0x146162;
    test_schnorrsig_bip_vectors_check_verify(auStack_1030,auStack_11a0,0x20,auStack_f70,0);
    pvStack_1020 = (void *)0xd8cedea21daefe58;
    auStack_1018[0] = 'C';
    auStack_1018[1] = '$';
    auStack_1018[2] = '\x0f';
    auStack_1018[3] = '{';
    auStack_1018[4] = 'P';
    auStack_1018[5] = '+';
    auStack_1018[6] = 0xa6;
    auStack_1018[7] = 'Y';
    auStack_1030._0_8_ = 0x5f1c672a7fd7f1df;
    auStack_1030._8_8_ = (secp256k1_nonce_function_hardened)0xbe4123db26371836;
    auStack_11a0._16_8_ = (void *)0xd0319f29223809a4;
    auStack_11a0._24_8_ = 0x896c4eec98fa2e08;
    auStack_11a0._0_8_ = 0xd308a385886a3f24;
    auStack_11a0._8_8_ = (secp256k1_nonce_function_hardened)0x447370032e8a1913;
    auStack_f58[0x18] = 0xe8;
    auStack_f58[0x19] = 0xd7;
    auStack_f58[0x1a] = 0xc9;
    auStack_f58[0x1b] = '>';
    auStack_f58[0x1c] = '\0';
    auStack_f58[0x1d] = 0xc5;
    auStack_f58[0x1e] = 0xed;
    auStack_f58[0x1f] = '\f';
    auStack_f58[0x20] = '\x18';
    auStack_f58[0x21] = '4';
    auStack_f58[0x22] = 0xff;
    auStack_f58[0x23] = '\r';
    auStack_f58[0x24] = '\f';
    auStack_f58[0x25] = '.';
    auStack_f58[0x26] = 'm';
    auStack_f58[0x27] = 0xa6;
    auStack_f58[8] = 0x96;
    auStack_f58[9] = '\x17';
    auStack_f58[10] = 'd';
    auStack_f58[0xb] = 0xb3;
    auStack_f58[0xc] = 0xaa;
    auStack_f58[0xd] = 0x9b;
    auStack_f58[0xe] = '/';
    auStack_f58[0xf] = 0xfc;
    auStack_f58[0x10] = 0xb6;
    auStack_f58[0x11] = 0xef;
    auStack_f58[0x12] = 0x94;
    auStack_f58[0x13] = '{';
    auStack_f58[0x14] = 'h';
    auStack_f58[0x15] = 0x87;
    auStack_f58[0x16] = 0xa2;
    auStack_f58[0x17] = '&';
    pvStack_f60 = (void *)0x96d9b2896097c174;
    auStack_f58[0] = '=';
    auStack_f58[1] = 0xa2;
    auStack_f58[2] = 0xe5;
    auStack_f58[3] = 'T';
    auStack_f58[4] = '>';
    auStack_f58[5] = '\x17';
    auStack_f58[6] = 'w';
    auStack_f58[7] = 'i';
    auStack_f70[0] = 'l';
    auStack_f70[1] = 0xff;
    auStack_f70[2] = '\\';
    auStack_f70[3] = ';';
    auStack_f70._4_4_ = 0xea696ca8;
    auStack_f70._8_8_ = (secp256k1_nonce_function_hardened)0x4fcb9b1af376734b;
    psStackY_1218 = (secp256k1_context *)0x1461e8;
    test_schnorrsig_bip_vectors_check_verify(auStack_1030,auStack_11a0,0x20,auStack_f70,0);
    pvStack_1020 = (void *)0xd8cedea21daefe58;
    auStack_1018[0] = 'C';
    auStack_1018[1] = '$';
    auStack_1018[2] = '\x0f';
    auStack_1018[3] = '{';
    auStack_1018[4] = 'P';
    auStack_1018[5] = '+';
    auStack_1018[6] = 0xa6;
    auStack_1018[7] = 'Y';
    auStack_1030._0_8_ = 0x5f1c672a7fd7f1df;
    auStack_1030._8_8_ = (secp256k1_nonce_function_hardened)0xbe4123db26371836;
    auStack_11a0._16_8_ = (void *)0xd0319f29223809a4;
    auStack_11a0._24_8_ = 0x896c4eec98fa2e08;
    auStack_11a0._0_8_ = 0xd308a385886a3f24;
    auStack_11a0._8_8_ = (secp256k1_nonce_function_hardened)0x447370032e8a1913;
    auStack_f58[0x18] = 'O';
    auStack_f58[0x19] = 0xb7;
    auStack_f58[0x1a] = '4';
    auStack_f58[0x1b] = 'v';
    auStack_f58[0x1c] = 0xf0;
    auStack_f58[0x1d] = 0xd5;
    auStack_f58[0x1e] = 0x94;
    auStack_f58[0x1f] = 0xdc;
    auStack_f58[0x20] = 0xb6;
    auStack_f58[0x21] = '\\';
    auStack_f58[0x22] = 'd';
    auStack_f58[0x23] = '%';
    auStack_f58[0x24] = 0xbd;
    auStack_f58[0x25] = '\x18';
    auStack_f58[0x26] = '`';
    auStack_f58[0x27] = 'Q';
    auStack_f58[8] = '\x12';
    auStack_f58[9] = '=';
    auStack_f58[10] = 0xda;
    auStack_f58[0xb] = 0x83;
    auStack_f58[0xc] = '(';
    auStack_f58[0xd] = 0xaf;
    auStack_f58[0xe] = 0x9c;
    auStack_f58[0xf] = '#';
    auStack_f58[0x10] = 0xa9;
    auStack_f58[0x11] = 'L';
    auStack_f58[0x12] = '\x1f';
    auStack_f58[0x13] = 0xee;
    auStack_f58[0x14] = 0xcf;
    auStack_f58[0x15] = 0xd1;
    auStack_f58[0x16] = '#';
    auStack_f58[0x17] = 0xba;
    pvStack_f60 = (void *)0x0;
    auStack_f58[0] = '\0';
    auStack_f58[1] = '\0';
    auStack_f58[2] = '\0';
    auStack_f58[3] = '\0';
    auStack_f58[4] = '\0';
    auStack_f58[5] = '\0';
    auStack_f58[6] = '\0';
    auStack_f58[7] = '\0';
    auStack_f70[0] = '\0';
    auStack_f70[1] = '\0';
    auStack_f70[2] = '\0';
    auStack_f70[3] = '\0';
    auStack_f70._4_4_ = 0;
    auStack_f70._8_8_ = (secp256k1_nonce_function_hardened)0x0;
    psStackY_1218 = (secp256k1_context *)0x14626e;
    test_schnorrsig_bip_vectors_check_verify(auStack_1030,auStack_11a0,0x20,auStack_f70,0);
    pvStack_1020 = (void *)0xd8cedea21daefe58;
    auStack_1018[0] = 'C';
    auStack_1018[1] = '$';
    auStack_1018[2] = '\x0f';
    auStack_1018[3] = '{';
    auStack_1018[4] = 'P';
    auStack_1018[5] = '+';
    auStack_1018[6] = 0xa6;
    auStack_1018[7] = 'Y';
    auStack_1030._0_8_ = 0x5f1c672a7fd7f1df;
    auStack_1030._8_8_ = (secp256k1_nonce_function_hardened)0xbe4123db26371836;
    auStack_11a0._16_8_ = (void *)0xd0319f29223809a4;
    auStack_11a0._24_8_ = 0x896c4eec98fa2e08;
    auStack_11a0._0_8_ = 0xd308a385886a3f24;
    auStack_11a0._8_8_ = (secp256k1_nonce_function_hardened)0x447370032e8a1913;
    auStack_f58[0x18] = 0xdb;
    auStack_f58[0x19] = 0xa8;
    auStack_f58[0x1a] = '\x7f';
    auStack_f58[0x1b] = '\x11';
    auStack_f58[0x1c] = 0xac;
    auStack_f58[0x1d] = 'g';
    auStack_f58[0x1e] = 'T';
    auStack_f58[0x1f] = 0xf9;
    auStack_f58[0x20] = '7';
    auStack_f58[0x21] = 0x80;
    auStack_f58[0x22] = 0xd5;
    auStack_f58[0x23] = 0xa1;
    auStack_f58[0x24] = 0x83;
    auStack_f58[0x25] = '|';
    auStack_f58[0x26] = 0xf1;
    auStack_f58[0x27] = 0x97;
    auStack_f58[8] = 'v';
    auStack_f58[9] = '\x15';
    auStack_f58[10] = 0xfb;
    auStack_f58[0xb] = 0xaf;
    auStack_f58[0xc] = 'Z';
    auStack_f58[0xd] = 0xe2;
    auStack_f58[0xe] = 0x88;
    auStack_f58[0xf] = 'd';
    auStack_f58[0x10] = '\x01';
    auStack_f58[0x11] = '<';
    auStack_f58[0x12] = '\t';
    auStack_f58[0x13] = 0x97;
    auStack_f58[0x14] = 'B';
    auStack_f58[0x15] = 0xde;
    auStack_f58[0x16] = 0xad;
    auStack_f58[0x17] = 0xb4;
    pvStack_f60 = (void *)0x0;
    auStack_f58[0] = '\0';
    auStack_f58[1] = '\0';
    auStack_f58[2] = '\0';
    auStack_f58[3] = '\0';
    auStack_f58[4] = '\0';
    auStack_f58[5] = '\0';
    auStack_f58[6] = '\0';
    auStack_f58[7] = '\x01';
    auStack_f70[0] = '\0';
    auStack_f70[1] = '\0';
    auStack_f70[2] = '\0';
    auStack_f70[3] = '\0';
    auStack_f70._4_4_ = 0;
    auStack_f70._8_8_ = (secp256k1_nonce_function_hardened)0x0;
    psStackY_1218 = (secp256k1_context *)0x1462f4;
    test_schnorrsig_bip_vectors_check_verify(auStack_1030,auStack_11a0,0x20,auStack_f70,0);
    pvStack_1020 = (void *)0xd8cedea21daefe58;
    auStack_1018[0] = 'C';
    auStack_1018[1] = '$';
    auStack_1018[2] = '\x0f';
    auStack_1018[3] = '{';
    auStack_1018[4] = 'P';
    auStack_1018[5] = '+';
    auStack_1018[6] = 0xa6;
    auStack_1018[7] = 'Y';
    auStack_1030._0_8_ = 0x5f1c672a7fd7f1df;
    auStack_1030._8_8_ = (secp256k1_nonce_function_hardened)0xbe4123db26371836;
    auStack_11a0._16_8_ = (void *)0xd0319f29223809a4;
    auStack_11a0._24_8_ = 0x896c4eec98fa2e08;
    auStack_11a0._0_8_ = 0xd308a385886a3f24;
    auStack_11a0._8_8_ = (secp256k1_nonce_function_hardened)0x447370032e8a1913;
    auStack_f58[0x18] = 0xd1;
    auStack_f58[0x19] = 0xd7;
    auStack_f58[0x1a] = '\x13';
    auStack_f58[0x1b] = 0xa8;
    auStack_f58[0x1c] = 0xae;
    auStack_f58[0x1d] = 0x82;
    auStack_f58[0x1e] = 0xb3;
    auStack_f58[0x1f] = '/';
    auStack_f58[0x20] = 0xa7;
    auStack_f58[0x21] = 0x9d;
    auStack_f58[0x22] = '_';
    auStack_f58[0x23] = '\x7f';
    auStack_f58[0x24] = 0xc4;
    auStack_f58[0x25] = '\a';
    auStack_f58[0x26] = 0xd3;
    auStack_f58[0x27] = 0x9b;
    auStack_f58[8] = 'i';
    auStack_f58[9] = 0xe8;
    auStack_f58[10] = 0x9b;
    auStack_f58[0xb] = 'L';
    auStack_f58[0xc] = 'U';
    auStack_f58[0xd] = 'd';
    auStack_f58[0xe] = 0xd0;
    auStack_f58[0xf] = '\x03';
    auStack_f58[0x10] = 'I';
    auStack_f58[0x11] = '\x10';
    auStack_f58[0x12] = 'k';
    auStack_f58[0x13] = 0x84;
    auStack_f58[0x14] = 0x97;
    auStack_f58[0x15] = 'x';
    auStack_f58[0x16] = ']';
    auStack_f58[0x17] = 0xd7;
    pvStack_f60 = (void *)0xc79b260f2ba84d56;
    auStack_f58[0] = '\n';
    auStack_f58[1] = 't';
    auStack_f58[2] = 0xf8;
    auStack_f58[3] = '\"';
    auStack_f58[4] = '\x04';
    auStack_f58[5] = ')';
    auStack_f58[6] = 0xba;
    auStack_f58[7] = '\x1d';
    auStack_f70[0] = 'J';
    auStack_f70[1] = ')';
    auStack_f70[2] = 0x8d;
    auStack_f70[3] = 0xac;
    auStack_f70._4_4_ = 0x5a3957ae;
    auStack_f70._8_8_ = (secp256k1_nonce_function_hardened)0xcb1dfddb5d79d015;
    psStackY_1218 = (secp256k1_context *)0x14637a;
    test_schnorrsig_bip_vectors_check_verify(auStack_1030,auStack_11a0,0x20,auStack_f70,0);
    pvStack_1020 = (void *)0xd8cedea21daefe58;
    auStack_1018[0] = 'C';
    auStack_1018[1] = '$';
    auStack_1018[2] = '\x0f';
    auStack_1018[3] = '{';
    auStack_1018[4] = 'P';
    auStack_1018[5] = '+';
    auStack_1018[6] = 0xa6;
    auStack_1018[7] = 'Y';
    auStack_1030._0_8_ = 0x5f1c672a7fd7f1df;
    auStack_1030._8_8_ = (secp256k1_nonce_function_hardened)0xbe4123db26371836;
    auStack_11a0._16_8_ = (void *)0xd0319f29223809a4;
    auStack_11a0._24_8_ = 0x896c4eec98fa2e08;
    auStack_11a0._0_8_ = 0xd308a385886a3f24;
    auStack_11a0._8_8_ = (secp256k1_nonce_function_hardened)0x447370032e8a1913;
    auStack_f58[0x18] = 0xd1;
    auStack_f58[0x19] = 0xd7;
    auStack_f58[0x1a] = '\x13';
    auStack_f58[0x1b] = 0xa8;
    auStack_f58[0x1c] = 0xae;
    auStack_f58[0x1d] = 0x82;
    auStack_f58[0x1e] = 0xb3;
    auStack_f58[0x1f] = '/';
    auStack_f58[0x20] = 0xa7;
    auStack_f58[0x21] = 0x9d;
    auStack_f58[0x22] = '_';
    auStack_f58[0x23] = '\x7f';
    auStack_f58[0x24] = 0xc4;
    auStack_f58[0x25] = '\a';
    auStack_f58[0x26] = 0xd3;
    auStack_f58[0x27] = 0x9b;
    auStack_f58[8] = 'i';
    auStack_f58[9] = 0xe8;
    auStack_f58[10] = 0x9b;
    auStack_f58[0xb] = 'L';
    auStack_f58[0xc] = 'U';
    auStack_f58[0xd] = 'd';
    auStack_f58[0xe] = 0xd0;
    auStack_f58[0xf] = '\x03';
    auStack_f58[0x10] = 'I';
    auStack_f58[0x11] = '\x10';
    auStack_f58[0x12] = 'k';
    auStack_f58[0x13] = 0x84;
    auStack_f58[0x14] = 0x97;
    auStack_f58[0x15] = 'x';
    auStack_f58[0x16] = ']';
    auStack_f58[0x17] = 0xd7;
    pvStack_f60 = (void *)0xffffffffffffffff;
    auStack_f58[0] = 0xff;
    auStack_f58[1] = 0xff;
    auStack_f58[2] = 0xff;
    auStack_f58[3] = 0xfe;
    auStack_f58[4] = 0xff;
    auStack_f58[5] = 0xff;
    auStack_f58[6] = 0xfc;
    auStack_f58[7] = '/';
    auStack_f70[0] = 0xff;
    auStack_f70[1] = 0xff;
    auStack_f70[2] = 0xff;
    auStack_f70[3] = 0xff;
    auStack_f70._4_4_ = 0xffffffff;
    auStack_f70._8_8_ = (secp256k1_nonce_function_hardened)0xffffffffffffffff;
    keypair = (secp256k1_schnorrsig_extraparams *)auStack_11a0;
    pubkey_00 = (secp256k1_schnorrsig_extraparams *)auStack_f70;
    psStackY_1218 = (secp256k1_context *)0x146400;
    test_schnorrsig_bip_vectors_check_verify
              (auStack_1030,(uchar *)keypair,0x20,(uchar *)pubkey_00,0);
    pvStack_1020 = (void *)0xd8cedea21daefe58;
    auStack_1018[0] = 'C';
    auStack_1018[1] = '$';
    auStack_1018[2] = '\x0f';
    auStack_1018[3] = '{';
    auStack_1018[4] = 'P';
    auStack_1018[5] = '+';
    auStack_1018[6] = 0xa6;
    auStack_1018[7] = 'Y';
    auStack_1030._0_8_ = 0x5f1c672a7fd7f1df;
    auStack_1030._8_8_ = (secp256k1_nonce_function_hardened)0xbe4123db26371836;
    auStack_11a0._16_8_ = (secp256k1_schnorrsig_extraparams *)0xd0319f29223809a4;
    auStack_11a0._24_8_ = (secp256k1_schnorrsig_extraparams *)0x896c4eec98fa2e08;
    auStack_11a0._0_8_ = (secp256k1_schnorrsig_extraparams *)0xd308a385886a3f24;
    auStack_11a0._8_8_ = (secp256k1_schnorrsig_extraparams *)0x447370032e8a1913;
    auStack_f58[0x18] = 0xba;
    auStack_f58[0x19] = 0xae;
    auStack_f58[0x1a] = 0xdc;
    auStack_f58[0x1b] = 0xe6;
    auStack_f58[0x1c] = 0xaf;
    auStack_f58[0x1d] = 'H';
    auStack_f58[0x1e] = 0xa0;
    auStack_f58[0x1f] = ';';
    auStack_f58[0x20] = 0xbf;
    auStack_f58[0x21] = 0xd2;
    auStack_f58[0x22] = '^';
    auStack_f58[0x23] = 0x8c;
    auStack_f58[0x24] = 0xd0;
    auStack_f58[0x25] = '6';
    auStack_f58[0x26] = 'A';
    auStack_f58[0x27] = 'A';
    auStack_f58[8] = 0xff;
    auStack_f58[9] = 0xff;
    auStack_f58[10] = 0xff;
    auStack_f58[0xb] = 0xff;
    auStack_f58[0xc] = 0xff;
    auStack_f58[0xd] = 0xff;
    auStack_f58[0xe] = 0xff;
    auStack_f58[0xf] = 0xff;
    auStack_f58[0x10] = 0xff;
    auStack_f58[0x11] = 0xff;
    auStack_f58[0x12] = 0xff;
    auStack_f58[0x13] = 0xff;
    auStack_f58[0x14] = 0xff;
    auStack_f58[0x15] = 0xff;
    auStack_f58[0x16] = 0xff;
    auStack_f58[0x17] = 0xfe;
    pvStack_f60 = (void *)0x96d9b2896097c174;
    auStack_f58[0] = '=';
    auStack_f58[1] = 0xa2;
    auStack_f58[2] = 0xe5;
    auStack_f58[3] = 'T';
    auStack_f58[4] = '>';
    auStack_f58[5] = '\x17';
    auStack_f58[6] = 'w';
    auStack_f58[7] = 'i';
    auStack_f70[0] = 'l';
    auStack_f70[1] = 0xff;
    auStack_f70[2] = '\\';
    auStack_f70[3] = ';';
    auStack_f70._4_4_ = 0xea696ca8;
    auStack_f70._8_8_ = (secp256k1_nonce_function_hardened)0x4fcb9b1af376734b;
    psVar168 = (secp256k1_schnorrsig_extraparams *)auStack_1030;
    psStackY_1218 = (secp256k1_context *)0x146480;
    test_schnorrsig_bip_vectors_check_verify((uchar *)psVar168,auStack_11a0,0x20,auStack_f70,0);
    pvStack_1020 = (void *)0xffffffffffffffff;
    auStack_1018[0] = 0xff;
    auStack_1018[1] = 0xff;
    auStack_1018[2] = 0xff;
    auStack_1018[3] = 0xfe;
    auStack_1018[4] = 0xff;
    auStack_1018[5] = 0xff;
    auStack_1018[6] = 0xfc;
    auStack_1018[7] = '0';
    auStack_1030._0_8_ = 0xffffffffffffffff;
    auStack_1030._8_8_ = (secp256k1_nonce_function_hardened)0xffffffffffffffff;
    psStackY_1218 = (secp256k1_context *)0x1464b1;
    psVar159 = CTX;
    iVar154 = secp256k1_xonly_pubkey_parse(CTX,(secp256k1_xonly_pubkey *)auStack_f70,auStack_1030);
    if (iVar154 != 0) goto LAB_001476a9;
    pvStack_1020 = (void *)0x4003400340034003;
    builtin_memcpy(auStack_1018,"\x03@\x03@\x03@\x03@",8);
    auStack_1030._0_8_ = 0x4003400340034003;
    auStack_1030._8_8_ = (secp256k1_nonce_function_hardened)0x4003400340034003;
    auStack_11a0._16_8_ = (void *)0x238be6f6b6faf94b;
    auStack_11a0._24_8_ = 0x17d16f4d32976408;
    auStack_11a0._0_8_ = 0xc43a39b453aa8c77;
    auStack_11a0._8_8_ = (secp256k1_nonce_function_hardened)0x22877a49094d7767;
    auStack_1080 = ZEXT816(0);
    auStack_1090 = ZEXT816(0);
    auStack_f58[0x18] = 0x9f;
    auStack_f58[0x19] = '-';
    auStack_f58[0x1a] = 'V';
    auStack_f58[0x1b] = '\x0f';
    auStack_f58[0x1c] = 0xac;
    auStack_f58[0x1d] = 'e';
    auStack_f58[0x1e] = '(';
    auStack_f58[0x1f] = '\'';
    auStack_f58[0x20] = 0xd1;
    auStack_f58[0x21] = 0xaf;
    auStack_f58[0x22] = '\x05';
    auStack_f58[0x23] = 't';
    auStack_f58[0x24] = 0xe4;
    auStack_f58[0x25] = '\'';
    auStack_f58[0x26] = 0xab;
    auStack_f58[0x27] = 'c';
    auStack_f58[8] = '`';
    auStack_f58[9] = 'i';
    auStack_f58[10] = 0xce;
    auStack_f58[0xb] = '&';
    auStack_f58[0xc] = 0xbf;
    auStack_f58[0xd] = '\x03';
    auStack_f58[0xe] = 'F';
    auStack_f58[0xf] = 'b';
    auStack_f58[0x10] = '(';
    auStack_f58[0x11] = 0xf1;
    auStack_f58[0x12] = 0x9a;
    auStack_f58[0x13] = ':';
    auStack_f58[0x14] = 'b';
    auStack_f58[0x15] = 0xdb;
    auStack_f58[0x16] = 0x8a;
    auStack_f58[0x17] = 'd';
    pvStack_f60 = (void *)0xccfc326743adb66b;
    auStack_f58[0] = '%';
    auStack_f58[1] = ')';
    auStack_f58[2] = '\x1a';
    auStack_f58[3] = 'U';
    auStack_f58[4] = 0x89;
    auStack_f58[5] = 'T';
    auStack_f58[6] = 'd';
    auStack_f58[7] = 0xcf;
    auStack_f70[0] = 'q';
    auStack_f70[1] = 'S';
    auStack_f70[2] = ']';
    auStack_f70[3] = 0xb1;
    auStack_f70._4_4_ = 0xfbd9ec65;
    auStack_f70._8_8_ = (secp256k1_nonce_function_hardened)0x1861eafa5f6e04bc;
    uStack_1098 = 0;
    psStackY_1218 = (secp256k1_context *)0x146561;
    test_schnorrsig_bip_vectors_check_signing
              (auStack_1030,auStack_11a0,auStack_1090,(uchar *)0x0,0,auStack_f70);
    psStackY_1218 = (secp256k1_context *)0x146576;
    test_schnorrsig_bip_vectors_check_verify(auStack_11a0,(uchar *)0x0,0,auStack_f70,1);
    pvStack_1020 = (void *)0x4003400340034003;
    builtin_memcpy(auStack_1018,"\x03@\x03@\x03@\x03@",8);
    auStack_1030._0_8_ = 0x4003400340034003;
    auStack_1030._8_8_ = (secp256k1_nonce_function_hardened)0x4003400340034003;
    auStack_11a0._16_8_ = (void *)0x238be6f6b6faf94b;
    auStack_11a0._24_8_ = 0x17d16f4d32976408;
    auStack_11a0._0_8_ = 0xc43a39b453aa8c77;
    auStack_11a0._8_8_ = (secp256k1_nonce_function_hardened)0x22877a49094d7767;
    auStack_1080 = ZEXT816(0);
    auStack_1090 = ZEXT816(0);
    unaff_RBP = (code *)CONCAT71((int7)((ulong)unaff_RBP >> 8),0x11);
    sStack_1140.magic[0] = '\x11';
    auStack_f58[0x18] = 0xfe;
    auStack_f58[0x19] = '|';
    auStack_f58[0x1a] = 0xac;
    auStack_f58[0x1b] = 0xfc;
    auStack_f58[0x1c] = 'Z';
    auStack_f58[0x1d] = 'W';
    auStack_f58[0x1e] = '}';
    auStack_f58[0x1f] = '3';
    auStack_f58[0x20] = 0xec;
    auStack_f58[0x21] = '\x14';
    auStack_f58[0x22] = 'V';
    auStack_f58[0x23] = 'L';
    auStack_f58[0x24] = 0xec;
    auStack_f58[0x25] = '+';
    auStack_f58[0x26] = 0xac;
    auStack_f58[0x27] = 0xbf;
    auStack_f58[8] = 0xea;
    auStack_f58[9] = '1';
    auStack_f58[10] = 's';
    auStack_f58[0xb] = 0xbf;
    auStack_f58[0xc] = 0xea;
    auStack_f58[0xd] = 'f';
    auStack_f58[0xe] = 0x83;
    auStack_f58[0xf] = 0xbd;
    auStack_f58[0x10] = '\x10';
    auStack_f58[0x11] = '\x1f';
    auStack_f58[0x12] = 0xa5;
    auStack_f58[0x13] = 0xaa;
    auStack_f58[0x14] = ']';
    auStack_f58[0x15] = 0xbc;
    auStack_f58[0x16] = '\x19';
    auStack_f58[0x17] = 0x96;
    pvStack_f60 = (void *)0x354c3be64a93b9b1;
    auStack_f58[0] = '\x11';
    auStack_f58[1] = 0xf3;
    auStack_f58[2] = 0xae;
    auStack_f58[3] = '\x11';
    auStack_f58[4] = '4';
    auStack_f58[5] = 0xc6;
    auStack_f58[6] = 0xa3;
    auStack_f58[7] = '\x03';
    auStack_f70[0] = '\b';
    auStack_f70[1] = 0xa2;
    auStack_f70[2] = '\n';
    auStack_f70[3] = '\n';
    auStack_f70._4_4_ = 0x2441f6fe;
    auStack_f70._8_8_ = (secp256k1_nonce_function_hardened)0x3a583c69e0329264;
    psStackY_1218 = (secp256k1_context *)0x146624;
    test_schnorrsig_bip_vectors_check_signing
              (auStack_1030,auStack_11a0,auStack_1090,sStack_1140.magic,1,auStack_f70);
    psStackY_1218 = (secp256k1_context *)0x14663d;
    test_schnorrsig_bip_vectors_check_verify(auStack_11a0,sStack_1140.magic,1,auStack_f70,1);
    pvStack_1020 = (void *)0x4003400340034003;
    builtin_memcpy(auStack_1018,"\x03@\x03@\x03@\x03@",8);
    auStack_1030._0_8_ = 0x4003400340034003;
    auStack_1030._8_8_ = (secp256k1_nonce_function_hardened)0x4003400340034003;
    auStack_11a0._16_8_ = (void *)0x238be6f6b6faf94b;
    auStack_11a0._24_8_ = 0x17d16f4d32976408;
    auStack_11a0._0_8_ = 0xc43a39b453aa8c77;
    auStack_11a0._8_8_ = (secp256k1_nonce_function_hardened)0x22877a49094d7767;
    auStack_1080 = ZEXT816(0);
    auStack_1090 = ZEXT816(0);
    sStack_1140.ndata = (void *)CONCAT71(sStack_1140.ndata._1_7_,0x11);
    builtin_memcpy(sStack_1140.magic,"\x01\x02\x03\x04",4);
    sStack_1140._4_4_ = 0x8070605;
    sStack_1140.noncefp = (secp256k1_nonce_function_hardened)0x100f0e0d0c0b0a09;
    auStack_f58[0x18] = 0xe1;
    auStack_f58[0x19] = 0xe5;
    auStack_f58[0x1a] = 0xa3;
    auStack_f58[0x1b] = '\x7f';
    auStack_f58[0x1c] = 0xd8;
    auStack_f58[0x1d] = '\x0e';
    auStack_f58[0x1e] = 'Z';
    auStack_f58[0x1f] = 'Q';
    auStack_f58[0x20] = 0x89;
    auStack_f58[0x21] = '|';
    auStack_f58[0x22] = 'U';
    auStack_f58[0x23] = 'f';
    auStack_f58[0x24] = 0xa9;
    auStack_f58[0x25] = '~';
    auStack_f58[0x26] = 0xa5;
    auStack_f58[0x27] = 0xa5;
    auStack_f58[8] = 0xc4;
    auStack_f58[9] = 0xa4;
    auStack_f58[10] = 0x82;
    auStack_f58[0xb] = 0xb7;
    auStack_f58[0xc] = '{';
    auStack_f58[0xd] = 0xf9;
    auStack_f58[0xe] = '`';
    auStack_f58[0xf] = 0xf8;
    auStack_f58[0x10] = 'h';
    auStack_f58[0x11] = '\x15';
    auStack_f58[0x12] = '@';
    auStack_f58[0x13] = 0xe2;
    auStack_f58[0x14] = '[';
    auStack_f58[0x15] = 'g';
    auStack_f58[0x16] = 'q';
    auStack_f58[0x17] = 0xec;
    pvStack_f60 = (void *)0x523c1ea7d199865d;
    auStack_f58[0] = 0xda;
    auStack_f58[1] = 0x9a;
    auStack_f58[2] = 0xfd;
    auStack_f58[3] = 0xb6;
    auStack_f58[4] = 0xb5;
    auStack_f58[5] = '\n';
    auStack_f58[6] = 0xc3;
    auStack_f58[7] = 'p';
    auStack_f70[0] = 'Q';
    auStack_f70[1] = '0';
    auStack_f70[2] = 0xf3;
    auStack_f70[3] = 0x9a;
    auStack_f70._4_4_ = 0x3bb45940;
    auStack_f70._8_8_ = (secp256k1_nonce_function_hardened)0x2be5ec199ac0cac7;
    keypair = (secp256k1_schnorrsig_extraparams *)auStack_1030;
    pubkey_00 = (secp256k1_schnorrsig_extraparams *)auStack_11a0;
    psStackY_1218 = (secp256k1_context *)0x1466f6;
    test_schnorrsig_bip_vectors_check_signing
              ((uchar *)keypair,(uchar *)pubkey_00,auStack_1090,sStack_1140.magic,0x11,auStack_f70);
    psStackY_1218 = (secp256k1_context *)0x14670f;
    test_schnorrsig_bip_vectors_check_verify
              ((uchar *)pubkey_00,sStack_1140.magic,0x11,auStack_f70,1);
    auStack_11a0._16_8_ = (secp256k1_schnorrsig_extraparams *)0x4003400340034003;
    auStack_11a0._24_8_ = (secp256k1_schnorrsig_extraparams *)0x4003400340034003;
    auStack_11a0._0_8_ = (secp256k1_schnorrsig_extraparams *)0x4003400340034003;
    auStack_11a0._8_8_ = (secp256k1_schnorrsig_extraparams *)0x4003400340034003;
    auStack_1080._8_8_ = 0x17d16f4d32976408;
    auStack_1080._0_8_ = 0x238be6f6b6faf94b;
    auStack_1090._8_8_ = 0x22877a49094d7767;
    auStack_1090._0_8_ = 0xc43a39b453aa8c77;
    sStack_1140.ndata = (void *)0x0;
    uStack_1128 = 0;
    sStack_1140.magic[0] = '\0';
    sStack_1140.magic[1] = '\0';
    sStack_1140.magic[2] = '\0';
    sStack_1140.magic[3] = '\0';
    sStack_1140._4_4_ = 0;
    sStack_1140.noncefp = (secp256k1_nonce_function_hardened)0x0;
    sStack_1010.ndata = (void *)0xa0b4d0e9a0cb7f89;
    uStack_ff8 = 0x6723f249d2cf9468;
    sStack_1010.magic[0] = 'X';
    sStack_1010.magic[1] = '^';
    sStack_1010.magic[2] = 0xd3;
    sStack_1010.magic[3] = 0xe3;
    sStack_1010._4_4_ = 0xe7070817;
    sStack_1010.noncefp = (secp256k1_nonce_function_hardened)0x237b4cc50f723bc0;
    pvStack_1020 = (void *)0x6fbea8bf5d1e3203;
    auStack_1018[0] = '\t';
    auStack_1018[1] = '\x16';
    auStack_1018[2] = '5';
    auStack_1018[3] = '\x16';
    auStack_1018[4] = '>';
    auStack_1018[5] = 0xca;
    auStack_1018[6] = 'y';
    auStack_1018[7] = 0xa8;
    auStack_1030._0_8_ = 0x345a55d8b0123b40;
    auStack_1030._8_8_ = (secp256k1_nonce_function_hardened)0x635646c77eea7541;
    auStack_f58[0x38] = 0x99;
    auStack_f58[0x39] = 0x99;
    auStack_f58[0x3a] = 0x99;
    auStack_f58[0x3b] = 0x99;
    auStack_f58[0x3c] = 0x99;
    auStack_f58[0x3d] = 0x99;
    auStack_f58[0x3e] = 0x99;
    auStack_f58[0x3f] = 0x99;
    auStack_f58[0x40] = 0x99;
    auStack_f58[0x41] = 0x99;
    auStack_f58[0x42] = 0x99;
    auStack_f58[0x43] = 0x99;
    auStack_f58[0x44] = 0x99;
    auStack_f58[0x45] = 0x99;
    auStack_f58[0x46] = 0x99;
    auStack_f58[0x47] = 0x99;
    auStack_f58[0x28] = 0x99;
    auStack_f58[0x29] = 0x99;
    auStack_f58[0x2a] = 0x99;
    auStack_f58[0x2b] = 0x99;
    auStack_f58[0x2c] = 0x99;
    auStack_f58[0x2d] = 0x99;
    auStack_f58[0x2e] = 0x99;
    auStack_f58[0x2f] = 0x99;
    auStack_f58[0x30] = 0x99;
    auStack_f58[0x31] = 0x99;
    auStack_f58[0x32] = 0x99;
    auStack_f58[0x33] = 0x99;
    auStack_f58[0x34] = 0x99;
    auStack_f58[0x35] = 0x99;
    auStack_f58[0x36] = 0x99;
    auStack_f58[0x37] = 0x99;
    auStack_f58[0x18] = 0x99;
    auStack_f58[0x19] = 0x99;
    auStack_f58[0x1a] = 0x99;
    auStack_f58[0x1b] = 0x99;
    auStack_f58[0x1c] = 0x99;
    auStack_f58[0x1d] = 0x99;
    auStack_f58[0x1e] = 0x99;
    auStack_f58[0x1f] = 0x99;
    auStack_f58[0x20] = 0x99;
    auStack_f58[0x21] = 0x99;
    auStack_f58[0x22] = 0x99;
    auStack_f58[0x23] = 0x99;
    auStack_f58[0x24] = 0x99;
    auStack_f58[0x25] = 0x99;
    auStack_f58[0x26] = 0x99;
    auStack_f58[0x27] = 0x99;
    auStack_f58[8] = 0x99;
    auStack_f58[9] = 0x99;
    auStack_f58[10] = 0x99;
    auStack_f58[0xb] = 0x99;
    auStack_f58[0xc] = 0x99;
    auStack_f58[0xd] = 0x99;
    auStack_f58[0xe] = 0x99;
    auStack_f58[0xf] = 0x99;
    auStack_f58[0x10] = 0x99;
    auStack_f58[0x11] = 0x99;
    auStack_f58[0x12] = 0x99;
    auStack_f58[0x13] = 0x99;
    auStack_f58[0x14] = 0x99;
    auStack_f58[0x15] = 0x99;
    auStack_f58[0x16] = 0x99;
    auStack_f58[0x17] = 0x99;
    pvStack_f60 = (void *)0x9999999999999999;
    auStack_f58[0] = 0x99;
    auStack_f58[1] = 0x99;
    auStack_f58[2] = 0x99;
    auStack_f58[3] = 0x99;
    auStack_f58[4] = 0x99;
    auStack_f58[5] = 0x99;
    auStack_f58[6] = 0x99;
    auStack_f58[7] = 0x99;
    auStack_f70[0] = 0x99;
    auStack_f70[1] = 0x99;
    auStack_f70[2] = 0x99;
    auStack_f70[3] = 0x99;
    auStack_f70._4_4_ = 0x99999999;
    auStack_f70._8_8_ = (secp256k1_nonce_function_hardened)0x9999999999999999;
    asStack_f10[0].magic[0] = 0x99;
    asStack_f10[0].magic[1] = 0x99;
    asStack_f10[0].magic[2] = 0x99;
    asStack_f10[0].magic[3] = 0x99;
    psStackY_1218 = (secp256k1_context *)0x1467e0;
    test_schnorrsig_bip_vectors_check_signing
              (auStack_11a0,auStack_1090,sStack_1140.magic,auStack_f70,100,auStack_1030);
    psStackY_1218 = (secp256k1_context *)0x1467f9;
    test_schnorrsig_bip_vectors_check_verify(auStack_1090,auStack_f70,100,auStack_1030,1);
    if (COUNT < 1) {
LAB_00147107:
      psVar179 = (secp256k1_schnorrsig_extraparams *)auStack_f70;
      pubkey = (secp256k1_schnorrsig_extraparams *)auStack_1030;
      psVar168 = &sStack_1140;
      psStackY_1218 = (secp256k1_context *)0x147117;
      testrand256(psVar168->magic);
      psStackY_1218 = (secp256k1_context *)0x14712e;
      psVar159 = CTX;
      iVar154 = secp256k1_keypair_create(CTX,(secp256k1_keypair *)auStack_f70,psVar168->magic);
      if (iVar154 == 0) goto LAB_001476ae;
      psStackY_1218 = (secp256k1_context *)0x147154;
      psVar159 = CTX;
      iVar154 = secp256k1_keypair_xonly_pub
                          (CTX,(secp256k1_xonly_pubkey *)auStack_1030,(int *)0x0,
                           (secp256k1_keypair *)auStack_f70);
      if (iVar154 == 0) goto LAB_001476b3;
      psStackY_1218 = (secp256k1_context *)0x147178;
      psVar159 = CTX;
      iVar154 = secp256k1_xonly_pubkey_serialize
                          (CTX,sStack_10e0.magic,(secp256k1_xonly_pubkey *)auStack_1030);
      if (iVar154 == 0) goto LAB_001476b8;
      psStackY_1218 = (secp256k1_context *)0x14719c;
      psVar159 = CTX;
      iVar154 = secp256k1_keypair_xonly_tweak_add
                          (CTX,(secp256k1_keypair *)auStack_f70,sStack_10e0.magic);
      if (iVar154 != 1) goto LAB_001476bd;
      psStackY_1218 = (secp256k1_context *)0x1471c3;
      psVar159 = CTX;
      iVar154 = secp256k1_keypair_xonly_pub
                          (CTX,(secp256k1_xonly_pubkey *)auStack_11a0,(int *)auStack_11c0,
                           (secp256k1_keypair *)auStack_f70);
      if (iVar154 == 0) goto LAB_001476c2;
      psStackY_1218 = (secp256k1_context *)0x1471e4;
      psVar159 = CTX;
      iVar154 = secp256k1_xonly_pubkey_serialize
                          (CTX,(uchar *)&pvStack_1100,(secp256k1_xonly_pubkey *)auStack_11a0);
      if (iVar154 == 0) goto LAB_001476c7;
      psVar168 = (secp256k1_schnorrsig_extraparams *)auStack_11e0;
      psStackY_1218 = (secp256k1_context *)0x1471f9;
      testrand256((uchar *)psVar168);
      psStackY_1218 = (secp256k1_context *)0x14722c;
      psVar159 = CTX;
      iVar154 = secp256k1_schnorrsig_sign_internal
                          (CTX,auStack_1090,(uchar *)psVar168,0x20,(secp256k1_keypair *)auStack_f70,
                           nonce_function_bip340,(void *)0x0);
      if (iVar154 == 0) goto LAB_001476cc;
      psStackY_1218 = (secp256k1_context *)0x14724d;
      psVar159 = CTX;
      iVar154 = secp256k1_xonly_pubkey_parse
                          (CTX,(secp256k1_xonly_pubkey *)auStack_11a0,(uchar *)&pvStack_1100);
      if (iVar154 == 0) goto LAB_001476d1;
      psStackY_1218 = (secp256k1_context *)0x147278;
      psVar159 = CTX;
      iVar154 = secp256k1_schnorrsig_verify
                          (CTX,auStack_1090,auStack_11e0,0x20,(secp256k1_xonly_pubkey *)auStack_11a0
                          );
      if (iVar154 == 0) goto LAB_001476d6;
      psStackY_1218 = (secp256k1_context *)0x14729c;
      psVar159 = CTX;
      iVar154 = secp256k1_xonly_pubkey_serialize
                          (CTX,sStack_10c0.magic,(secp256k1_xonly_pubkey *)auStack_1030);
      if (iVar154 == 0) goto LAB_001476db;
      psStackY_1218 = (secp256k1_context *)0x1472c0;
      psVar159 = CTX;
      iVar154 = secp256k1_xonly_pubkey_parse
                          (CTX,(secp256k1_xonly_pubkey *)auStack_1030,sStack_10c0.magic);
      if (iVar154 == 0) goto LAB_001476e0;
      psStackY_1218 = (secp256k1_context *)0x1472f0;
      psVar159 = CTX;
      iVar154 = secp256k1_xonly_pubkey_tweak_add_check
                          (CTX,(uchar *)&pvStack_1100,auStack_11c0._0_4_,
                           (secp256k1_xonly_pubkey *)auStack_1030,sStack_10e0.magic);
      if (iVar154 != 0) {
        return;
      }
      goto LAB_001476e5;
    }
    keypair = (secp256k1_schnorrsig_extraparams *)auStack_1090;
    while( true ) {
      psVar179 = (secp256k1_schnorrsig_extraparams *)auStack_f70;
      pubkey = (secp256k1_schnorrsig_extraparams *)auStack_1030;
      psVar168 = &sStack_10c0;
      unaff_RBP = nonce_function_bip340;
      pvStack_10f0 = (void *)0x6e68637320612072;
      p_Stack_10e8 = (_func_void_char_ptr_void_ptr *)0x2e2e67697372726f;
      pvStack_1100 = (void *)0x2073692073696874;
      p_Stack_10f8 = (secp256k1_nonce_function_hardened)0x6f662067736d2061;
      pvStack_1110 = (void *)0x0;
      p_Stack_1108 = (_func_void_char_ptr_void_ptr *)0x0;
      uStack_1120 = 0;
      p_Stack_1118 = (_func_void_char_ptr_void_ptr *)0x0;
      sStack_1140.ndata = (void *)0x0;
      uStack_1128 = 0;
      sStack_1140.magic[0] = '\0';
      sStack_1140.magic[1] = '\0';
      sStack_1140.magic[2] = '\0';
      sStack_1140.magic[3] = '\0';
      sStack_1140._4_4_ = 0;
      sStack_1140.noncefp = (secp256k1_nonce_function_hardened)0x0;
      auVar152._8_8_ = 0;
      auVar152._0_8_ = auStack_11d0._8_8_;
      auStack_11d0 = auVar152 << 0x40;
      auStack_11e0 = ZEXT816(0x8cb36fda);
      psStackY_1218 = (secp256k1_context *)0x146880;
      testrand256(psVar168->magic);
      psStackY_1218 = (secp256k1_context *)0x14688d;
      testrand256(sStack_10e0.magic);
      psStackY_1218 = (secp256k1_context *)0x14689f;
      iVar154 = secp256k1_keypair_create(CTX,(secp256k1_keypair *)psVar179,psVar168->magic);
      if (iVar154 == 0) break;
      psStackY_1218 = (secp256k1_context *)0x1468bb;
      iVar154 = secp256k1_keypair_xonly_pub
                          (CTX,(secp256k1_xonly_pubkey *)pubkey,(int *)0x0,
                           (secp256k1_keypair *)psVar179);
      pcVar157 = (code *)psVar179;
      if (iVar154 == 0) goto LAB_00147323;
      pubkey_00 = (secp256k1_schnorrsig_extraparams *)auStack_11a0;
      pcVar157 = (code *)&pvStack_1100;
      psStackY_1218 = (secp256k1_context *)0x1468f5;
      iVar154 = secp256k1_schnorrsig_sign_internal
                          (CTX,(uchar *)pubkey_00,(uchar *)pcVar157,0x20,
                           (secp256k1_keypair *)psVar179,nonce_function_bip340,(void *)0x0);
      if (iVar154 == 0) goto LAB_00147328;
      psStackY_1218 = (secp256k1_context *)0x146917;
      iVar154 = secp256k1_schnorrsig_verify
                          (CTX,(uchar *)pubkey_00,(uchar *)pcVar157,0x20,
                           (secp256k1_xonly_pubkey *)pubkey);
      if (iVar154 == 0) goto LAB_0014732d;
      psStackY_1218 = (secp256k1_context *)0x146949;
      psVar159 = CTX;
      iVar154 = secp256k1_schnorrsig_sign_internal
                          (CTX,(uchar *)keypair,(uchar *)pcVar157,0x20,
                           (secp256k1_keypair *)auStack_f70,nonce_function_bip340,(void *)0x0);
      if (iVar154 == 0) goto LAB_00147332;
      lVar158 = 0;
      psVar168 = (secp256k1_schnorrsig_extraparams *)auStack_11e0;
      do {
        psVar179 = (secp256k1_schnorrsig_extraparams *)pcVar157;
        if (auStack_11a0[lVar158] != auStack_1090[lVar158]) goto LAB_001476ea;
        lVar158 = lVar158 + 1;
      } while (lVar158 != 0x40);
      pubkey_00 = (secp256k1_schnorrsig_extraparams *)auStack_11a0;
      psStackY_1218 = (secp256k1_context *)0x146999;
      iVar154 = secp256k1_schnorrsig_sign_custom
                          (CTX,(uchar *)pubkey_00,(uchar *)pcVar157,0x20,
                           (secp256k1_keypair *)auStack_f70,psVar168);
      if (iVar154 == 0) goto LAB_00147337;
      psStackY_1218 = (secp256k1_context *)0x1469bb;
      iVar154 = secp256k1_schnorrsig_verify
                          (CTX,(uchar *)pubkey_00,(uchar *)pcVar157,0x20,
                           (secp256k1_xonly_pubkey *)pubkey);
      if (iVar154 == 0) goto LAB_0014733c;
      uStack_1168 = 0x101010101010101;
      auStack_11a0._48_8_ = 0x101010101010101;
      auStack_11a0._32_8_ = (secp256k1_schnorrsig_extraparams *)0x101010101010101;
      auStack_11a0._40_8_ = 0x101010101010101;
      auStack_11a0._16_8_ = (secp256k1_schnorrsig_extraparams *)0x101010101010101;
      auStack_11a0._24_8_ = (secp256k1_schnorrsig_extraparams *)0x101010101010101;
      auStack_11a0._0_8_ = (secp256k1_schnorrsig_extraparams *)0x101010101010101;
      auStack_11a0._8_8_ = (secp256k1_schnorrsig_extraparams *)0x101010101010101;
      auStack_11e0._8_8_ = nonce_function_failing;
      psStackY_1218 = (secp256k1_context *)0x146a1a;
      psVar159 = CTX;
      iVar154 = secp256k1_schnorrsig_sign_custom
                          (CTX,(uchar *)pubkey_00,(uchar *)pcVar157,0x20,
                           (secp256k1_keypair *)auStack_f70,psVar168);
      if (iVar154 != 0) goto LAB_00147341;
      lVar158 = 0;
      psVar179 = (secp256k1_schnorrsig_extraparams *)auStack_f70;
      do {
        if (auStack_11a0[lVar158] != sStack_1140.magic[lVar158]) goto LAB_001476ef;
        lVar158 = lVar158 + 1;
      } while (lVar158 != 0x40);
      uStack_1168 = 0x101010101010101;
      auStack_11a0._48_8_ = 0x101010101010101;
      auStack_11a0._32_8_ = (secp256k1_schnorrsig_extraparams *)0x101010101010101;
      auStack_11a0._40_8_ = 0x101010101010101;
      auStack_11a0._16_8_ = (secp256k1_schnorrsig_extraparams *)0x101010101010101;
      auStack_11a0._24_8_ = (secp256k1_schnorrsig_extraparams *)0x101010101010101;
      auStack_11a0._0_8_ = (secp256k1_schnorrsig_extraparams *)0x101010101010101;
      auStack_11a0._8_8_ = (secp256k1_schnorrsig_extraparams *)0x101010101010101;
      auStack_11e0._8_8_ = nonce_function_0;
      psStackY_1218 = (secp256k1_context *)0x146a9d;
      psVar159 = CTX;
      iVar154 = secp256k1_schnorrsig_sign_custom
                          (CTX,auStack_11a0,(uchar *)pcVar157,0x20,(secp256k1_keypair *)psVar179,
                           psVar168);
      pubkey_00 = (secp256k1_schnorrsig_extraparams *)pcVar157;
      if (iVar154 != 0) goto LAB_00147346;
      lVar158 = 0;
      do {
        psVar167 = psVar168;
        if (auStack_11a0[lVar158] != sStack_1140.magic[lVar158]) goto LAB_001476f4;
        lVar158 = lVar158 + 1;
      } while (lVar158 != 0x40);
      uStack_1168 = 0x101010101010101;
      auStack_11a0._48_8_ = 0x101010101010101;
      auStack_11a0._32_8_ = (secp256k1_schnorrsig_extraparams *)0x101010101010101;
      auStack_11a0._40_8_ = 0x101010101010101;
      auStack_11a0._16_8_ = (secp256k1_schnorrsig_extraparams *)0x101010101010101;
      auStack_11a0._24_8_ = (secp256k1_schnorrsig_extraparams *)0x101010101010101;
      auStack_11a0._0_8_ = (secp256k1_schnorrsig_extraparams *)0x101010101010101;
      auStack_11a0._8_8_ = (secp256k1_schnorrsig_extraparams *)0x101010101010101;
      auStack_11e0._8_8_ = nonce_function_overflowing;
      pubkey_00 = (secp256k1_schnorrsig_extraparams *)auStack_11a0;
      psStackY_1218 = (secp256k1_context *)0x146b1b;
      iVar154 = secp256k1_schnorrsig_sign_custom
                          (CTX,(uchar *)pubkey_00,(uchar *)pcVar157,0x20,
                           (secp256k1_keypair *)psVar179,psVar168);
      if (iVar154 == 0) goto LAB_0014734b;
      psStackY_1218 = (secp256k1_context *)0x146b3d;
      iVar154 = secp256k1_schnorrsig_verify
                          (CTX,(uchar *)pubkey_00,(uchar *)pcVar157,0x20,
                           (secp256k1_xonly_pubkey *)pubkey);
      if (iVar154 == 0) goto LAB_00147350;
      auStack_11e0._8_8_ = 0;
      auStack_11d0._0_8_ = &sStack_10e0;
      psVar167 = (secp256k1_schnorrsig_extraparams *)auStack_f70;
      psStackY_1218 = (secp256k1_context *)0x146b80;
      iVar154 = secp256k1_schnorrsig_sign_custom
                          (CTX,(uchar *)pubkey_00,(uchar *)pcVar157,0x20,
                           (secp256k1_keypair *)psVar167,psVar168);
      if (iVar154 == 0) goto LAB_00147355;
      psStackY_1218 = (secp256k1_context *)0x146bb1;
      psVar159 = CTX;
      iVar154 = secp256k1_schnorrsig_sign_internal
                          (CTX,(uchar *)keypair,(uchar *)pcVar157,0x20,(secp256k1_keypair *)psVar167
                           ,nonce_function_bip340,(void *)auStack_11d0._0_8_);
      pubkey_00 = keypair;
      if (iVar154 == 0) goto LAB_0014735a;
      lVar158 = 0;
      psVar167 = &sStack_1140;
      do {
        if (auStack_11a0[lVar158] != auStack_1090[lVar158]) goto LAB_001476f9;
        lVar158 = lVar158 + 1;
      } while (lVar158 != 0x40);
      pcVar157 = (code *)&sStack_10c0;
      psStackY_1218 = (secp256k1_context *)0x146bed;
      testrand256((uchar *)pcVar157);
      psStackY_1218 = (secp256k1_context *)0x146bff;
      iVar154 = secp256k1_keypair_create(CTX,(secp256k1_keypair *)keypair,(uchar *)pcVar157);
      if (iVar154 == 0) goto LAB_0014735f;
      psStackY_1218 = (secp256k1_context *)0x146c1b;
      iVar154 = secp256k1_keypair_xonly_pub
                          (CTX,(secp256k1_xonly_pubkey *)psVar167,(int *)0x0,
                           (secp256k1_keypair *)keypair);
      if (iVar154 == 0) goto LAB_00147364;
      psVar179 = (secp256k1_schnorrsig_extraparams *)0x0;
      pubkey_00 = pubkey;
      do {
        pubkey = (secp256k1_schnorrsig_extraparams *)(auStack_11a0 + (long)psVar179);
        psStackY_1218 = (secp256k1_context *)0x146c39;
        testrand256((uchar *)pubkey);
        psStackY_1218 = (secp256k1_context *)0x146c5e;
        iVar154 = secp256k1_schnorrsig_sign_internal
                            (CTX,pubkey_00->magic,(uchar *)pubkey,0x20,(secp256k1_keypair *)keypair,
                             nonce_function_bip340,(void *)0x0);
        if (iVar154 == 0) {
          psStackY_1218 = (secp256k1_context *)0x14730f;
          run_schnorrsig_tests_cold_66();
LAB_0014730f:
          psStackY_1218 = (secp256k1_context *)0x147314;
          run_schnorrsig_tests_cold_65();
LAB_00147314:
          psStackY_1218 = (secp256k1_context *)0x147319;
          run_schnorrsig_tests_cold_97();
          psVar168 = psVar167;
LAB_00147319:
          psStackY_1218 = (secp256k1_context *)0x14731e;
          run_schnorrsig_tests_cold_95();
          goto LAB_0014731e;
        }
        psStackY_1218 = (secp256k1_context *)0x146c80;
        iVar154 = secp256k1_schnorrsig_verify
                            (CTX,pubkey_00->magic,(uchar *)pubkey,0x20,
                             (secp256k1_xonly_pubkey *)psVar167);
        if (iVar154 == 0) goto LAB_0014730f;
        psVar179 = (secp256k1_schnorrsig_extraparams *)&psVar179[1].noncefp;
        pubkey_00 = (secp256k1_schnorrsig_extraparams *)&pubkey_00[2].ndata;
      } while (psVar179 != (secp256k1_schnorrsig_extraparams *)0x60);
      psStackY_1218 = (secp256k1_context *)0x146ca0;
      uVar155 = testrand_int(3);
      uVar180 = ((secp256k1_test_state[3] + secp256k1_test_state[0]) * 0x800000 |
                secp256k1_test_state[3] + secp256k1_test_state[0] >> 0x29) + secp256k1_test_state[0]
      ;
      uVar171 = secp256k1_test_state[1] << 0x11;
      uVar175 = secp256k1_test_state[2] ^ secp256k1_test_state[0];
      uVar165 = secp256k1_test_state[3] ^ secp256k1_test_state[1];
      secp256k1_test_state[1] = secp256k1_test_state[1] ^ uVar175;
      secp256k1_test_state[0] = secp256k1_test_state[0] ^ uVar165;
      secp256k1_test_state[2] = uVar175 ^ uVar171;
      secp256k1_test_state[3] = uVar165 << 0x2d | uVar165 >> 0x13;
      pcVar157 = (code *)(uVar180 >> 0x3b);
      psStackY_1218 = (secp256k1_context *)0x146d0d;
      uVar156 = testrand_int(0xfe);
      pubkey = (secp256k1_schnorrsig_extraparams *)(auStack_1030 + (ulong)uVar155 * 0x40);
      bVar183 = (char)uVar156 + 1;
      pubkey_00 = (secp256k1_schnorrsig_extraparams *)(ulong)CONCAT31((int3)(uVar156 >> 8),bVar183);
      ((secp256k1_schnorrsig_extraparams *)pcVar157)->magic[(long)pubkey] =
           ((secp256k1_schnorrsig_extraparams *)pcVar157)->magic[(long)pubkey] ^ bVar183;
      unaff_RBP = (code *)(auStack_11a0 + (ulong)uVar155 * 0x20);
      psStackY_1218 = (secp256k1_context *)0x146d4f;
      iVar154 = secp256k1_schnorrsig_verify
                          (CTX,(uchar *)pubkey,(uchar *)unaff_RBP,0x20,
                           (secp256k1_xonly_pubkey *)psVar167);
      if (iVar154 != 0) goto LAB_00147369;
      ((secp256k1_schnorrsig_extraparams *)pcVar157)->magic[(long)pubkey] =
           ((secp256k1_schnorrsig_extraparams *)pcVar157)->magic[(long)pubkey] ^ bVar183;
      uVar180 = ((secp256k1_test_state[3] + secp256k1_test_state[0]) * 0x800000 |
                secp256k1_test_state[3] + secp256k1_test_state[0] >> 0x29) + secp256k1_test_state[0]
      ;
      uVar171 = secp256k1_test_state[1] << 0x11;
      uVar175 = secp256k1_test_state[2] ^ secp256k1_test_state[0];
      uVar165 = secp256k1_test_state[3] ^ secp256k1_test_state[1];
      secp256k1_test_state[1] = secp256k1_test_state[1] ^ uVar175;
      secp256k1_test_state[0] = secp256k1_test_state[0] ^ uVar165;
      secp256k1_test_state[2] = uVar175 ^ uVar171;
      secp256k1_test_state[3] = uVar165 << 0x2d | uVar165 >> 0x13;
      pcVar157 = (code *)(uVar180 >> 0x3b);
      pubkey->magic[(long)&((secp256k1_schnorrsig_extraparams *)((long)pcVar157 + 0x18))->noncefp] =
           pubkey->magic
           [(long)&((secp256k1_schnorrsig_extraparams *)((long)pcVar157 + 0x18))->noncefp] ^ bVar183
      ;
      psStackY_1218 = (secp256k1_context *)0x146dde;
      iVar154 = secp256k1_schnorrsig_verify
                          (CTX,(uchar *)pubkey,(uchar *)unaff_RBP,0x20,
                           (secp256k1_xonly_pubkey *)psVar167);
      if (iVar154 != 0) goto LAB_0014736e;
      (pubkey->magic + (long)pcVar157)[0x20] = (pubkey->magic + (long)pcVar157)[0x20] ^ bVar183;
      uVar180 = ((secp256k1_test_state[3] + secp256k1_test_state[0]) * 0x800000 |
                secp256k1_test_state[3] + secp256k1_test_state[0] >> 0x29) + secp256k1_test_state[0]
      ;
      uVar171 = secp256k1_test_state[1] << 0x11;
      uVar175 = secp256k1_test_state[2] ^ secp256k1_test_state[0];
      uVar165 = secp256k1_test_state[3] ^ secp256k1_test_state[1];
      secp256k1_test_state[1] = secp256k1_test_state[1] ^ uVar175;
      secp256k1_test_state[0] = secp256k1_test_state[0] ^ uVar165;
      secp256k1_test_state[2] = uVar175 ^ uVar171;
      secp256k1_test_state[3] = uVar165 << 0x2d | uVar165 >> 0x13;
      pcVar157 = (code *)(uVar180 >> 0x3b);
      ((secp256k1_schnorrsig_extraparams *)pcVar157)->magic[(long)unaff_RBP] =
           ((secp256k1_schnorrsig_extraparams *)pcVar157)->magic[(long)unaff_RBP] ^ bVar183;
      psStackY_1218 = (secp256k1_context *)0x146e71;
      iVar154 = secp256k1_schnorrsig_verify
                          (CTX,(uchar *)pubkey,(uchar *)unaff_RBP,0x20,
                           (secp256k1_xonly_pubkey *)psVar167);
      if (iVar154 != 0) goto LAB_00147373;
      pcVar157 = (code *)(((secp256k1_schnorrsig_extraparams *)pcVar157)->magic + (long)unaff_RBP);
      ((secp256k1_schnorrsig_extraparams *)pcVar157)->magic[0] =
           ((secp256k1_schnorrsig_extraparams *)pcVar157)->magic[0] ^ bVar183;
      psStackY_1218 = (secp256k1_context *)0x146e9a;
      iVar154 = secp256k1_schnorrsig_verify
                          (CTX,(uchar *)pubkey,(uchar *)unaff_RBP,0x20,
                           (secp256k1_xonly_pubkey *)psVar167);
      if (iVar154 == 0) goto LAB_00147378;
      pubkey = (secp256k1_schnorrsig_extraparams *)auStack_1030;
      unaff_RBP = (code *)auStack_11a0;
      pcVar157 = nonce_function_bip340;
      psStackY_1218 = (secp256k1_context *)0x146edb;
      iVar154 = secp256k1_schnorrsig_sign_internal
                          (CTX,(uchar *)pubkey,(uchar *)unaff_RBP,0x20,(secp256k1_keypair *)keypair,
                           nonce_function_bip340,(void *)0x0);
      if (iVar154 == 0) goto LAB_0014737d;
      psStackY_1218 = (secp256k1_context *)0x146efd;
      iVar154 = secp256k1_schnorrsig_verify
                          (CTX,(uchar *)pubkey,(uchar *)unaff_RBP,0x20,
                           (secp256k1_xonly_pubkey *)psVar167);
      if (iVar154 == 0) goto LAB_00147382;
      pubkey_00 = &sStack_1010;
      sStack_1010.ndata = (void *)0xffffffffffffffff;
      uStack_ff8 = 0xffffffffffffffff;
      sStack_1010.magic[0] = 0xff;
      sStack_1010.magic[1] = 0xff;
      sStack_1010.magic[2] = 0xff;
      sStack_1010.magic[3] = 0xff;
      sStack_1010._4_4_ = 0xffffffff;
      sStack_1010.noncefp = (secp256k1_nonce_function_hardened)0xffffffffffffffff;
      psStackY_1218 = (secp256k1_context *)0x146f36;
      iVar154 = secp256k1_schnorrsig_verify
                          (CTX,(uchar *)pubkey,(uchar *)unaff_RBP,0x20,
                           (secp256k1_xonly_pubkey *)psVar167);
      if (iVar154 != 0) goto LAB_00147387;
      psStackY_1218 = (secp256k1_context *)0x146f63;
      iVar154 = secp256k1_schnorrsig_sign_internal
                          (CTX,(uchar *)pubkey,(uchar *)unaff_RBP,0x20,(secp256k1_keypair *)keypair,
                           nonce_function_bip340,(void *)0x0);
      if (iVar154 == 0) goto LAB_0014738c;
      psStackY_1218 = (secp256k1_context *)0x146f85;
      iVar154 = secp256k1_schnorrsig_verify
                          (CTX,(uchar *)pubkey,(uchar *)unaff_RBP,0x20,
                           (secp256k1_xonly_pubkey *)psVar167);
      if (iVar154 == 0) goto LAB_00147391;
      psStackY_1218 = (secp256k1_context *)0x146fa2;
      secp256k1_scalar_set_b32((secp256k1_scalar *)&pvStack_1100,pubkey_00->magic,(int *)0x0);
      psStackY_1218 = (secp256k1_context *)0x146fad;
      secp256k1_scalar_negate((secp256k1_scalar *)&pvStack_1100,(secp256k1_scalar *)&pvStack_1100);
      psStackY_1218 = (secp256k1_context *)0x146fb8;
      secp256k1_scalar_get_b32(pubkey_00->magic,(secp256k1_scalar *)&pvStack_1100);
      psStackY_1218 = (secp256k1_context *)0x146fd2;
      iVar154 = secp256k1_schnorrsig_verify
                          (CTX,(uchar *)pubkey,(uchar *)unaff_RBP,0x20,
                           (secp256k1_xonly_pubkey *)psVar167);
      pcVar157 = (code *)&pvStack_1100;
      psVar168 = keypair;
      if (iVar154 != 0) goto LAB_00147396;
      psStackY_1218 = (secp256k1_context *)0x146ffe;
      iVar154 = secp256k1_schnorrsig_sign_internal
                          (CTX,(uchar *)pubkey,(uchar *)0x0,0,(secp256k1_keypair *)keypair,
                           (secp256k1_nonce_function_hardened)0x0,(void *)0x0);
      if (iVar154 == 0) goto LAB_0014739b;
      psStackY_1218 = (secp256k1_context *)0x14701c;
      iVar154 = secp256k1_schnorrsig_verify
                          (CTX,(uchar *)pubkey,(uchar *)0x0,0,(secp256k1_xonly_pubkey *)psVar167);
      if (iVar154 == 0) goto LAB_001473a0;
      psStackY_1218 = (secp256k1_context *)0x14702e;
      uVar155 = testrand_int(0x100);
      unaff_RBP = (code *)(ulong)uVar155;
      uVar165 = 0xffffffffffffffe0;
      psVar167 = (secp256k1_schnorrsig_extraparams *)auStack_f70;
      do {
        psStackY_1218 = (secp256k1_context *)0x14704c;
        testrand256(auStack_f58 + uVar165 + 8);
        uVar165 = uVar165 + 0x20;
      } while (uVar165 < 0xe0);
      psVar179 = (secp256k1_schnorrsig_extraparams *)(ulong)uVar155;
      psStackY_1218 = (secp256k1_context *)0x14707f;
      iVar154 = secp256k1_schnorrsig_sign_internal
                          (CTX,(uchar *)pubkey,(uchar *)psVar167,(size_t)psVar179,
                           (secp256k1_keypair *)keypair,(secp256k1_nonce_function_hardened)0x0,
                           (void *)0x0);
      pubkey_00 = psVar179;
      if (iVar154 == 0) goto LAB_001473a5;
      pubkey_00 = &sStack_1140;
      psStackY_1218 = (secp256k1_context *)0x1470a7;
      iVar154 = secp256k1_schnorrsig_verify
                          (CTX,(uchar *)pubkey,(uchar *)psVar167,(size_t)psVar179,
                           (secp256k1_xonly_pubkey *)pubkey_00);
      if (iVar154 == 0) goto LAB_001473aa;
      unaff_RBP = (code *)(ulong)(uVar155 - 1);
      psStackY_1218 = (secp256k1_context *)0x1470ca;
      iVar154 = secp256k1_schnorrsig_verify
                          (CTX,(uchar *)pubkey,(uchar *)psVar167,(ulong)unaff_RBP & 0xff,
                           (secp256k1_xonly_pubkey *)pubkey_00);
      if (iVar154 != 0) goto LAB_001473af;
      uVar166 = (int)uStack_1098 + 1;
      uStack_1098 = (ulong)uVar166;
      unaff_RBP = nonce_function_bip340;
      if (COUNT <= (int)uVar166) goto LAB_00147107;
    }
LAB_0014731e:
    psStackY_1218 = (secp256k1_context *)0x147323;
    run_schnorrsig_tests_cold_79();
    pcVar157 = (code *)psVar179;
LAB_00147323:
    psStackY_1218 = (secp256k1_context *)0x147328;
    run_schnorrsig_tests_cold_78();
LAB_00147328:
    psStackY_1218 = (secp256k1_context *)0x14732d;
    run_schnorrsig_tests_cold_77();
LAB_0014732d:
    psStackY_1218 = (secp256k1_context *)0x147332;
    run_schnorrsig_tests_cold_76();
LAB_00147332:
    psStackY_1218 = (secp256k1_context *)0x147337;
    run_schnorrsig_tests_cold_75();
LAB_00147337:
    psStackY_1218 = (secp256k1_context *)0x14733c;
    run_schnorrsig_tests_cold_74();
LAB_0014733c:
    psStackY_1218 = (secp256k1_context *)0x147341;
    run_schnorrsig_tests_cold_73();
LAB_00147341:
    psStackY_1218 = (secp256k1_context *)0x147346;
    run_schnorrsig_tests_cold_33();
    psVar179 = (secp256k1_schnorrsig_extraparams *)pcVar157;
LAB_00147346:
    pcVar157 = (code *)psVar179;
    psStackY_1218 = (secp256k1_context *)0x14734b;
    run_schnorrsig_tests_cold_35();
LAB_0014734b:
    psStackY_1218 = (secp256k1_context *)0x147350;
    run_schnorrsig_tests_cold_72();
    psVar167 = psVar168;
LAB_00147350:
    psStackY_1218 = (secp256k1_context *)0x147355;
    run_schnorrsig_tests_cold_71();
LAB_00147355:
    psStackY_1218 = (secp256k1_context *)0x14735a;
    run_schnorrsig_tests_cold_70();
LAB_0014735a:
    psStackY_1218 = (secp256k1_context *)0x14735f;
    run_schnorrsig_tests_cold_69();
LAB_0014735f:
    psStackY_1218 = (secp256k1_context *)0x147364;
    run_schnorrsig_tests_cold_68();
LAB_00147364:
    psStackY_1218 = (secp256k1_context *)0x147369;
    run_schnorrsig_tests_cold_67();
LAB_00147369:
    psStackY_1218 = (secp256k1_context *)0x14736e;
    run_schnorrsig_tests_cold_38();
LAB_0014736e:
    psStackY_1218 = (secp256k1_context *)0x147373;
    run_schnorrsig_tests_cold_39();
LAB_00147373:
    psStackY_1218 = (secp256k1_context *)0x147378;
    run_schnorrsig_tests_cold_40();
LAB_00147378:
    psStackY_1218 = (secp256k1_context *)0x14737d;
    run_schnorrsig_tests_cold_64();
LAB_0014737d:
    psStackY_1218 = (secp256k1_context *)0x147382;
    run_schnorrsig_tests_cold_63();
LAB_00147382:
    psStackY_1218 = (secp256k1_context *)0x147387;
    run_schnorrsig_tests_cold_62();
LAB_00147387:
    psStackY_1218 = (secp256k1_context *)0x14738c;
    run_schnorrsig_tests_cold_41();
LAB_0014738c:
    psStackY_1218 = (secp256k1_context *)0x147391;
    run_schnorrsig_tests_cold_61();
LAB_00147391:
    psStackY_1218 = (secp256k1_context *)0x147396;
    run_schnorrsig_tests_cold_60();
    psVar168 = keypair;
LAB_00147396:
    keypair = (secp256k1_schnorrsig_extraparams *)pcVar157;
    psStackY_1218 = (secp256k1_context *)0x14739b;
    run_schnorrsig_tests_cold_42();
LAB_0014739b:
    psStackY_1218 = (secp256k1_context *)0x1473a0;
    run_schnorrsig_tests_cold_59();
LAB_001473a0:
    psStackY_1218 = (secp256k1_context *)0x1473a5;
    run_schnorrsig_tests_cold_58();
LAB_001473a5:
    psStackY_1218 = (secp256k1_context *)0x1473aa;
    run_schnorrsig_tests_cold_57();
LAB_001473aa:
    psStackY_1218 = (secp256k1_context *)0x1473af;
    run_schnorrsig_tests_cold_56();
LAB_001473af:
    psStackY_1218 = (secp256k1_context *)0x1473b4;
    run_schnorrsig_tests_cold_43();
    psVar179 = keypair;
    keypair = psVar168;
LAB_001473b4:
    psStackY_1218 = (secp256k1_context *)0x1473b9;
    run_schnorrsig_tests_cold_96();
LAB_001473b9:
    psStackY_1218 = (secp256k1_context *)0x1473be;
    run_schnorrsig_tests_cold_94();
LAB_001473be:
    psStackY_1218 = (secp256k1_context *)0x1473c3;
    run_schnorrsig_tests_cold_99();
    pcVar157 = (code *)psVar179;
LAB_001473c3:
    psStackY_1218 = (secp256k1_context *)0x1473c8;
    run_schnorrsig_tests_cold_98();
LAB_001473c8:
    psStackY_1218 = (secp256k1_context *)0x1473cd;
    run_schnorrsig_tests_cold_93();
    psVar168 = psVar167;
LAB_001473cd:
    psStackY_1218 = (secp256k1_context *)0x1473d2;
    run_schnorrsig_tests_cold_92();
LAB_001473d2:
    psStackY_1218 = (secp256k1_context *)0x1473d7;
    run_schnorrsig_tests_cold_91();
LAB_001473d7:
    psStackY_1218 = (secp256k1_context *)0x1473dc;
    run_schnorrsig_tests_cold_90();
LAB_001473dc:
    psStackY_1218 = (secp256k1_context *)0x1473e1;
    run_schnorrsig_tests_cold_89();
LAB_001473e1:
    psStackY_1218 = (secp256k1_context *)0x1473e6;
    run_schnorrsig_tests_cold_88();
LAB_001473e6:
    psStackY_1218 = (secp256k1_context *)0x1473eb;
    run_schnorrsig_tests_cold_87();
LAB_001473eb:
    psStackY_1218 = (secp256k1_context *)0x1473f0;
    run_schnorrsig_tests_cold_86();
LAB_001473f0:
    psStackY_1218 = (secp256k1_context *)0x1473f5;
    run_schnorrsig_tests_cold_85();
    psVar159 = extraout_RAX_22;
LAB_001473f5:
    psStackY_1218 = (secp256k1_context *)0x147409;
    (*(psVar159->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar159->illegal_callback).data);
    psVar159 = CTX;
    psVar179 = (secp256k1_schnorrsig_extraparams *)pcVar157;
  } while( true );
  while (lVar158 = lVar158 + 1, lVar158 != 0x60) {
LAB_00143f6f:
    in_RCX = (code *)CONCAT71((int7)((ulong)in_RCX >> 8),*(char *)((long)&local_d08 + lVar158));
    if (*(char *)((long)&local_d08 + lVar158) != local_c18[lVar158]) goto LAB_00144c91;
  }
LAB_00143f8c:
  uVar166 = (int)unaff_RBP + 1;
  unaff_RBP = (code *)(ulong)uVar166;
  if (COUNT <= (int)uVar166) goto LAB_00143f9a;
  goto LAB_00143ecb;
}

Assistant:

static void test_xonly_pubkey(void) {
    secp256k1_pubkey pk;
    secp256k1_xonly_pubkey xonly_pk, xonly_pk_tmp;
    secp256k1_ge pk1;
    secp256k1_ge pk2;
    secp256k1_fe y;
    unsigned char sk[32];
    unsigned char xy_sk[32];
    unsigned char buf32[32];
    unsigned char ones32[32];
    unsigned char zeros64[64] = { 0 };
    int pk_parity;
    int i;

    testrand256(sk);
    memset(ones32, 0xFF, 32);
    testrand256(xy_sk);
    CHECK(secp256k1_ec_pubkey_create(CTX, &pk, sk) == 1);
    CHECK(secp256k1_xonly_pubkey_from_pubkey(CTX, &xonly_pk, &pk_parity, &pk) == 1);

    /* Test xonly_pubkey_from_pubkey */
    CHECK(secp256k1_xonly_pubkey_from_pubkey(CTX, &xonly_pk, &pk_parity, &pk) == 1);
    CHECK_ILLEGAL(CTX, secp256k1_xonly_pubkey_from_pubkey(CTX, NULL, &pk_parity, &pk));
    CHECK(secp256k1_xonly_pubkey_from_pubkey(CTX, &xonly_pk, NULL, &pk) == 1);
    CHECK_ILLEGAL(CTX, secp256k1_xonly_pubkey_from_pubkey(CTX, &xonly_pk, &pk_parity, NULL));
    memset(&pk, 0, sizeof(pk));
    CHECK_ILLEGAL(CTX, secp256k1_xonly_pubkey_from_pubkey(CTX, &xonly_pk, &pk_parity, &pk));

    /* Choose a secret key such that the resulting pubkey and xonly_pubkey match. */
    memset(sk, 0, sizeof(sk));
    sk[0] = 1;
    CHECK(secp256k1_ec_pubkey_create(CTX, &pk, sk) == 1);
    CHECK(secp256k1_xonly_pubkey_from_pubkey(CTX, &xonly_pk, &pk_parity, &pk) == 1);
    CHECK(secp256k1_memcmp_var(&pk, &xonly_pk, sizeof(pk)) == 0);
    CHECK(pk_parity == 0);

    /* Choose a secret key such that pubkey and xonly_pubkey are each others
     * negation. */
    sk[0] = 2;
    CHECK(secp256k1_ec_pubkey_create(CTX, &pk, sk) == 1);
    CHECK(secp256k1_xonly_pubkey_from_pubkey(CTX, &xonly_pk, &pk_parity, &pk) == 1);
    CHECK(secp256k1_memcmp_var(&xonly_pk, &pk, sizeof(xonly_pk)) != 0);
    CHECK(pk_parity == 1);
    secp256k1_pubkey_load(CTX, &pk1, &pk);
    secp256k1_pubkey_load(CTX, &pk2, (secp256k1_pubkey *) &xonly_pk);
    CHECK(secp256k1_fe_equal(&pk1.x, &pk2.x) == 1);
    secp256k1_fe_negate(&y, &pk2.y, 1);
    CHECK(secp256k1_fe_equal(&pk1.y, &y) == 1);

    /* Test xonly_pubkey_serialize and xonly_pubkey_parse */
    CHECK_ILLEGAL(CTX, secp256k1_xonly_pubkey_serialize(CTX, NULL, &xonly_pk));
    CHECK_ILLEGAL(CTX, secp256k1_xonly_pubkey_serialize(CTX, buf32, NULL));
    CHECK(secp256k1_memcmp_var(buf32, zeros64, 32) == 0);
    {
        /* A pubkey filled with 0s will fail to serialize due to pubkey_load
         * special casing. */
        secp256k1_xonly_pubkey pk_tmp;
        memset(&pk_tmp, 0, sizeof(pk_tmp));
        /* pubkey_load calls illegal callback */
        CHECK_ILLEGAL(CTX, secp256k1_xonly_pubkey_serialize(CTX, buf32, &pk_tmp));
    }

    CHECK(secp256k1_xonly_pubkey_serialize(CTX, buf32, &xonly_pk) == 1);
    CHECK_ILLEGAL(CTX, secp256k1_xonly_pubkey_parse(CTX, NULL, buf32));
    CHECK_ILLEGAL(CTX, secp256k1_xonly_pubkey_parse(CTX, &xonly_pk, NULL));

    /* Serialization and parse roundtrip */
    CHECK(secp256k1_xonly_pubkey_from_pubkey(CTX, &xonly_pk, NULL, &pk) == 1);
    CHECK(secp256k1_xonly_pubkey_serialize(CTX, buf32, &xonly_pk) == 1);
    CHECK(secp256k1_xonly_pubkey_parse(CTX, &xonly_pk_tmp, buf32) == 1);
    CHECK(secp256k1_memcmp_var(&xonly_pk, &xonly_pk_tmp, sizeof(xonly_pk)) == 0);

    /* Test parsing invalid field elements */
    memset(&xonly_pk, 1, sizeof(xonly_pk));
    /* Overflowing field element */
    CHECK(secp256k1_xonly_pubkey_parse(CTX, &xonly_pk, ones32) == 0);
    CHECK(secp256k1_memcmp_var(&xonly_pk, zeros64, sizeof(xonly_pk)) == 0);
    memset(&xonly_pk, 1, sizeof(xonly_pk));
    /* There's no point with x-coordinate 0 on secp256k1 */
    CHECK(secp256k1_xonly_pubkey_parse(CTX, &xonly_pk, zeros64) == 0);
    CHECK(secp256k1_memcmp_var(&xonly_pk, zeros64, sizeof(xonly_pk)) == 0);
    /* If a random 32-byte string can not be parsed with ec_pubkey_parse
     * (because interpreted as X coordinate it does not correspond to a point on
     * the curve) then xonly_pubkey_parse should fail as well. */
    for (i = 0; i < COUNT; i++) {
        unsigned char rand33[33];
        testrand256(&rand33[1]);
        rand33[0] = SECP256K1_TAG_PUBKEY_EVEN;
        if (!secp256k1_ec_pubkey_parse(CTX, &pk, rand33, 33)) {
            memset(&xonly_pk, 1, sizeof(xonly_pk));
            CHECK(secp256k1_xonly_pubkey_parse(CTX, &xonly_pk, &rand33[1]) == 0);
            CHECK(secp256k1_memcmp_var(&xonly_pk, zeros64, sizeof(xonly_pk)) == 0);
        } else {
            CHECK(secp256k1_xonly_pubkey_parse(CTX, &xonly_pk, &rand33[1]) == 1);
        }
    }
}